

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  long lVar7;
  RTCRayQueryContext *pRVar8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [12];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  uint uVar94;
  uint uVar95;
  undefined1 (*pauVar96) [32];
  uint uVar97;
  uint uVar98;
  long lVar99;
  ulong uVar100;
  ulong uVar101;
  int iVar102;
  ulong uVar103;
  float fVar104;
  float fVar135;
  float fVar136;
  __m128 a;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar137;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar111 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar115 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar116 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 extraout_var [60];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar145 [16];
  float fVar138;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar164;
  float fVar166;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar173;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar195;
  float fVar196;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar197;
  float fVar201;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar178 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar202;
  float fVar226;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [28];
  float fVar224;
  float fVar225;
  float fVar227;
  float fVar228;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar229;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar230;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar231;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [28];
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar252;
  float fVar264;
  float fVar265;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar267;
  float fVar268;
  float fVar270;
  undefined1 auVar259 [32];
  float fVar266;
  undefined1 auVar260 [32];
  float fVar269;
  float fVar271;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar273 [16];
  float fVar272;
  undefined1 auVar274 [16];
  float fVar285;
  float fVar286;
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar287;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  float fVar291;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar292;
  undefined1 auVar293 [16];
  float fVar309;
  float fVar310;
  float fVar314;
  float fVar316;
  float fVar318;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar312;
  float fVar320;
  undefined1 auVar300 [32];
  float fVar311;
  float fVar313;
  float fVar315;
  float fVar317;
  float fVar319;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  float fVar321;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar322 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar323 [32];
  undefined1 auVar327 [64];
  undefined1 auVar328 [64];
  float s;
  float fVar335;
  float fVar336;
  float fVar341;
  float fVar343;
  float fVar345;
  float fVar347;
  float fVar350;
  float fVar353;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  float fVar342;
  float fVar344;
  float fVar346;
  float fVar348;
  float fVar349;
  float fVar351;
  float fVar352;
  float fVar354;
  float fVar355;
  float fVar356;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar357 [16];
  undefined1 auVar358 [32];
  float fVar364;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [64];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  float fVar372;
  undefined1 auVar370 [32];
  undefined1 auVar371 [64];
  undefined1 auVar375 [16];
  float fVar373;
  float fVar374;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float in_register_0000151c;
  undefined1 auVar376 [32];
  float fVar390;
  undefined1 auVar394 [16];
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar398;
  float fVar401;
  float fVar409;
  float fVar412;
  float fVar415;
  undefined1 auVar395 [32];
  float fVar399;
  float fVar400;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar408;
  float fVar410;
  float fVar411;
  float fVar413;
  float fVar414;
  float fVar416;
  float fVar417;
  undefined1 auVar396 [32];
  float fVar418;
  undefined1 auVar397 [32];
  float in_register_0000159c;
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  float in_register_000015dc;
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_ce4;
  undefined1 local_c80 [8];
  float fStack_c78;
  float fStack_c74;
  undefined4 uStack_c70;
  undefined4 uStack_c6c;
  undefined4 uStack_c68;
  undefined4 uStack_c64;
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined1 local_b30 [8];
  float fStack_b28;
  float fStack_b24;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [32];
  undefined1 (*local_a98) [16];
  undefined1 (*local_a90) [16];
  uint *local_a88;
  undefined1 local_a80 [8];
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  float local_980;
  float fStack_97c;
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  ulong local_960;
  undefined1 auStack_958 [24];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  Primitive *local_908;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6b0 [16];
  RTCHitN local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [16];
  undefined1 auStack_670 [16];
  undefined1 local_660 [16];
  undefined1 auStack_650 [16];
  undefined1 local_640 [16];
  undefined1 auStack_630 [16];
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  uint local_5c0;
  uint uStack_5bc;
  uint uStack_5b8;
  uint uStack_5b4;
  uint uStack_5b0;
  uint uStack_5ac;
  uint uStack_5a8;
  uint uStack_5a4;
  uint local_5a0;
  uint uStack_59c;
  uint uStack_598;
  uint uStack_594;
  uint uStack_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar377 [64];
  
  PVar4 = prim[1];
  uVar101 = (ulong)(byte)PVar4;
  lVar99 = uVar101 * 5;
  auVar139 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar139 = vinsertps_avx(auVar139,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar202 = *(float *)(prim + uVar101 * 0x19 + 0x12);
  auVar139 = vsubps_avx(auVar139,*(undefined1 (*) [16])(prim + uVar101 * 0x19 + 6));
  auVar111._0_4_ = fVar202 * auVar139._0_4_;
  auVar111._4_4_ = fVar202 * auVar139._4_4_;
  auVar111._8_4_ = fVar202 * auVar139._8_4_;
  auVar111._12_4_ = fVar202 * auVar139._12_4_;
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 4 + 6)));
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 4 + 10)));
  auVar253._0_4_ = fVar202 * auVar14._0_4_;
  auVar253._4_4_ = fVar202 * auVar14._4_4_;
  auVar253._8_4_ = fVar202 * auVar14._8_4_;
  auVar253._12_4_ = fVar202 * auVar14._12_4_;
  auVar117._16_16_ = auVar29;
  auVar117._0_16_ = auVar139;
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar99 + 6)));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar99 + 10)));
  auVar182._16_16_ = auVar14;
  auVar182._0_16_ = auVar139;
  auVar161 = vcvtdq2ps_avx(auVar182);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 6 + 6)));
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 6 + 10)));
  auVar216._16_16_ = auVar14;
  auVar216._0_16_ = auVar139;
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 0xb + 6)));
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 0xb + 10)));
  auVar10 = vcvtdq2ps_avx(auVar216);
  auVar217._16_16_ = auVar14;
  auVar217._0_16_ = auVar139;
  auVar397 = vcvtdq2ps_avx(auVar217);
  uVar103 = (ulong)((uint)(byte)PVar4 * 0xc);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 + 6)));
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 + 10)));
  auVar275._16_16_ = auVar14;
  auVar275._0_16_ = auVar139;
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 + uVar101 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar275);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 + uVar101 + 10)));
  auVar294._16_16_ = auVar14;
  auVar294._0_16_ = auVar139;
  lVar7 = uVar101 * 9;
  uVar103 = (ulong)(uint)((int)lVar7 * 2);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 + 6)));
  auVar154 = vcvtdq2ps_avx(auVar294);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 + 10)));
  auVar295._16_16_ = auVar14;
  auVar295._0_16_ = auVar139;
  auVar12 = vcvtdq2ps_avx(auVar295);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 + uVar101 + 6)));
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 + uVar101 + 10)));
  auVar337._16_16_ = auVar14;
  auVar337._0_16_ = auVar139;
  uVar103 = (ulong)(uint)((int)lVar99 << 2);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 + 6)));
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 + 10)));
  auVar13 = vcvtdq2ps_avx(auVar337);
  auVar358._16_16_ = auVar14;
  auVar358._0_16_ = auVar139;
  auVar340 = vcvtdq2ps_avx(auVar358);
  auVar139 = vshufps_avx(auVar253,auVar253,0);
  auVar14 = vshufps_avx(auVar253,auVar253,0x55);
  auVar29 = vshufps_avx(auVar253,auVar253,0xaa);
  fVar202 = auVar29._0_4_;
  fVar224 = auVar29._4_4_;
  fVar225 = auVar29._8_4_;
  fVar226 = auVar29._12_4_;
  fVar227 = auVar14._0_4_;
  fVar228 = auVar14._4_4_;
  fVar229 = auVar14._8_4_;
  fVar231 = auVar14._12_4_;
  fVar246 = auVar139._0_4_;
  fVar247 = auVar139._4_4_;
  fVar248 = auVar139._8_4_;
  fVar249 = auVar139._12_4_;
  auVar376._0_4_ = fVar246 * auVar117._0_4_ + fVar227 * auVar161._0_4_ + fVar202 * auVar10._0_4_;
  auVar376._4_4_ = fVar247 * auVar117._4_4_ + fVar228 * auVar161._4_4_ + fVar224 * auVar10._4_4_;
  auVar376._8_4_ = fVar248 * auVar117._8_4_ + fVar229 * auVar161._8_4_ + fVar225 * auVar10._8_4_;
  auVar376._12_4_ = fVar249 * auVar117._12_4_ + fVar231 * auVar161._12_4_ + fVar226 * auVar10._12_4_
  ;
  auVar376._16_4_ = fVar246 * auVar117._16_4_ + fVar227 * auVar161._16_4_ + fVar202 * auVar10._16_4_
  ;
  auVar376._20_4_ = fVar247 * auVar117._20_4_ + fVar228 * auVar161._20_4_ + fVar224 * auVar10._20_4_
  ;
  auVar376._24_4_ = fVar248 * auVar117._24_4_ + fVar229 * auVar161._24_4_ + fVar225 * auVar10._24_4_
  ;
  auVar376._28_4_ = fVar231 + in_register_000015dc + in_register_0000151c;
  auVar368._0_4_ = fVar246 * auVar397._0_4_ + fVar227 * auVar11._0_4_ + auVar154._0_4_ * fVar202;
  auVar368._4_4_ = fVar247 * auVar397._4_4_ + fVar228 * auVar11._4_4_ + auVar154._4_4_ * fVar224;
  auVar368._8_4_ = fVar248 * auVar397._8_4_ + fVar229 * auVar11._8_4_ + auVar154._8_4_ * fVar225;
  auVar368._12_4_ = fVar249 * auVar397._12_4_ + fVar231 * auVar11._12_4_ + auVar154._12_4_ * fVar226
  ;
  auVar368._16_4_ = fVar246 * auVar397._16_4_ + fVar227 * auVar11._16_4_ + auVar154._16_4_ * fVar202
  ;
  auVar368._20_4_ = fVar247 * auVar397._20_4_ + fVar228 * auVar11._20_4_ + auVar154._20_4_ * fVar224
  ;
  auVar368._24_4_ = fVar248 * auVar397._24_4_ + fVar229 * auVar11._24_4_ + auVar154._24_4_ * fVar225
  ;
  auVar368._28_4_ = fVar231 + in_register_000015dc + in_register_0000159c;
  auVar259._0_4_ = fVar246 * auVar12._0_4_ + fVar227 * auVar13._0_4_ + auVar340._0_4_ * fVar202;
  auVar259._4_4_ = fVar247 * auVar12._4_4_ + fVar228 * auVar13._4_4_ + auVar340._4_4_ * fVar224;
  auVar259._8_4_ = fVar248 * auVar12._8_4_ + fVar229 * auVar13._8_4_ + auVar340._8_4_ * fVar225;
  auVar259._12_4_ = fVar249 * auVar12._12_4_ + fVar231 * auVar13._12_4_ + auVar340._12_4_ * fVar226;
  auVar259._16_4_ = fVar246 * auVar12._16_4_ + fVar227 * auVar13._16_4_ + auVar340._16_4_ * fVar202;
  auVar259._20_4_ = fVar247 * auVar12._20_4_ + fVar228 * auVar13._20_4_ + auVar340._20_4_ * fVar224;
  auVar259._24_4_ = fVar248 * auVar12._24_4_ + fVar229 * auVar13._24_4_ + auVar340._24_4_ * fVar225;
  auVar259._28_4_ = fVar249 + fVar231 + fVar226;
  auVar139 = vshufps_avx(auVar111,auVar111,0);
  auVar14 = vshufps_avx(auVar111,auVar111,0x55);
  auVar29 = vshufps_avx(auVar111,auVar111,0xaa);
  fVar224 = auVar29._0_4_;
  fVar225 = auVar29._4_4_;
  fVar226 = auVar29._8_4_;
  fVar227 = auVar29._12_4_;
  fVar247 = auVar14._0_4_;
  fVar248 = auVar14._4_4_;
  fVar249 = auVar14._8_4_;
  fVar250 = auVar14._12_4_;
  fVar228 = auVar139._0_4_;
  fVar229 = auVar139._4_4_;
  fVar231 = auVar139._8_4_;
  fVar246 = auVar139._12_4_;
  fVar202 = auVar117._28_4_;
  auVar276._0_4_ = fVar228 * auVar117._0_4_ + fVar247 * auVar161._0_4_ + fVar224 * auVar10._0_4_;
  auVar276._4_4_ = fVar229 * auVar117._4_4_ + fVar248 * auVar161._4_4_ + fVar225 * auVar10._4_4_;
  auVar276._8_4_ = fVar231 * auVar117._8_4_ + fVar249 * auVar161._8_4_ + fVar226 * auVar10._8_4_;
  auVar276._12_4_ = fVar246 * auVar117._12_4_ + fVar250 * auVar161._12_4_ + fVar227 * auVar10._12_4_
  ;
  auVar276._16_4_ = fVar228 * auVar117._16_4_ + fVar247 * auVar161._16_4_ + fVar224 * auVar10._16_4_
  ;
  auVar276._20_4_ = fVar229 * auVar117._20_4_ + fVar248 * auVar161._20_4_ + fVar225 * auVar10._20_4_
  ;
  auVar276._24_4_ = fVar231 * auVar117._24_4_ + fVar249 * auVar161._24_4_ + fVar226 * auVar10._24_4_
  ;
  auVar276._28_4_ = fVar202 + auVar161._28_4_ + auVar10._28_4_;
  auVar150._0_4_ = fVar228 * auVar397._0_4_ + auVar154._0_4_ * fVar224 + fVar247 * auVar11._0_4_;
  auVar150._4_4_ = fVar229 * auVar397._4_4_ + auVar154._4_4_ * fVar225 + fVar248 * auVar11._4_4_;
  auVar150._8_4_ = fVar231 * auVar397._8_4_ + auVar154._8_4_ * fVar226 + fVar249 * auVar11._8_4_;
  auVar150._12_4_ = fVar246 * auVar397._12_4_ + auVar154._12_4_ * fVar227 + fVar250 * auVar11._12_4_
  ;
  auVar150._16_4_ = fVar228 * auVar397._16_4_ + auVar154._16_4_ * fVar224 + fVar247 * auVar11._16_4_
  ;
  auVar150._20_4_ = fVar229 * auVar397._20_4_ + auVar154._20_4_ * fVar225 + fVar248 * auVar11._20_4_
  ;
  auVar150._24_4_ = fVar231 * auVar397._24_4_ + auVar154._24_4_ * fVar226 + fVar249 * auVar11._24_4_
  ;
  auVar150._28_4_ = fVar202 + auVar154._28_4_ + auVar10._28_4_;
  auVar296._8_4_ = 0x7fffffff;
  auVar296._0_8_ = 0x7fffffff7fffffff;
  auVar296._12_4_ = 0x7fffffff;
  auVar296._16_4_ = 0x7fffffff;
  auVar296._20_4_ = 0x7fffffff;
  auVar296._24_4_ = 0x7fffffff;
  auVar296._28_4_ = 0x7fffffff;
  auVar338._8_4_ = 0x219392ef;
  auVar338._0_8_ = 0x219392ef219392ef;
  auVar338._12_4_ = 0x219392ef;
  auVar338._16_4_ = 0x219392ef;
  auVar338._20_4_ = 0x219392ef;
  auVar338._24_4_ = 0x219392ef;
  auVar338._28_4_ = 0x219392ef;
  auVar117 = vandps_avx(auVar376,auVar296);
  auVar117 = vcmpps_avx(auVar117,auVar338,1);
  auVar161 = vblendvps_avx(auVar376,auVar338,auVar117);
  auVar117 = vandps_avx(auVar368,auVar296);
  auVar117 = vcmpps_avx(auVar117,auVar338,1);
  auVar10 = vblendvps_avx(auVar368,auVar338,auVar117);
  auVar117 = vandps_avx(auVar259,auVar296);
  auVar117 = vcmpps_avx(auVar117,auVar338,1);
  auVar117 = vblendvps_avx(auVar259,auVar338,auVar117);
  auVar183._0_4_ = fVar247 * auVar13._0_4_ + auVar340._0_4_ * fVar224 + fVar228 * auVar12._0_4_;
  auVar183._4_4_ = fVar248 * auVar13._4_4_ + auVar340._4_4_ * fVar225 + fVar229 * auVar12._4_4_;
  auVar183._8_4_ = fVar249 * auVar13._8_4_ + auVar340._8_4_ * fVar226 + fVar231 * auVar12._8_4_;
  auVar183._12_4_ = fVar250 * auVar13._12_4_ + auVar340._12_4_ * fVar227 + fVar246 * auVar12._12_4_;
  auVar183._16_4_ = fVar247 * auVar13._16_4_ + auVar340._16_4_ * fVar224 + fVar228 * auVar12._16_4_;
  auVar183._20_4_ = fVar248 * auVar13._20_4_ + auVar340._20_4_ * fVar225 + fVar229 * auVar12._20_4_;
  auVar183._24_4_ = fVar249 * auVar13._24_4_ + auVar340._24_4_ * fVar226 + fVar231 * auVar12._24_4_;
  auVar183._28_4_ = auVar11._28_4_ + fVar227 + fVar202;
  auVar397 = vrcpps_avx(auVar161);
  fVar202 = auVar397._0_4_;
  fVar224 = auVar397._4_4_;
  auVar11._4_4_ = auVar161._4_4_ * fVar224;
  auVar11._0_4_ = auVar161._0_4_ * fVar202;
  fVar225 = auVar397._8_4_;
  auVar11._8_4_ = auVar161._8_4_ * fVar225;
  fVar226 = auVar397._12_4_;
  auVar11._12_4_ = auVar161._12_4_ * fVar226;
  fVar227 = auVar397._16_4_;
  auVar11._16_4_ = auVar161._16_4_ * fVar227;
  fVar228 = auVar397._20_4_;
  auVar11._20_4_ = auVar161._20_4_ * fVar228;
  fVar229 = auVar397._24_4_;
  auVar11._24_4_ = auVar161._24_4_ * fVar229;
  auVar11._28_4_ = auVar161._28_4_;
  auVar322._8_4_ = 0x3f800000;
  auVar322._0_8_ = 0x3f8000003f800000;
  auVar322._12_4_ = 0x3f800000;
  auVar322._16_4_ = 0x3f800000;
  auVar322._20_4_ = 0x3f800000;
  auVar322._24_4_ = 0x3f800000;
  auVar322._28_4_ = 0x3f800000;
  auVar11 = vsubps_avx(auVar322,auVar11);
  auVar161 = vrcpps_avx(auVar10);
  fVar202 = fVar202 + fVar202 * auVar11._0_4_;
  fVar224 = fVar224 + fVar224 * auVar11._4_4_;
  fVar225 = fVar225 + fVar225 * auVar11._8_4_;
  fVar226 = fVar226 + fVar226 * auVar11._12_4_;
  fVar227 = fVar227 + fVar227 * auVar11._16_4_;
  fVar228 = fVar228 + fVar228 * auVar11._20_4_;
  fVar229 = fVar229 + fVar229 * auVar11._24_4_;
  fVar252 = auVar161._0_4_;
  fVar264 = auVar161._4_4_;
  auVar154._4_4_ = fVar264 * auVar10._4_4_;
  auVar154._0_4_ = fVar252 * auVar10._0_4_;
  fVar265 = auVar161._8_4_;
  auVar154._8_4_ = fVar265 * auVar10._8_4_;
  fVar266 = auVar161._12_4_;
  auVar154._12_4_ = fVar266 * auVar10._12_4_;
  fVar267 = auVar161._16_4_;
  auVar154._16_4_ = fVar267 * auVar10._16_4_;
  fVar268 = auVar161._20_4_;
  auVar154._20_4_ = fVar268 * auVar10._20_4_;
  fVar270 = auVar161._24_4_;
  auVar154._24_4_ = fVar270 * auVar10._24_4_;
  auVar154._28_4_ = auVar397._28_4_;
  auVar161 = vsubps_avx(auVar322,auVar154);
  fVar252 = fVar252 + fVar252 * auVar161._0_4_;
  fVar264 = fVar264 + fVar264 * auVar161._4_4_;
  fVar265 = fVar265 + fVar265 * auVar161._8_4_;
  fVar266 = fVar266 + fVar266 * auVar161._12_4_;
  fVar267 = fVar267 + fVar267 * auVar161._16_4_;
  fVar268 = fVar268 + fVar268 * auVar161._20_4_;
  fVar270 = fVar270 + fVar270 * auVar161._24_4_;
  auVar161 = vrcpps_avx(auVar117);
  fVar231 = auVar161._0_4_;
  fVar246 = auVar161._4_4_;
  auVar12._4_4_ = fVar246 * auVar117._4_4_;
  auVar12._0_4_ = fVar231 * auVar117._0_4_;
  fVar247 = auVar161._8_4_;
  auVar12._8_4_ = fVar247 * auVar117._8_4_;
  fVar248 = auVar161._12_4_;
  auVar12._12_4_ = fVar248 * auVar117._12_4_;
  fVar249 = auVar161._16_4_;
  auVar12._16_4_ = fVar249 * auVar117._16_4_;
  fVar250 = auVar161._20_4_;
  auVar12._20_4_ = fVar250 * auVar117._20_4_;
  fVar251 = auVar161._24_4_;
  auVar12._24_4_ = fVar251 * auVar117._24_4_;
  auVar12._28_4_ = auVar10._28_4_;
  auVar117 = vsubps_avx(auVar322,auVar12);
  fVar231 = fVar231 + fVar231 * auVar117._0_4_;
  fVar246 = fVar246 + fVar246 * auVar117._4_4_;
  fVar247 = fVar247 + fVar247 * auVar117._8_4_;
  fVar248 = fVar248 + fVar248 * auVar117._12_4_;
  fVar249 = fVar249 + fVar249 * auVar117._16_4_;
  fVar250 = fVar250 + fVar250 * auVar117._20_4_;
  fVar251 = fVar251 + fVar251 * auVar117._24_4_;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + uVar101 * 7 + 6);
  auVar139 = vpmovsxwd_avx(auVar139);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar101 * 7 + 0xe);
  auVar14 = vpmovsxwd_avx(auVar14);
  auVar118._16_16_ = auVar14;
  auVar118._0_16_ = auVar139;
  auVar117 = vcvtdq2ps_avx(auVar118);
  auVar117 = vsubps_avx(auVar117,auVar276);
  auVar105._0_4_ = fVar202 * auVar117._0_4_;
  auVar105._4_4_ = fVar224 * auVar117._4_4_;
  auVar105._8_4_ = fVar225 * auVar117._8_4_;
  auVar105._12_4_ = fVar226 * auVar117._12_4_;
  auVar10._16_4_ = fVar227 * auVar117._16_4_;
  auVar10._0_16_ = auVar105;
  auVar10._20_4_ = fVar228 * auVar117._20_4_;
  auVar10._24_4_ = fVar229 * auVar117._24_4_;
  auVar10._28_4_ = auVar117._28_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + lVar7 + 6);
  auVar139 = vpmovsxwd_avx(auVar29);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = *(ulong *)(prim + lVar7 + 0xe);
  auVar14 = vpmovsxwd_avx(auVar212);
  auVar297._16_16_ = auVar14;
  auVar297._0_16_ = auVar139;
  auVar117 = vcvtdq2ps_avx(auVar297);
  auVar117 = vsubps_avx(auVar117,auVar276);
  auVar203._0_4_ = fVar202 * auVar117._0_4_;
  auVar203._4_4_ = fVar224 * auVar117._4_4_;
  auVar203._8_4_ = fVar225 * auVar117._8_4_;
  auVar203._12_4_ = fVar226 * auVar117._12_4_;
  auVar13._16_4_ = fVar227 * auVar117._16_4_;
  auVar13._0_16_ = auVar203;
  auVar13._20_4_ = fVar228 * auVar117._20_4_;
  auVar13._24_4_ = fVar229 * auVar117._24_4_;
  auVar13._28_4_ = auVar397._28_4_ + auVar11._28_4_;
  lVar99 = (ulong)(byte)PVar4 * 0x10;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + lVar99 + 6);
  auVar139 = vpmovsxwd_avx(auVar175);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + lVar99 + 0xe);
  auVar14 = vpmovsxwd_avx(auVar108);
  lVar99 = lVar99 + uVar101 * -2;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + lVar99 + 6);
  auVar29 = vpmovsxwd_avx(auVar113);
  auVar357._8_8_ = 0;
  auVar357._0_8_ = *(ulong *)(prim + lVar99 + 0xe);
  auVar212 = vpmovsxwd_avx(auVar357);
  auVar277._16_16_ = auVar212;
  auVar277._0_16_ = auVar29;
  auVar117 = vcvtdq2ps_avx(auVar277);
  auVar117 = vsubps_avx(auVar117,auVar150);
  auVar273._0_4_ = fVar252 * auVar117._0_4_;
  auVar273._4_4_ = fVar264 * auVar117._4_4_;
  auVar273._8_4_ = fVar265 * auVar117._8_4_;
  auVar273._12_4_ = fVar266 * auVar117._12_4_;
  auVar397._16_4_ = fVar267 * auVar117._16_4_;
  auVar397._0_16_ = auVar273;
  auVar397._20_4_ = fVar268 * auVar117._20_4_;
  auVar397._24_4_ = fVar270 * auVar117._24_4_;
  auVar397._28_4_ = auVar117._28_4_;
  auVar298._16_16_ = auVar14;
  auVar298._0_16_ = auVar139;
  auVar117 = vcvtdq2ps_avx(auVar298);
  auVar117 = vsubps_avx(auVar117,auVar150);
  auVar115._0_4_ = fVar252 * auVar117._0_4_;
  auVar115._4_4_ = fVar264 * auVar117._4_4_;
  auVar115._8_4_ = fVar265 * auVar117._8_4_;
  auVar115._12_4_ = fVar266 * auVar117._12_4_;
  auVar340._16_4_ = fVar267 * auVar117._16_4_;
  auVar340._0_16_ = auVar115;
  auVar340._20_4_ = fVar268 * auVar117._20_4_;
  auVar340._24_4_ = fVar270 * auVar117._24_4_;
  auVar340._28_4_ = auVar117._28_4_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar103 + uVar101 + 6);
  auVar139 = vpmovsxwd_avx(auVar109);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *(ulong *)(prim + uVar103 + uVar101 + 0xe);
  auVar14 = vpmovsxwd_avx(auVar145);
  auVar260._16_16_ = auVar14;
  auVar260._0_16_ = auVar139;
  auVar117 = vcvtdq2ps_avx(auVar260);
  auVar117 = vsubps_avx(auVar117,auVar183);
  auVar254._0_4_ = fVar231 * auVar117._0_4_;
  auVar254._4_4_ = fVar246 * auVar117._4_4_;
  auVar254._8_4_ = fVar247 * auVar117._8_4_;
  auVar254._12_4_ = fVar248 * auVar117._12_4_;
  auVar30._16_4_ = fVar249 * auVar117._16_4_;
  auVar30._0_16_ = auVar254;
  auVar30._20_4_ = fVar250 * auVar117._20_4_;
  auVar30._24_4_ = fVar251 * auVar117._24_4_;
  auVar30._28_4_ = auVar117._28_4_;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar101 * 0x17 + 6);
  auVar139 = vpmovsxwd_avx(auVar140);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar101 * 0x17 + 0xe);
  auVar14 = vpmovsxwd_avx(auVar3);
  auVar299._16_16_ = auVar14;
  auVar299._0_16_ = auVar139;
  auVar117 = vcvtdq2ps_avx(auVar299);
  auVar117 = vsubps_avx(auVar117,auVar183);
  auVar174._0_4_ = fVar231 * auVar117._0_4_;
  auVar174._4_4_ = fVar246 * auVar117._4_4_;
  auVar174._8_4_ = fVar247 * auVar117._8_4_;
  auVar174._12_4_ = fVar248 * auVar117._12_4_;
  auVar31._16_4_ = fVar249 * auVar117._16_4_;
  auVar31._0_16_ = auVar174;
  auVar31._20_4_ = fVar250 * auVar117._20_4_;
  auVar31._24_4_ = fVar251 * auVar117._24_4_;
  auVar31._28_4_ = auVar117._28_4_;
  auVar139 = vpminsd_avx(auVar10._16_16_,auVar13._16_16_);
  auVar14 = vpminsd_avx(auVar105,auVar203);
  auVar323._16_16_ = auVar139;
  auVar323._0_16_ = auVar14;
  auVar139 = vpminsd_avx(auVar397._16_16_,auVar340._16_16_);
  auVar14 = vpminsd_avx(auVar273,auVar115);
  auVar369._16_16_ = auVar139;
  auVar369._0_16_ = auVar14;
  auVar117 = vmaxps_avx(auVar323,auVar369);
  auVar139 = vpminsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar14 = vpminsd_avx(auVar254,auVar174);
  auVar395._16_16_ = auVar139;
  auVar395._0_16_ = auVar14;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar419._4_4_ = uVar1;
  auVar419._0_4_ = uVar1;
  auVar419._8_4_ = uVar1;
  auVar419._12_4_ = uVar1;
  auVar419._16_4_ = uVar1;
  auVar419._20_4_ = uVar1;
  auVar419._24_4_ = uVar1;
  auVar419._28_4_ = uVar1;
  auVar161 = vmaxps_avx(auVar395,auVar419);
  auVar117 = vmaxps_avx(auVar117,auVar161);
  local_2e0._4_4_ = auVar117._4_4_ * 0.99999964;
  local_2e0._0_4_ = auVar117._0_4_ * 0.99999964;
  local_2e0._8_4_ = auVar117._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar117._12_4_ * 0.99999964;
  local_2e0._16_4_ = auVar117._16_4_ * 0.99999964;
  local_2e0._20_4_ = auVar117._20_4_ * 0.99999964;
  local_2e0._24_4_ = auVar117._24_4_ * 0.99999964;
  local_2e0._28_4_ = auVar117._28_4_;
  auVar139 = vpmaxsd_avx(auVar10._16_16_,auVar13._16_16_);
  auVar14 = vpmaxsd_avx(auVar105,auVar203);
  auVar119._16_16_ = auVar139;
  auVar119._0_16_ = auVar14;
  auVar139 = vpmaxsd_avx(auVar397._16_16_,auVar340._16_16_);
  auVar14 = vpmaxsd_avx(auVar273,auVar115);
  auVar151._16_16_ = auVar139;
  auVar151._0_16_ = auVar14;
  auVar117 = vminps_avx(auVar119,auVar151);
  auVar139 = vpmaxsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar14 = vpmaxsd_avx(auVar254,auVar174);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar218._4_4_ = uVar1;
  auVar218._0_4_ = uVar1;
  auVar218._8_4_ = uVar1;
  auVar218._12_4_ = uVar1;
  auVar218._16_4_ = uVar1;
  auVar218._20_4_ = uVar1;
  auVar218._24_4_ = uVar1;
  auVar218._28_4_ = uVar1;
  auVar152._16_16_ = auVar139;
  auVar152._0_16_ = auVar14;
  auVar161 = vminps_avx(auVar152,auVar218);
  auVar117 = vminps_avx(auVar117,auVar161);
  auVar161._4_4_ = auVar117._4_4_ * 1.0000004;
  auVar161._0_4_ = auVar117._0_4_ * 1.0000004;
  auVar161._8_4_ = auVar117._8_4_ * 1.0000004;
  auVar161._12_4_ = auVar117._12_4_ * 1.0000004;
  auVar161._16_4_ = auVar117._16_4_ * 1.0000004;
  auVar161._20_4_ = auVar117._20_4_ * 1.0000004;
  auVar161._24_4_ = auVar117._24_4_ * 1.0000004;
  auVar161._28_4_ = auVar117._28_4_;
  auVar117 = vcmpps_avx(local_2e0,auVar161,2);
  auVar139 = vpshufd_avx(ZEXT116((byte)PVar4),0);
  auVar153._16_16_ = auVar139;
  auVar153._0_16_ = auVar139;
  auVar161 = vcvtdq2ps_avx(auVar153);
  auVar161 = vcmpps_avx(_DAT_01faff40,auVar161,1);
  auVar117 = vandps_avx(auVar117,auVar161);
  uVar94 = vmovmskps_avx(auVar117);
  if (uVar94 == 0) {
    return;
  }
  uVar94 = uVar94 & 0xff;
  auVar120._16_16_ = mm_lookupmask_ps._240_16_;
  auVar120._0_16_ = mm_lookupmask_ps._240_16_;
  local_4c0 = vblendps_avx(auVar120,ZEXT832(0) << 0x20,0x80);
  local_a88 = &local_5c0;
  uVar98 = 1 << ((byte)k & 0x1f);
  local_a90 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar98 & 0xf) << 4));
  local_a98 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar98 >> 4) * 0x10);
  local_908 = prim;
LAB_01079f9e:
  uVar101 = (ulong)uVar94;
  lVar99 = 0;
  if (uVar101 != 0) {
    for (; (uVar94 >> lVar99 & 1) == 0; lVar99 = lVar99 + 1) {
    }
  }
  uVar101 = uVar101 - 1 & uVar101;
  uVar94 = *(uint *)(local_908 + 2);
  local_960 = (ulong)*(uint *)(local_908 + lVar99 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar94].ptr;
  uVar103 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                            pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i * local_960);
  p_Var6 = pGVar5[1].intersectionFilterN;
  lVar7 = *(long *)&pGVar5[1].time_range.upper;
  auVar139 = *(undefined1 (*) [16])(lVar7 + (long)p_Var6 * uVar103);
  auVar14 = *(undefined1 (*) [16])(lVar7 + (uVar103 + 1) * (long)p_Var6);
  lVar9 = 0;
  if (uVar101 != 0) {
    for (; (uVar101 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  if (((uVar101 != 0) && (uVar100 = uVar101 - 1 & uVar101, uVar100 != 0)) &&
     (lVar9 = 0, uVar100 != 0)) {
    for (; (uVar100 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  auVar29 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar212 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar202 = *(float *)(ray + k * 4 + 0x80);
  auVar365._4_4_ = fVar202;
  auVar365._0_4_ = fVar202;
  auVar365._8_4_ = fVar202;
  auVar365._12_4_ = fVar202;
  fStack_870 = fVar202;
  _local_880 = auVar365;
  fStack_86c = fVar202;
  fStack_868 = fVar202;
  fStack_864 = fVar202;
  fVar224 = *(float *)(ray + k * 4 + 0xa0);
  auVar375._4_4_ = fVar224;
  auVar375._0_4_ = fVar224;
  auVar375._8_4_ = fVar224;
  auVar375._12_4_ = fVar224;
  fStack_890 = fVar224;
  _local_8a0 = auVar375;
  fStack_88c = fVar224;
  fStack_888 = fVar224;
  fStack_884 = fVar224;
  auVar377 = ZEXT3264(_local_8a0);
  auVar29 = vunpcklps_avx(auVar365,auVar375);
  fVar225 = *(float *)(ray + k * 4 + 0xc0);
  auVar394._4_4_ = fVar225;
  auVar394._0_4_ = fVar225;
  auVar394._8_4_ = fVar225;
  auVar394._12_4_ = fVar225;
  fStack_830 = fVar225;
  _local_840 = auVar394;
  fStack_82c = fVar225;
  fStack_828 = fVar225;
  fStack_824 = fVar225;
  _local_9b0 = vinsertps_avx(auVar29,auVar394,0x28);
  auVar106._0_4_ = (auVar139._0_4_ + auVar14._0_4_) * 0.5;
  auVar106._4_4_ = (auVar139._4_4_ + auVar14._4_4_) * 0.5;
  auVar106._8_4_ = (auVar139._8_4_ + auVar14._8_4_) * 0.5;
  auVar106._12_4_ = (auVar139._12_4_ + auVar14._12_4_) * 0.5;
  auVar29 = vsubps_avx(auVar106,auVar212);
  auVar29 = vdpps_avx(auVar29,_local_9b0,0x7f);
  local_9c0 = vdpps_avx(_local_9b0,_local_9b0,0x7f);
  auVar363 = ZEXT1664(local_9c0);
  auVar175 = vrcpss_avx(local_9c0,local_9c0);
  fVar226 = auVar29._0_4_ * auVar175._0_4_ * (2.0 - local_9c0._0_4_ * auVar175._0_4_);
  auVar175 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
  auVar255._0_4_ = auVar212._0_4_ + local_9b0._0_4_ * auVar175._0_4_;
  auVar255._4_4_ = auVar212._4_4_ + local_9b0._4_4_ * auVar175._4_4_;
  auVar255._8_4_ = auVar212._8_4_ + local_9b0._8_4_ * auVar175._8_4_;
  auVar255._12_4_ = auVar212._12_4_ + local_9b0._12_4_ * auVar175._12_4_;
  auVar29 = vblendps_avx(auVar255,_DAT_01f7aa10,8);
  _local_b00 = vsubps_avx(auVar139,auVar29);
  _local_b10 = vsubps_avx(*(undefined1 (*) [16])(lVar7 + (uVar103 + 2) * (long)p_Var6),auVar29);
  _local_b20 = vsubps_avx(auVar14,auVar29);
  auVar327 = ZEXT1664(_local_b20);
  _local_b30 = vsubps_avx(*(undefined1 (*) [16])(lVar7 + (uVar103 + 3) * (long)p_Var6),auVar29);
  auVar139 = vshufps_avx(_local_b00,_local_b00,0);
  register0x00001250 = auVar139;
  _local_1e0 = auVar139;
  auVar139 = vshufps_avx(_local_b00,_local_b00,0x55);
  register0x00001250 = auVar139;
  _local_200 = auVar139;
  auVar139 = vshufps_avx(_local_b00,_local_b00,0xaa);
  register0x00001250 = auVar139;
  _local_220 = auVar139;
  auVar139 = vshufps_avx(_local_b00,_local_b00,0xff);
  register0x00001290 = auVar139;
  _local_240 = auVar139;
  auVar139 = vshufps_avx(_local_b20,_local_b20,0);
  register0x00001290 = auVar139;
  _local_3c0 = auVar139;
  auVar139 = vshufps_avx(_local_b20,_local_b20,0x55);
  register0x00001290 = auVar139;
  _local_3e0 = auVar139;
  auVar139 = vshufps_avx(_local_b20,_local_b20,0xaa);
  register0x00001290 = auVar139;
  _local_400 = auVar139;
  auVar139 = vshufps_avx(_local_b20,_local_b20,0xff);
  register0x00001290 = auVar139;
  _local_260 = auVar139;
  auVar139 = vshufps_avx(_local_b10,_local_b10,0);
  register0x00001290 = auVar139;
  _local_420 = auVar139;
  auVar139 = vshufps_avx(_local_b10,_local_b10,0x55);
  register0x00001290 = auVar139;
  _local_440 = auVar139;
  auVar139 = vshufps_avx(_local_b10,_local_b10,0xaa);
  register0x00001290 = auVar139;
  _local_460 = auVar139;
  auVar139 = vshufps_avx(_local_b10,_local_b10,0xff);
  register0x00001290 = auVar139;
  _local_480 = auVar139;
  auVar139 = vshufps_avx(_local_b30,_local_b30,0);
  register0x000014d0 = auVar139;
  _local_a00 = auVar139;
  auVar371 = ZEXT3264(_local_a00);
  auVar14 = vshufps_avx(_local_b30,_local_b30,0x55);
  auVar139 = vshufps_avx(_local_b30,_local_b30,0xaa);
  register0x00001290 = auVar139;
  _local_4a0 = auVar139;
  auVar139 = vshufps_avx(_local_b30,_local_b30,0xff);
  register0x00001290 = auVar139;
  _local_280 = auVar139;
  auVar139 = ZEXT416((uint)(fVar202 * fVar202 + fVar224 * fVar224 + fVar225 * fVar225));
  auVar139 = vshufps_avx(auVar139,auVar139,0);
  local_2a0._16_16_ = auVar139;
  local_2a0._0_16_ = auVar139;
  fVar202 = *(float *)(ray + k * 4 + 0x60);
  local_920 = ZEXT416((uint)fVar226);
  auVar139 = vshufps_avx(ZEXT416((uint)(fVar202 - fVar226)),ZEXT416((uint)(fVar202 - fVar226)),0);
  local_2c0._16_16_ = auVar139;
  local_2c0._0_16_ = auVar139;
  auVar139 = vpshufd_avx(ZEXT416(uVar94),0);
  local_500._16_16_ = auVar139;
  local_500._0_16_ = auVar139;
  auVar139 = vpshufd_avx(ZEXT416(*(uint *)(local_908 + lVar99 * 4 + 6)),0);
  local_520._16_16_ = auVar139;
  local_520._0_16_ = auVar139;
  register0x00001210 = auVar175;
  _local_940 = auVar175;
  local_ce4 = 1;
  uVar103 = 0;
  auVar121._8_4_ = 0x7fffffff;
  auVar121._0_8_ = 0x7fffffff7fffffff;
  auVar121._12_4_ = 0x7fffffff;
  auVar121._16_4_ = 0x7fffffff;
  auVar121._20_4_ = 0x7fffffff;
  auVar121._24_4_ = 0x7fffffff;
  auVar121._28_4_ = 0x7fffffff;
  local_4e0 = vandps_avx(local_2a0,auVar121);
  auVar139 = vsqrtss_avx(local_9c0,local_9c0);
  auVar29 = vsqrtss_avx(local_9c0,local_9c0);
  local_6b0 = ZEXT816(0x3f80000000000000);
  do {
    auVar241._8_4_ = 0x3f800000;
    auVar241._0_8_ = 0x3f8000003f800000;
    auVar241._12_4_ = 0x3f800000;
    auVar241._16_4_ = 0x3f800000;
    auVar241._20_4_ = 0x3f800000;
    iVar102 = (int)uVar103;
    auVar241._24_4_ = 0x3f800000;
    auVar241._28_4_ = 0x3f800000;
    auVar212 = vmovshdup_avx(local_6b0);
    auVar108 = vsubps_avx(auVar212,local_6b0);
    auVar212 = vshufps_avx(local_6b0,local_6b0,0);
    local_800._16_16_ = auVar212;
    local_800._0_16_ = auVar212;
    auVar175 = vshufps_avx(auVar108,auVar108,0);
    local_820._16_16_ = auVar175;
    local_820._0_16_ = auVar175;
    fVar138 = auVar175._0_4_;
    fVar164 = auVar175._4_4_;
    fVar166 = auVar175._8_4_;
    fVar168 = auVar175._12_4_;
    fVar104 = auVar212._0_4_;
    auVar219._0_4_ = fVar104 + fVar138 * 0.0;
    fVar135 = auVar212._4_4_;
    auVar219._4_4_ = fVar135 + fVar164 * 0.14285715;
    fVar136 = auVar212._8_4_;
    auVar219._8_4_ = fVar136 + fVar166 * 0.2857143;
    fVar137 = auVar212._12_4_;
    auVar219._12_4_ = fVar137 + fVar168 * 0.42857146;
    auVar219._16_4_ = fVar104 + fVar138 * 0.5714286;
    auVar219._20_4_ = fVar135 + fVar164 * 0.71428573;
    auVar219._24_4_ = fVar136 + fVar166 * 0.8571429;
    auVar219._28_4_ = fVar137 + fVar168;
    auVar117 = vsubps_avx(auVar241,auVar219);
    auVar184._0_4_ = auVar219._0_4_ * auVar219._0_4_;
    auVar184._4_4_ = auVar219._4_4_ * auVar219._4_4_;
    auVar184._8_4_ = auVar219._8_4_ * auVar219._8_4_;
    auVar184._12_4_ = auVar219._12_4_ * auVar219._12_4_;
    auVar184._16_4_ = auVar219._16_4_ * auVar219._16_4_;
    auVar184._20_4_ = auVar219._20_4_ * auVar219._20_4_;
    auVar184._24_4_ = auVar219._24_4_ * auVar219._24_4_;
    auVar184._28_4_ = 0;
    fVar247 = auVar219._0_4_ * 3.0;
    fVar248 = auVar219._4_4_ * 3.0;
    fVar249 = auVar219._8_4_ * 3.0;
    fVar250 = auVar219._12_4_ * 3.0;
    fVar251 = auVar219._16_4_ * 3.0;
    fVar252 = auVar219._20_4_ * 3.0;
    fVar264 = auVar219._24_4_ * 3.0;
    fVar224 = auVar117._0_4_;
    auVar328._0_4_ = fVar224 * fVar224;
    fVar225 = auVar117._4_4_;
    auVar328._4_4_ = fVar225 * fVar225;
    fVar226 = auVar117._8_4_;
    auVar328._8_4_ = fVar226 * fVar226;
    fVar227 = auVar117._12_4_;
    auVar328._12_4_ = fVar227 * fVar227;
    fVar228 = auVar117._16_4_;
    auVar328._16_4_ = fVar228 * fVar228;
    fVar229 = auVar117._20_4_;
    auVar328._20_4_ = fVar229 * fVar229;
    fVar231 = auVar117._24_4_;
    auVar328._28_36_ = auVar327._28_36_;
    auVar328._24_4_ = fVar231 * fVar231;
    fVar246 = auVar117._28_4_;
    fVar265 = (auVar328._0_4_ * (fVar224 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar266 = (auVar328._4_4_ * (fVar225 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar267 = (auVar328._8_4_ * (fVar226 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar268 = (auVar328._12_4_ * (fVar227 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar270 = (auVar328._16_4_ * (fVar228 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar269 = (auVar328._20_4_ * (fVar229 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar271 = (auVar328._24_4_ * (fVar231 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar335 = -fVar224 * auVar219._0_4_ * auVar219._0_4_ * 0.5;
    fVar341 = -fVar225 * auVar219._4_4_ * auVar219._4_4_ * 0.5;
    fVar343 = -fVar226 * auVar219._8_4_ * auVar219._8_4_ * 0.5;
    fVar345 = -fVar227 * auVar219._12_4_ * auVar219._12_4_ * 0.5;
    fVar347 = -fVar228 * auVar219._16_4_ * auVar219._16_4_ * 0.5;
    fVar350 = -fVar229 * auVar219._20_4_ * auVar219._20_4_ * 0.5;
    fVar353 = -fVar231 * auVar219._24_4_ * auVar219._24_4_ * 0.5;
    fVar390 = auVar14._0_4_;
    fVar418 = auVar14._4_4_;
    fVar401 = auVar14._8_4_;
    fVar405 = auVar14._12_4_;
    fVar364 = auVar363._28_4_ + fVar405;
    fVar372 = auVar371._28_4_ + fVar405;
    fVar391 = (auVar184._0_4_ * (fVar247 + -5.0) + 2.0) * 0.5;
    fVar398 = (auVar184._4_4_ * (fVar248 + -5.0) + 2.0) * 0.5;
    fVar402 = (auVar184._8_4_ * (fVar249 + -5.0) + 2.0) * 0.5;
    fVar406 = (auVar184._12_4_ * (fVar250 + -5.0) + 2.0) * 0.5;
    fVar409 = (auVar184._16_4_ * (fVar251 + -5.0) + 2.0) * 0.5;
    fVar412 = (auVar184._20_4_ * (fVar252 + -5.0) + 2.0) * 0.5;
    fVar415 = (auVar184._24_4_ * (fVar264 + -5.0) + 2.0) * 0.5;
    fVar373 = -auVar219._0_4_ * fVar224 * fVar224 * 0.5;
    fVar378 = -auVar219._4_4_ * fVar225 * fVar225 * 0.5;
    fVar380 = -auVar219._8_4_ * fVar226 * fVar226 * 0.5;
    fVar382 = -auVar219._12_4_ * fVar227 * fVar227 * 0.5;
    fVar384 = -auVar219._16_4_ * fVar228 * fVar228 * 0.5;
    fVar386 = -auVar219._20_4_ * fVar229 * fVar229 * 0.5;
    fVar388 = -auVar219._24_4_ * fVar231 * fVar231 * 0.5;
    local_980 = fVar373 * (float)local_1e0._0_4_ +
                fVar391 * (float)local_3c0._0_4_ +
                auVar371._0_4_ * fVar335 + fVar265 * (float)local_420._0_4_;
    fStack_97c = fVar378 * (float)local_1e0._4_4_ +
                 fVar398 * (float)local_3c0._4_4_ +
                 auVar371._4_4_ * fVar341 + fVar266 * (float)local_420._4_4_;
    fStack_978 = fVar380 * fStack_1d8 +
                 fVar402 * fStack_3b8 + auVar371._8_4_ * fVar343 + fVar267 * fStack_418;
    fStack_974 = fVar382 * fStack_1d4 +
                 fVar406 * fStack_3b4 + auVar371._12_4_ * fVar345 + fVar268 * fStack_414;
    fStack_970 = fVar384 * fStack_1d0 +
                 fVar409 * fStack_3b0 + auVar371._16_4_ * fVar347 + fVar270 * fStack_410;
    fStack_96c = fVar386 * fStack_1cc +
                 fVar412 * fStack_3ac + auVar371._20_4_ * fVar350 + fVar269 * fStack_40c;
    fStack_968 = fVar388 * fStack_1c8 +
                 fVar415 * fStack_3a8 + auVar371._24_4_ * fVar353 + fVar271 * fStack_408;
    fStack_964 = fVar405 + 2.0 + -fVar246 + fVar364;
    fVar336 = (float)local_200._0_4_ * fVar373 +
              fVar391 * (float)local_3e0._0_4_ +
              fVar390 * fVar335 + fVar265 * (float)local_440._0_4_;
    fVar342 = (float)local_200._4_4_ * fVar378 +
              fVar398 * (float)local_3e0._4_4_ +
              fVar418 * fVar341 + fVar266 * (float)local_440._4_4_;
    fVar344 = fStack_1f8 * fVar380 + fVar402 * fStack_3d8 + fVar401 * fVar343 + fVar267 * fStack_438
    ;
    fVar346 = fStack_1f4 * fVar382 + fVar406 * fStack_3d4 + fVar405 * fVar345 + fVar268 * fStack_434
    ;
    fVar348 = fStack_1f0 * fVar384 + fVar409 * fStack_3d0 + fVar390 * fVar347 + fVar270 * fStack_430
    ;
    fVar351 = fStack_1ec * fVar386 + fVar412 * fStack_3cc + fVar418 * fVar350 + fVar269 * fStack_42c
    ;
    fVar354 = fStack_1e8 * fVar388 + fVar415 * fStack_3c8 + fVar401 * fVar353 + fVar271 * fStack_428
    ;
    fVar356 = fStack_964 + fVar364 + fVar372;
    fVar173 = (float)local_220._0_4_ * fVar373 +
              fVar391 * (float)local_400._0_4_ +
              fVar335 * (float)local_4a0._0_4_ + fVar265 * (float)local_460._0_4_;
    fVar195 = (float)local_220._4_4_ * fVar378 +
              fVar398 * (float)local_400._4_4_ +
              fVar341 * (float)local_4a0._4_4_ + fVar266 * (float)local_460._4_4_;
    fVar196 = fStack_218 * fVar380 +
              fVar402 * fStack_3f8 + fVar343 * fStack_498 + fVar267 * fStack_458;
    fVar197 = fStack_214 * fVar382 +
              fVar406 * fStack_3f4 + fVar345 * fStack_494 + fVar268 * fStack_454;
    fVar198 = fStack_210 * fVar384 +
              fVar409 * fStack_3f0 + fVar347 * fStack_490 + fVar270 * fStack_450;
    fVar199 = fStack_20c * fVar386 +
              fVar412 * fStack_3ec + fVar350 * fStack_48c + fVar269 * fStack_44c;
    fVar200 = fStack_208 * fVar388 +
              fVar415 * fStack_3e8 + fVar353 * fStack_488 + fVar271 * fStack_448;
    fVar201 = fVar356 + fVar372 + auVar377._28_4_ + fVar405;
    auVar261._0_4_ =
         fVar373 * (float)local_240._0_4_ +
         (float)local_260._0_4_ * fVar391 +
         (float)local_280._0_4_ * fVar335 + fVar265 * (float)local_480._0_4_;
    auVar261._4_4_ =
         fVar378 * (float)local_240._4_4_ +
         (float)local_260._4_4_ * fVar398 +
         (float)local_280._4_4_ * fVar341 + fVar266 * (float)local_480._4_4_;
    auVar261._8_4_ =
         fVar380 * fStack_238 + fStack_258 * fVar402 + fStack_278 * fVar343 + fVar267 * fStack_478;
    auVar261._12_4_ =
         fVar382 * fStack_234 + fStack_254 * fVar406 + fStack_274 * fVar345 + fVar268 * fStack_474;
    auVar261._16_4_ =
         fVar384 * fStack_230 + fStack_250 * fVar409 + fStack_270 * fVar347 + fVar270 * fStack_470;
    auVar261._20_4_ =
         fVar386 * fStack_22c + fStack_24c * fVar412 + fStack_26c * fVar350 + fVar269 * fStack_46c;
    auVar261._24_4_ =
         fVar388 * fStack_228 + fStack_248 * fVar415 + fStack_268 * fVar353 + fVar271 * fStack_468;
    auVar261._28_4_ = fVar356 + fVar405 + 2.0 + -fVar246 + fVar137 + -5.0 + 2.0;
    auVar32._4_4_ = (fVar225 + fVar225) * auVar219._4_4_;
    auVar32._0_4_ = (fVar224 + fVar224) * auVar219._0_4_;
    auVar32._8_4_ = (fVar226 + fVar226) * auVar219._8_4_;
    auVar32._12_4_ = (fVar227 + fVar227) * auVar219._12_4_;
    auVar32._16_4_ = (fVar228 + fVar228) * auVar219._16_4_;
    auVar32._20_4_ = (fVar229 + fVar229) * auVar219._20_4_;
    auVar32._24_4_ = (fVar231 + fVar231) * auVar219._24_4_;
    auVar32._28_4_ = auVar219._28_4_ + auVar219._28_4_;
    auVar117 = vsubps_avx(auVar32,auVar328._0_32_);
    auVar33._4_4_ = (fVar225 + fVar225) * (fVar248 + 2.0);
    auVar33._0_4_ = (fVar224 + fVar224) * (fVar247 + 2.0);
    auVar33._8_4_ = (fVar226 + fVar226) * (fVar249 + 2.0);
    auVar33._12_4_ = (fVar227 + fVar227) * (fVar250 + 2.0);
    auVar33._16_4_ = (fVar228 + fVar228) * (fVar251 + 2.0);
    auVar33._20_4_ = (fVar229 + fVar229) * (fVar252 + 2.0);
    auVar33._24_4_ = (fVar231 + fVar231) * (fVar264 + 2.0);
    auVar33._28_4_ = 0x40400000;
    auVar34._4_4_ = fVar225 * fVar225 * 3.0;
    auVar34._0_4_ = fVar224 * fVar224 * 3.0;
    auVar34._8_4_ = fVar226 * fVar226 * 3.0;
    auVar34._12_4_ = fVar227 * fVar227 * 3.0;
    auVar34._16_4_ = fVar228 * fVar228 * 3.0;
    auVar34._20_4_ = fVar229 * fVar229 * 3.0;
    auVar34._24_4_ = fVar231 * fVar231 * 3.0;
    auVar34._28_4_ = fVar246;
    auVar161 = vsubps_avx(auVar33,auVar34);
    auVar10 = vsubps_avx(auVar184,auVar32);
    fVar347 = auVar117._0_4_ * 0.5;
    fVar350 = auVar117._4_4_ * 0.5;
    fVar353 = auVar117._8_4_ * 0.5;
    fVar364 = auVar117._12_4_ * 0.5;
    fVar372 = auVar117._16_4_ * 0.5;
    fVar373 = auVar117._20_4_ * 0.5;
    fVar378 = auVar117._24_4_ * 0.5;
    fVar266 = (auVar219._0_4_ * fVar247 + (auVar219._0_4_ + auVar219._0_4_) * (fVar247 + -5.0)) *
              0.5;
    fVar268 = (auVar219._4_4_ * fVar248 + (auVar219._4_4_ + auVar219._4_4_) * (fVar248 + -5.0)) *
              0.5;
    fVar271 = (auVar219._8_4_ * fVar249 + (auVar219._8_4_ + auVar219._8_4_) * (fVar249 + -5.0)) *
              0.5;
    fVar335 = (auVar219._12_4_ * fVar250 + (auVar219._12_4_ + auVar219._12_4_) * (fVar250 + -5.0)) *
              0.5;
    fVar341 = (auVar219._16_4_ * fVar251 + (auVar219._16_4_ + auVar219._16_4_) * (fVar251 + -5.0)) *
              0.5;
    fVar343 = (auVar219._20_4_ * fVar252 + (auVar219._20_4_ + auVar219._20_4_) * (fVar252 + -5.0)) *
              0.5;
    fVar345 = (auVar219._24_4_ * fVar264 + (auVar219._24_4_ + auVar219._24_4_) * (fVar264 + -5.0)) *
              0.5;
    fVar224 = auVar161._0_4_ * 0.5;
    fVar225 = auVar161._4_4_ * 0.5;
    fVar226 = auVar161._8_4_ * 0.5;
    fVar227 = auVar161._12_4_ * 0.5;
    fVar228 = auVar161._16_4_ * 0.5;
    fVar229 = auVar161._20_4_ * 0.5;
    fVar249 = auVar161._24_4_ * 0.5;
    fVar248 = auVar10._0_4_ * 0.5;
    fVar250 = auVar10._4_4_ * 0.5;
    fVar251 = auVar10._8_4_ * 0.5;
    fVar252 = auVar10._12_4_ * 0.5;
    fVar264 = auVar10._16_4_ * 0.5;
    fVar270 = auVar10._20_4_ * 0.5;
    fVar269 = auVar10._24_4_ * 0.5;
    fVar320 = fVar246 + fVar246 + auVar117._28_4_ + fVar246 + fVar246 + -4.0;
    auVar212 = vpermilps_avx(ZEXT416((uint)(auVar108._0_4_ * 0.04761905)),0);
    fVar231 = auVar212._0_4_;
    fVar292 = fVar231 * ((float)local_1e0._0_4_ * fVar347 +
                        fVar266 * (float)local_3c0._0_4_ +
                        fVar224 * (float)local_420._0_4_ + fVar248 * (float)local_a00._0_4_);
    fVar247 = auVar212._4_4_;
    fVar309 = fVar247 * ((float)local_1e0._4_4_ * fVar350 +
                        fVar268 * (float)local_3c0._4_4_ +
                        fVar225 * (float)local_420._4_4_ + fVar250 * (float)local_a00._4_4_);
    auVar35._4_4_ = fVar309;
    auVar35._0_4_ = fVar292;
    fVar265 = auVar212._8_4_;
    fVar310 = fVar265 * (fStack_1d8 * fVar353 +
                        fVar271 * fStack_3b8 + fVar226 * fStack_418 + fVar251 * fStack_9f8);
    auVar35._8_4_ = fVar310;
    fVar267 = auVar212._12_4_;
    fVar312 = fVar267 * (fStack_1d4 * fVar364 +
                        fVar335 * fStack_3b4 + fVar227 * fStack_414 + fVar252 * fStack_9f4);
    auVar35._12_4_ = fVar312;
    fVar314 = fVar231 * (fStack_1d0 * fVar372 +
                        fVar341 * fStack_3b0 + fVar228 * fStack_410 + fVar264 * fStack_9f0);
    auVar35._16_4_ = fVar314;
    fVar316 = fVar247 * (fStack_1cc * fVar373 +
                        fVar343 * fStack_3ac + fVar229 * fStack_40c + fVar270 * fStack_9ec);
    auVar35._20_4_ = fVar316;
    fVar318 = fVar265 * (fStack_1c8 * fVar378 +
                        fVar345 * fStack_3a8 + fVar249 * fStack_408 + fVar269 * fStack_9e8);
    auVar35._24_4_ = fVar318;
    auVar35._28_4_ = fVar320;
    fVar374 = fVar231 * ((float)local_200._0_4_ * fVar347 +
                        fVar266 * (float)local_3e0._0_4_ +
                        fVar224 * (float)local_440._0_4_ + fVar248 * fVar390);
    fVar379 = fVar247 * ((float)local_200._4_4_ * fVar350 +
                        fVar268 * (float)local_3e0._4_4_ +
                        fVar225 * (float)local_440._4_4_ + fVar250 * fVar418);
    auVar36._4_4_ = fVar379;
    auVar36._0_4_ = fVar374;
    fVar381 = fVar265 * (fStack_1f8 * fVar353 +
                        fVar271 * fStack_3d8 + fVar226 * fStack_438 + fVar251 * fVar401);
    auVar36._8_4_ = fVar381;
    fVar383 = fVar267 * (fStack_1f4 * fVar364 +
                        fVar335 * fStack_3d4 + fVar227 * fStack_434 + fVar252 * fVar405);
    auVar36._12_4_ = fVar383;
    fVar385 = fVar231 * (fStack_1f0 * fVar372 +
                        fVar341 * fStack_3d0 + fVar228 * fStack_430 + fVar264 * fVar390);
    auVar36._16_4_ = fVar385;
    fVar387 = fVar247 * (fStack_1ec * fVar373 +
                        fVar343 * fStack_3cc + fVar229 * fStack_42c + fVar270 * fVar418);
    auVar36._20_4_ = fVar387;
    fVar389 = fVar265 * (fStack_1e8 * fVar378 +
                        fVar345 * fStack_3c8 + fVar249 * fStack_428 + fVar269 * fVar401);
    auVar36._24_4_ = fVar389;
    auVar36._28_4_ = fStack_224;
    fVar392 = fVar231 * ((float)local_220._0_4_ * fVar347 +
                        fVar224 * (float)local_460._0_4_ + fVar248 * (float)local_4a0._0_4_ +
                        fVar266 * (float)local_400._0_4_);
    fVar399 = fVar247 * ((float)local_220._4_4_ * fVar350 +
                        fVar225 * (float)local_460._4_4_ + fVar250 * (float)local_4a0._4_4_ +
                        fVar268 * (float)local_400._4_4_);
    auVar37._4_4_ = fVar399;
    auVar37._0_4_ = fVar392;
    fVar403 = fVar265 * (fStack_218 * fVar353 +
                        fVar226 * fStack_458 + fVar251 * fStack_498 + fVar271 * fStack_3f8);
    auVar37._8_4_ = fVar403;
    fVar407 = fVar267 * (fStack_214 * fVar364 +
                        fVar227 * fStack_454 + fVar252 * fStack_494 + fVar335 * fStack_3f4);
    auVar37._12_4_ = fVar407;
    fVar410 = fVar231 * (fStack_210 * fVar372 +
                        fVar228 * fStack_450 + fVar264 * fStack_490 + fVar341 * fStack_3f0);
    auVar37._16_4_ = fVar410;
    fVar413 = fVar247 * (fStack_20c * fVar373 +
                        fVar229 * fStack_44c + fVar270 * fStack_48c + fVar343 * fStack_3ec);
    auVar37._20_4_ = fVar413;
    fVar416 = fVar265 * (fStack_208 * fVar378 +
                        fVar249 * fStack_448 + fVar269 * fStack_488 + fVar345 * fStack_3e8);
    auVar37._24_4_ = fVar416;
    auVar37._28_4_ = uStack_1e4;
    fVar246 = fVar231 * ((float)local_240._0_4_ * fVar347 +
                        (float)local_260._0_4_ * fVar266 +
                        fVar224 * (float)local_480._0_4_ + (float)local_280._0_4_ * fVar248);
    fVar248 = fVar247 * ((float)local_240._4_4_ * fVar350 +
                        (float)local_260._4_4_ * fVar268 +
                        fVar225 * (float)local_480._4_4_ + (float)local_280._4_4_ * fVar250);
    auVar38._4_4_ = fVar248;
    auVar38._0_4_ = fVar246;
    fVar266 = fVar265 * (fStack_238 * fVar353 +
                        fStack_258 * fVar271 + fVar226 * fStack_478 + fStack_278 * fVar251);
    auVar38._8_4_ = fVar266;
    fVar268 = fVar267 * (fStack_234 * fVar364 +
                        fStack_254 * fVar335 + fVar227 * fStack_474 + fStack_274 * fVar252);
    auVar38._12_4_ = fVar268;
    fVar231 = fVar231 * (fStack_230 * fVar372 +
                        fStack_250 * fVar341 + fVar228 * fStack_470 + fStack_270 * fVar264);
    auVar38._16_4_ = fVar231;
    fVar247 = fVar247 * (fStack_22c * fVar373 +
                        fStack_24c * fVar343 + fVar229 * fStack_46c + fStack_26c * fVar270);
    auVar38._20_4_ = fVar247;
    fVar265 = fVar265 * (fStack_228 * fVar378 +
                        fStack_248 * fVar345 + fVar249 * fStack_468 + fStack_268 * fVar269);
    auVar38._24_4_ = fVar265;
    auVar38._28_4_ = fVar267;
    auVar90._4_4_ = fVar342;
    auVar90._0_4_ = fVar336;
    auVar90._8_4_ = fVar344;
    auVar90._12_4_ = fVar346;
    auVar90._16_4_ = fVar348;
    auVar90._20_4_ = fVar351;
    auVar90._24_4_ = fVar354;
    auVar90._28_4_ = fVar356;
    auVar117 = vperm2f128_avx(auVar90,auVar90,1);
    auVar117 = vshufps_avx(auVar117,auVar90,0x30);
    auVar397 = vshufps_avx(auVar90,auVar117,0x29);
    auVar88._4_4_ = fVar195;
    auVar88._0_4_ = fVar173;
    auVar88._8_4_ = fVar196;
    auVar88._12_4_ = fVar197;
    auVar88._16_4_ = fVar198;
    auVar88._20_4_ = fVar199;
    auVar88._24_4_ = fVar200;
    auVar88._28_4_ = fVar201;
    auVar117 = vperm2f128_avx(auVar88,auVar88,1);
    auVar117 = vshufps_avx(auVar117,auVar88,0x30);
    local_a60 = vshufps_avx(auVar88,auVar117,0x29);
    auVar161 = vsubps_avx(auVar261,auVar38);
    auVar117 = vperm2f128_avx(auVar161,auVar161,1);
    auVar117 = vshufps_avx(auVar117,auVar161,0x30);
    auVar11 = vshufps_avx(auVar161,auVar117,0x29);
    auVar10 = vsubps_avx(auVar397,auVar90);
    auVar12 = vsubps_avx(local_a60,auVar88);
    fVar225 = auVar10._0_4_;
    fVar249 = auVar10._4_4_;
    auVar39._4_4_ = fVar399 * fVar249;
    auVar39._0_4_ = fVar392 * fVar225;
    fVar270 = auVar10._8_4_;
    auVar39._8_4_ = fVar403 * fVar270;
    fVar353 = auVar10._12_4_;
    auVar39._12_4_ = fVar407 * fVar353;
    fVar388 = auVar10._16_4_;
    auVar39._16_4_ = fVar410 * fVar388;
    fVar412 = auVar10._20_4_;
    auVar39._20_4_ = fVar413 * fVar412;
    fVar21 = auVar10._24_4_;
    auVar39._24_4_ = fVar416 * fVar21;
    auVar39._28_4_ = auVar161._28_4_;
    fVar226 = auVar12._0_4_;
    fVar250 = auVar12._4_4_;
    auVar40._4_4_ = fVar379 * fVar250;
    auVar40._0_4_ = fVar374 * fVar226;
    fVar269 = auVar12._8_4_;
    auVar40._8_4_ = fVar381 * fVar269;
    fVar364 = auVar12._12_4_;
    auVar40._12_4_ = fVar383 * fVar364;
    fVar390 = auVar12._16_4_;
    auVar40._16_4_ = fVar385 * fVar390;
    fVar415 = auVar12._20_4_;
    auVar40._20_4_ = fVar387 * fVar415;
    fVar22 = auVar12._24_4_;
    auVar40._24_4_ = fVar389 * fVar22;
    auVar40._28_4_ = auVar117._28_4_;
    auVar154 = vsubps_avx(auVar40,auVar39);
    auVar92._4_4_ = fStack_97c;
    auVar92._0_4_ = local_980;
    auVar92._8_4_ = fStack_978;
    auVar92._12_4_ = fStack_974;
    auVar92._16_4_ = fStack_970;
    auVar92._20_4_ = fStack_96c;
    auVar92._24_4_ = fStack_968;
    auVar92._28_4_ = fStack_964;
    auVar117 = vperm2f128_avx(auVar92,auVar92,1);
    auVar117 = vshufps_avx(auVar117,auVar92,0x30);
    local_9e0 = vshufps_avx(auVar92,auVar117,0x29);
    auVar13 = vsubps_avx(local_9e0,auVar92);
    auVar41._4_4_ = fVar250 * fVar309;
    auVar41._0_4_ = fVar226 * fVar292;
    auVar41._8_4_ = fVar269 * fVar310;
    auVar41._12_4_ = fVar364 * fVar312;
    auVar41._16_4_ = fVar390 * fVar314;
    auVar41._20_4_ = fVar415 * fVar316;
    auVar41._24_4_ = fVar22 * fVar318;
    auVar41._28_4_ = auVar117._28_4_;
    fVar227 = auVar13._0_4_;
    fVar251 = auVar13._4_4_;
    auVar42._4_4_ = fVar399 * fVar251;
    auVar42._0_4_ = fVar392 * fVar227;
    fVar271 = auVar13._8_4_;
    auVar42._8_4_ = fVar403 * fVar271;
    fVar372 = auVar13._12_4_;
    auVar42._12_4_ = fVar407 * fVar372;
    fVar391 = auVar13._16_4_;
    auVar42._16_4_ = fVar410 * fVar391;
    fVar15 = auVar13._20_4_;
    auVar42._20_4_ = fVar413 * fVar15;
    fVar23 = auVar13._24_4_;
    auVar42._24_4_ = fVar416 * fVar23;
    auVar42._28_4_ = local_a60._28_4_;
    auVar340 = vsubps_avx(auVar42,auVar41);
    auVar43._4_4_ = fVar379 * fVar251;
    auVar43._0_4_ = fVar374 * fVar227;
    auVar43._8_4_ = fVar381 * fVar271;
    auVar43._12_4_ = fVar383 * fVar372;
    auVar43._16_4_ = fVar385 * fVar391;
    auVar43._20_4_ = fVar387 * fVar15;
    auVar43._24_4_ = fVar389 * fVar23;
    auVar43._28_4_ = local_a60._28_4_;
    auVar44._4_4_ = fVar249 * fVar309;
    auVar44._0_4_ = fVar225 * fVar292;
    auVar44._8_4_ = fVar270 * fVar310;
    auVar44._12_4_ = fVar353 * fVar312;
    auVar44._16_4_ = fVar388 * fVar314;
    auVar44._20_4_ = fVar412 * fVar316;
    auVar44._24_4_ = fVar21 * fVar318;
    auVar44._28_4_ = fVar201;
    auVar30 = vsubps_avx(auVar44,auVar43);
    fVar224 = auVar30._28_4_;
    fVar343 = auVar340._28_4_ + fVar224;
    auVar220._0_4_ = fVar227 * fVar227 + fVar225 * fVar225 + fVar226 * fVar226;
    auVar220._4_4_ = fVar251 * fVar251 + fVar249 * fVar249 + fVar250 * fVar250;
    auVar220._8_4_ = fVar271 * fVar271 + fVar270 * fVar270 + fVar269 * fVar269;
    auVar220._12_4_ = fVar372 * fVar372 + fVar353 * fVar353 + fVar364 * fVar364;
    auVar220._16_4_ = fVar391 * fVar391 + fVar388 * fVar388 + fVar390 * fVar390;
    auVar220._20_4_ = fVar15 * fVar15 + fVar412 * fVar412 + fVar415 * fVar415;
    auVar220._24_4_ = fVar23 * fVar23 + fVar21 * fVar21 + fVar22 * fVar22;
    auVar220._28_4_ = fVar224 + fVar224 + fVar343;
    auVar117 = vrcpps_avx(auVar220);
    fVar224 = auVar117._0_4_;
    fVar345 = auVar117._4_4_;
    auVar45._4_4_ = fVar345 * auVar220._4_4_;
    auVar45._0_4_ = fVar224 * auVar220._0_4_;
    fVar347 = auVar117._8_4_;
    auVar45._8_4_ = fVar347 * auVar220._8_4_;
    fVar350 = auVar117._12_4_;
    auVar45._12_4_ = fVar350 * auVar220._12_4_;
    fVar380 = auVar117._16_4_;
    auVar45._16_4_ = fVar380 * auVar220._16_4_;
    fVar382 = auVar117._20_4_;
    auVar45._20_4_ = fVar382 * auVar220._20_4_;
    fVar384 = auVar117._24_4_;
    auVar45._24_4_ = fVar384 * auVar220._24_4_;
    auVar45._28_4_ = fVar201;
    auVar185._8_4_ = 0x3f800000;
    auVar185._0_8_ = 0x3f8000003f800000;
    auVar185._12_4_ = 0x3f800000;
    auVar185._16_4_ = 0x3f800000;
    auVar185._20_4_ = 0x3f800000;
    auVar185._24_4_ = 0x3f800000;
    auVar185._28_4_ = 0x3f800000;
    auVar31 = vsubps_avx(auVar185,auVar45);
    fVar224 = auVar31._0_4_ * fVar224 + fVar224;
    fVar345 = auVar31._4_4_ * fVar345 + fVar345;
    fVar347 = auVar31._8_4_ * fVar347 + fVar347;
    fVar350 = auVar31._12_4_ * fVar350 + fVar350;
    fVar380 = auVar31._16_4_ * fVar380 + fVar380;
    fVar382 = auVar31._20_4_ * fVar382 + fVar382;
    fVar384 = auVar31._24_4_ * fVar384 + fVar384;
    auVar161 = vperm2f128_avx(auVar36,auVar36,1);
    auVar161 = vshufps_avx(auVar161,auVar36,0x30);
    local_a20 = vshufps_avx(auVar36,auVar161,0x29);
    auVar161 = vperm2f128_avx(auVar37,auVar37,1);
    auVar161 = vshufps_avx(auVar161,auVar37,0x30);
    local_a40 = vshufps_avx(auVar37,auVar161,0x29);
    fVar393 = local_a40._0_4_;
    fVar400 = local_a40._4_4_;
    auVar46._4_4_ = fVar400 * fVar249;
    auVar46._0_4_ = fVar393 * fVar225;
    fVar404 = local_a40._8_4_;
    auVar46._8_4_ = fVar404 * fVar270;
    fVar408 = local_a40._12_4_;
    auVar46._12_4_ = fVar408 * fVar353;
    fVar411 = local_a40._16_4_;
    auVar46._16_4_ = fVar411 * fVar388;
    fVar414 = local_a40._20_4_;
    auVar46._20_4_ = fVar414 * fVar412;
    fVar417 = local_a40._24_4_;
    auVar46._24_4_ = fVar417 * fVar21;
    auVar46._28_4_ = auVar161._28_4_;
    fVar228 = local_a20._0_4_;
    fVar252 = local_a20._4_4_;
    auVar47._4_4_ = fVar250 * fVar252;
    auVar47._0_4_ = fVar226 * fVar228;
    fVar335 = local_a20._8_4_;
    auVar47._8_4_ = fVar269 * fVar335;
    fVar373 = local_a20._12_4_;
    auVar47._12_4_ = fVar364 * fVar373;
    fVar418 = local_a20._16_4_;
    auVar47._16_4_ = fVar390 * fVar418;
    fVar16 = local_a20._20_4_;
    auVar47._20_4_ = fVar415 * fVar16;
    fVar24 = local_a20._24_4_;
    auVar47._24_4_ = fVar22 * fVar24;
    auVar47._28_4_ = fStack_224;
    auVar118 = vsubps_avx(auVar47,auVar46);
    auVar161 = vperm2f128_avx(auVar35,auVar35,1);
    auVar161 = vshufps_avx(auVar161,auVar35,0x30);
    auVar10 = vshufps_avx(auVar35,auVar161,0x29);
    fVar229 = auVar10._0_4_;
    fVar264 = auVar10._4_4_;
    auVar48._4_4_ = fVar250 * fVar264;
    auVar48._0_4_ = fVar226 * fVar229;
    fVar341 = auVar10._8_4_;
    auVar48._8_4_ = fVar269 * fVar341;
    fVar378 = auVar10._12_4_;
    auVar48._12_4_ = fVar364 * fVar378;
    fVar398 = auVar10._16_4_;
    auVar48._16_4_ = fVar390 * fVar398;
    fVar17 = auVar10._20_4_;
    auVar48._20_4_ = fVar415 * fVar17;
    fVar25 = auVar10._24_4_;
    auVar48._24_4_ = fVar22 * fVar25;
    auVar48._28_4_ = auVar161._28_4_;
    auVar49._4_4_ = fVar400 * fVar251;
    auVar49._0_4_ = fVar393 * fVar227;
    auVar49._8_4_ = fVar404 * fVar271;
    auVar49._12_4_ = fVar408 * fVar372;
    auVar49._16_4_ = fVar411 * fVar391;
    auVar49._20_4_ = fVar414 * fVar15;
    uVar98 = local_a40._28_4_;
    auVar49._24_4_ = fVar417 * fVar23;
    auVar49._28_4_ = uVar98;
    auVar161 = vsubps_avx(auVar49,auVar48);
    auVar50._4_4_ = fVar251 * fVar252;
    auVar50._0_4_ = fVar227 * fVar228;
    auVar50._8_4_ = fVar271 * fVar335;
    auVar50._12_4_ = fVar372 * fVar373;
    auVar50._16_4_ = fVar391 * fVar418;
    auVar50._20_4_ = fVar15 * fVar16;
    auVar50._24_4_ = fVar23 * fVar24;
    auVar50._28_4_ = uVar98;
    auVar51._4_4_ = fVar249 * fVar264;
    auVar51._0_4_ = fVar225 * fVar229;
    auVar51._8_4_ = fVar270 * fVar341;
    auVar51._12_4_ = fVar353 * fVar378;
    auVar51._16_4_ = fVar388 * fVar398;
    auVar51._20_4_ = fVar412 * fVar17;
    auVar51._24_4_ = fVar21 * fVar25;
    auVar51._28_4_ = fStack_264;
    auVar119 = vsubps_avx(auVar51,auVar50);
    auVar52._4_4_ =
         (auVar154._4_4_ * auVar154._4_4_ +
         auVar340._4_4_ * auVar340._4_4_ + auVar30._4_4_ * auVar30._4_4_) * fVar345;
    auVar52._0_4_ =
         (auVar154._0_4_ * auVar154._0_4_ +
         auVar340._0_4_ * auVar340._0_4_ + auVar30._0_4_ * auVar30._0_4_) * fVar224;
    auVar52._8_4_ =
         (auVar154._8_4_ * auVar154._8_4_ +
         auVar340._8_4_ * auVar340._8_4_ + auVar30._8_4_ * auVar30._8_4_) * fVar347;
    auVar52._12_4_ =
         (auVar154._12_4_ * auVar154._12_4_ +
         auVar340._12_4_ * auVar340._12_4_ + auVar30._12_4_ * auVar30._12_4_) * fVar350;
    auVar52._16_4_ =
         (auVar154._16_4_ * auVar154._16_4_ +
         auVar340._16_4_ * auVar340._16_4_ + auVar30._16_4_ * auVar30._16_4_) * fVar380;
    auVar52._20_4_ =
         (auVar154._20_4_ * auVar154._20_4_ +
         auVar340._20_4_ * auVar340._20_4_ + auVar30._20_4_ * auVar30._20_4_) * fVar382;
    auVar52._24_4_ =
         (auVar154._24_4_ * auVar154._24_4_ +
         auVar340._24_4_ * auVar340._24_4_ + auVar30._24_4_ * auVar30._24_4_) * fVar384;
    auVar52._28_4_ = auVar154._28_4_ + fVar343;
    auVar53._4_4_ =
         (auVar118._4_4_ * auVar118._4_4_ +
         auVar161._4_4_ * auVar161._4_4_ + auVar119._4_4_ * auVar119._4_4_) * fVar345;
    auVar53._0_4_ =
         (auVar118._0_4_ * auVar118._0_4_ +
         auVar161._0_4_ * auVar161._0_4_ + auVar119._0_4_ * auVar119._0_4_) * fVar224;
    auVar53._8_4_ =
         (auVar118._8_4_ * auVar118._8_4_ +
         auVar161._8_4_ * auVar161._8_4_ + auVar119._8_4_ * auVar119._8_4_) * fVar347;
    auVar53._12_4_ =
         (auVar118._12_4_ * auVar118._12_4_ +
         auVar161._12_4_ * auVar161._12_4_ + auVar119._12_4_ * auVar119._12_4_) * fVar350;
    auVar53._16_4_ =
         (auVar118._16_4_ * auVar118._16_4_ +
         auVar161._16_4_ * auVar161._16_4_ + auVar119._16_4_ * auVar119._16_4_) * fVar380;
    auVar53._20_4_ =
         (auVar118._20_4_ * auVar118._20_4_ +
         auVar161._20_4_ * auVar161._20_4_ + auVar119._20_4_ * auVar119._20_4_) * fVar382;
    auVar53._24_4_ =
         (auVar118._24_4_ * auVar118._24_4_ +
         auVar161._24_4_ * auVar161._24_4_ + auVar119._24_4_ * auVar119._24_4_) * fVar384;
    auVar53._28_4_ = auVar31._28_4_ + auVar117._28_4_;
    auVar117 = vmaxps_avx(auVar52,auVar53);
    auVar161 = vperm2f128_avx(auVar261,auVar261,1);
    auVar161 = vshufps_avx(auVar161,auVar261,0x30);
    auVar154 = vshufps_avx(auVar261,auVar161,0x29);
    auVar122._0_4_ = auVar261._0_4_ + fVar246;
    auVar122._4_4_ = auVar261._4_4_ + fVar248;
    auVar122._8_4_ = auVar261._8_4_ + fVar266;
    auVar122._12_4_ = auVar261._12_4_ + fVar268;
    auVar122._16_4_ = auVar261._16_4_ + fVar231;
    auVar122._20_4_ = auVar261._20_4_ + fVar247;
    auVar122._24_4_ = auVar261._24_4_ + fVar265;
    auVar122._28_4_ = auVar261._28_4_ + fVar267;
    auVar161 = vmaxps_avx(auVar261,auVar122);
    auVar10 = vmaxps_avx(auVar11,auVar154);
    auVar161 = vmaxps_avx(auVar161,auVar10);
    auVar10 = vrsqrtps_avx(auVar220);
    fVar224 = auVar10._0_4_;
    fVar231 = auVar10._4_4_;
    fVar246 = auVar10._8_4_;
    fVar247 = auVar10._12_4_;
    fVar248 = auVar10._16_4_;
    fVar265 = auVar10._20_4_;
    fVar266 = auVar10._24_4_;
    auVar54._4_4_ = fVar231 * fVar231 * fVar231 * auVar220._4_4_ * 0.5;
    auVar54._0_4_ = fVar224 * fVar224 * fVar224 * auVar220._0_4_ * 0.5;
    auVar54._8_4_ = fVar246 * fVar246 * fVar246 * auVar220._8_4_ * 0.5;
    auVar54._12_4_ = fVar247 * fVar247 * fVar247 * auVar220._12_4_ * 0.5;
    auVar54._16_4_ = fVar248 * fVar248 * fVar248 * auVar220._16_4_ * 0.5;
    auVar54._20_4_ = fVar265 * fVar265 * fVar265 * auVar220._20_4_ * 0.5;
    auVar54._24_4_ = fVar266 * fVar266 * fVar266 * auVar220._24_4_ * 0.5;
    auVar54._28_4_ = auVar220._28_4_;
    auVar55._4_4_ = fVar231 * 1.5;
    auVar55._0_4_ = fVar224 * 1.5;
    auVar55._8_4_ = fVar246 * 1.5;
    auVar55._12_4_ = fVar247 * 1.5;
    auVar55._16_4_ = fVar248 * 1.5;
    auVar55._20_4_ = fVar265 * 1.5;
    auVar55._24_4_ = fVar266 * 1.5;
    auVar55._28_4_ = auVar10._28_4_;
    local_540 = vsubps_avx(auVar55,auVar54);
    auVar87 = ZEXT412(0);
    auVar377 = ZEXT1264(auVar87) << 0x20;
    auVar91._4_4_ = fVar342;
    auVar91._0_4_ = fVar336;
    auVar91._8_4_ = fVar344;
    auVar91._12_4_ = fVar346;
    auVar91._16_4_ = fVar348;
    auVar91._20_4_ = fVar351;
    auVar91._24_4_ = fVar354;
    auVar91._28_4_ = fVar356;
    auVar340 = vsubps_avx(ZEXT1232(auVar87) << 0x20,auVar91);
    auVar89._4_4_ = fVar195;
    auVar89._0_4_ = fVar173;
    auVar89._8_4_ = fVar196;
    auVar89._12_4_ = fVar197;
    auVar89._16_4_ = fVar198;
    auVar89._20_4_ = fVar199;
    auVar89._24_4_ = fVar200;
    auVar89._28_4_ = fVar201;
    auVar30 = vsubps_avx(ZEXT1232(auVar87) << 0x20,auVar89);
    fVar231 = auVar30._0_4_;
    fVar265 = auVar30._4_4_;
    fVar343 = auVar30._8_4_;
    fVar380 = auVar30._12_4_;
    fVar401 = auVar30._16_4_;
    fVar18 = auVar30._20_4_;
    fVar26 = auVar30._24_4_;
    fVar246 = auVar340._0_4_;
    fVar266 = auVar340._4_4_;
    fVar345 = auVar340._8_4_;
    fVar382 = auVar340._12_4_;
    fVar402 = auVar340._16_4_;
    fVar19 = auVar340._20_4_;
    fVar27 = auVar340._24_4_;
    auVar150 = ZEXT1232(auVar87) << 0x20;
    auVar31 = vsubps_avx(auVar150,auVar92);
    fVar247 = auVar31._0_4_;
    fVar267 = auVar31._4_4_;
    fVar347 = auVar31._8_4_;
    fVar384 = auVar31._12_4_;
    fVar406 = auVar31._16_4_;
    fVar20 = auVar31._20_4_;
    fVar28 = auVar31._24_4_;
    auVar396._0_4_ =
         (float)local_880._0_4_ * fVar247 +
         (float)local_8a0._0_4_ * fVar246 + (float)local_840._0_4_ * fVar231;
    auVar396._4_4_ =
         (float)local_880._4_4_ * fVar267 +
         (float)local_8a0._4_4_ * fVar266 + (float)local_840._4_4_ * fVar265;
    auVar396._8_4_ = fStack_878 * fVar347 + fStack_898 * fVar345 + fStack_838 * fVar343;
    auVar396._12_4_ = fStack_874 * fVar384 + fStack_894 * fVar382 + fStack_834 * fVar380;
    auVar396._16_4_ = fStack_870 * fVar406 + fStack_890 * fVar402 + fStack_830 * fVar401;
    auVar396._20_4_ = fStack_86c * fVar20 + fStack_88c * fVar19 + fStack_82c * fVar18;
    auVar396._24_4_ = fStack_868 * fVar28 + fStack_888 * fVar27 + fStack_828 * fVar26;
    auVar396._28_4_ = fStack_264 + auVar119._28_4_ + auVar10._28_4_;
    auVar420._0_4_ = fVar247 * fVar247 + fVar246 * fVar246 + fVar231 * fVar231;
    auVar420._4_4_ = fVar267 * fVar267 + fVar266 * fVar266 + fVar265 * fVar265;
    auVar420._8_4_ = fVar347 * fVar347 + fVar345 * fVar345 + fVar343 * fVar343;
    auVar420._12_4_ = fVar384 * fVar384 + fVar382 * fVar382 + fVar380 * fVar380;
    auVar420._16_4_ = fVar406 * fVar406 + fVar402 * fVar402 + fVar401 * fVar401;
    auVar420._20_4_ = fVar20 * fVar20 + fVar19 * fVar19 + fVar18 * fVar18;
    auVar420._24_4_ = fVar28 * fVar28 + fVar27 * fVar27 + fVar26 * fVar26;
    auVar420._28_4_ = fStack_964 + fStack_964 + fStack_264;
    fVar248 = local_540._0_4_;
    fVar268 = local_540._4_4_;
    fVar350 = local_540._8_4_;
    fVar386 = local_540._12_4_;
    fVar409 = local_540._16_4_;
    fVar289 = local_540._20_4_;
    fVar291 = local_540._24_4_;
    fVar321 = (float)local_880._0_4_ * fVar227 * fVar248 +
              fVar225 * fVar248 * (float)local_8a0._0_4_ +
              fVar226 * fVar248 * (float)local_840._0_4_;
    fVar329 = (float)local_880._4_4_ * fVar251 * fVar268 +
              fVar249 * fVar268 * (float)local_8a0._4_4_ +
              fVar250 * fVar268 * (float)local_840._4_4_;
    fVar330 = fStack_878 * fVar271 * fVar350 +
              fVar270 * fVar350 * fStack_898 + fVar269 * fVar350 * fStack_838;
    fVar331 = fStack_874 * fVar372 * fVar386 +
              fVar353 * fVar386 * fStack_894 + fVar364 * fVar386 * fStack_834;
    fVar332 = fStack_870 * fVar391 * fVar409 +
              fVar388 * fVar409 * fStack_890 + fVar390 * fVar409 * fStack_830;
    fVar333 = fStack_86c * fVar15 * fVar289 +
              fVar412 * fVar289 * fStack_88c + fVar415 * fVar289 * fStack_82c;
    fVar334 = fStack_868 * fVar23 * fVar291 +
              fVar21 * fVar291 * fStack_888 + fVar22 * fVar291 * fStack_828;
    fVar224 = fStack_864 + fStack_884 + fStack_824;
    local_580._0_4_ =
         fVar247 * fVar227 * fVar248 + fVar225 * fVar248 * fVar246 + fVar226 * fVar248 * fVar231;
    local_580._4_4_ =
         fVar267 * fVar251 * fVar268 + fVar249 * fVar268 * fVar266 + fVar250 * fVar268 * fVar265;
    local_580._8_4_ =
         fVar347 * fVar271 * fVar350 + fVar270 * fVar350 * fVar345 + fVar269 * fVar350 * fVar343;
    local_580._12_4_ =
         fVar384 * fVar372 * fVar386 + fVar353 * fVar386 * fVar382 + fVar364 * fVar386 * fVar380;
    local_580._16_4_ =
         fVar406 * fVar391 * fVar409 + fVar388 * fVar409 * fVar402 + fVar390 * fVar409 * fVar401;
    local_580._20_4_ =
         fVar20 * fVar15 * fVar289 + fVar412 * fVar289 * fVar19 + fVar415 * fVar289 * fVar18;
    local_580._24_4_ =
         fVar28 * fVar23 * fVar291 + fVar21 * fVar291 * fVar27 + fVar22 * fVar291 * fVar26;
    local_580._28_4_ = fStack_884 + fVar224;
    auVar56._4_4_ = fVar329 * local_580._4_4_;
    auVar56._0_4_ = fVar321 * local_580._0_4_;
    auVar56._8_4_ = fVar330 * local_580._8_4_;
    auVar56._12_4_ = fVar331 * local_580._12_4_;
    auVar56._16_4_ = fVar332 * local_580._16_4_;
    auVar56._20_4_ = fVar333 * local_580._20_4_;
    auVar56._24_4_ = fVar334 * local_580._24_4_;
    auVar56._28_4_ = fVar224;
    auVar118 = vsubps_avx(auVar396,auVar56);
    auVar57._4_4_ = local_580._4_4_ * local_580._4_4_;
    auVar57._0_4_ = local_580._0_4_ * local_580._0_4_;
    auVar57._8_4_ = local_580._8_4_ * local_580._8_4_;
    auVar57._12_4_ = local_580._12_4_ * local_580._12_4_;
    auVar57._16_4_ = local_580._16_4_ * local_580._16_4_;
    auVar57._20_4_ = local_580._20_4_ * local_580._20_4_;
    auVar57._24_4_ = local_580._24_4_ * local_580._24_4_;
    auVar57._28_4_ = fStack_884;
    auVar119 = vsubps_avx(auVar420,auVar57);
    auStack_958 = auVar119._8_24_;
    auVar10 = vsqrtps_avx(auVar117);
    fVar224 = (auVar10._0_4_ + auVar161._0_4_) * 1.0000002;
    fVar165 = (auVar10._4_4_ + auVar161._4_4_) * 1.0000002;
    fVar167 = (auVar10._8_4_ + auVar161._8_4_) * 1.0000002;
    fVar169 = (auVar10._12_4_ + auVar161._12_4_) * 1.0000002;
    fVar170 = (auVar10._16_4_ + auVar161._16_4_) * 1.0000002;
    fVar171 = (auVar10._20_4_ + auVar161._20_4_) * 1.0000002;
    fVar172 = (auVar10._24_4_ + auVar161._24_4_) * 1.0000002;
    auVar58._4_4_ = fVar165 * fVar165;
    auVar58._0_4_ = fVar224 * fVar224;
    auVar58._8_4_ = fVar167 * fVar167;
    auVar58._12_4_ = fVar169 * fVar169;
    auVar58._16_4_ = fVar170 * fVar170;
    auVar58._20_4_ = fVar171 * fVar171;
    auVar58._24_4_ = fVar172 * fVar172;
    auVar58._28_4_ = auVar10._28_4_ + auVar161._28_4_;
    fVar165 = auVar118._0_4_ + auVar118._0_4_;
    fVar167 = auVar118._4_4_ + auVar118._4_4_;
    local_ac0._0_8_ = CONCAT44(fVar167,fVar165);
    local_ac0._8_4_ = auVar118._8_4_ + auVar118._8_4_;
    local_ac0._12_4_ = auVar118._12_4_ + auVar118._12_4_;
    local_ac0._16_4_ = auVar118._16_4_ + auVar118._16_4_;
    local_ac0._20_4_ = auVar118._20_4_ + auVar118._20_4_;
    local_ac0._24_4_ = auVar118._24_4_ + auVar118._24_4_;
    fVar224 = auVar118._28_4_;
    local_ac0._28_4_ = fVar224 + fVar224;
    auVar161 = vsubps_avx(auVar119,auVar58);
    local_320._4_4_ = fVar329 * fVar329;
    local_320._0_4_ = fVar321 * fVar321;
    local_320._8_4_ = fVar330 * fVar330;
    local_320._12_4_ = fVar331 * fVar331;
    local_320._16_4_ = fVar332 * fVar332;
    local_320._20_4_ = fVar333 * fVar333;
    local_320._24_4_ = fVar334 * fVar334;
    local_320._28_4_ = auVar12._28_4_;
    local_560 = vsubps_avx(local_2a0,local_320);
    auVar59._4_4_ = fVar167 * fVar167;
    auVar59._0_4_ = fVar165 * fVar165;
    auVar59._8_4_ = local_ac0._8_4_ * local_ac0._8_4_;
    auVar59._12_4_ = local_ac0._12_4_ * local_ac0._12_4_;
    auVar59._16_4_ = local_ac0._16_4_ * local_ac0._16_4_;
    auVar59._20_4_ = local_ac0._20_4_ * local_ac0._20_4_;
    auVar59._24_4_ = local_ac0._24_4_ * local_ac0._24_4_;
    auVar59._28_4_ = fVar224;
    fVar169 = local_560._0_4_;
    fVar170 = local_560._4_4_;
    fVar171 = local_560._8_4_;
    fVar172 = local_560._12_4_;
    fVar349 = local_560._16_4_;
    fVar352 = local_560._20_4_;
    fVar355 = local_560._24_4_;
    auVar60._4_4_ = auVar161._4_4_ * fVar170 * 4.0;
    auVar60._0_4_ = auVar161._0_4_ * fVar169 * 4.0;
    auVar60._8_4_ = auVar161._8_4_ * fVar171 * 4.0;
    auVar60._12_4_ = auVar161._12_4_ * fVar172 * 4.0;
    auVar60._16_4_ = auVar161._16_4_ * fVar349 * 4.0;
    auVar60._20_4_ = auVar161._20_4_ * fVar352 * 4.0;
    auVar60._24_4_ = auVar161._24_4_ * fVar355 * 4.0;
    auVar60._28_4_ = 0x40800000;
    auVar12 = vsubps_avx(auVar59,auVar60);
    auVar117 = vcmpps_avx(auVar12,auVar150,5);
    fVar224 = local_560._28_4_;
    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0x7f,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar117 >> 0xbf,0) == '\0') &&
        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar117[0x1f])
    {
      fStack_c78 = INFINITY;
      local_c80 = (undefined1  [8])0x7f8000007f800000;
      fStack_c74 = INFINITY;
      uStack_c70 = 0x7f800000;
      uStack_c6c = 0x7f800000;
      uStack_c68 = 0x7f800000;
      uStack_c64 = 0x7f800000;
      auVar421._8_4_ = 0xff800000;
      auVar421._0_8_ = 0xff800000ff800000;
      auVar421._12_4_ = 0xff800000;
      auVar421._16_4_ = 0xff800000;
      auVar421._20_4_ = 0xff800000;
      auVar421._24_4_ = 0xff800000;
      auVar421._28_4_ = 0xff800000;
    }
    else {
      auVar118 = vcmpps_avx(auVar12,auVar150,5);
      auVar150 = vsqrtps_avx(auVar12);
      auVar278._0_4_ = fVar169 + fVar169;
      auVar278._4_4_ = fVar170 + fVar170;
      auVar278._8_4_ = fVar171 + fVar171;
      auVar278._12_4_ = fVar172 + fVar172;
      auVar278._16_4_ = fVar349 + fVar349;
      auVar278._20_4_ = fVar352 + fVar352;
      auVar278._24_4_ = fVar355 + fVar355;
      auVar278._28_4_ = fVar224 + fVar224;
      auVar12 = vrcpps_avx(auVar278);
      fVar272 = auVar12._0_4_;
      fVar285 = auVar12._4_4_;
      auVar61._4_4_ = auVar278._4_4_ * fVar285;
      auVar61._0_4_ = auVar278._0_4_ * fVar272;
      fVar286 = auVar12._8_4_;
      auVar61._8_4_ = auVar278._8_4_ * fVar286;
      fVar287 = auVar12._12_4_;
      auVar61._12_4_ = auVar278._12_4_ * fVar287;
      fVar288 = auVar12._16_4_;
      auVar61._16_4_ = auVar278._16_4_ * fVar288;
      fVar230 = auVar12._20_4_;
      auVar61._20_4_ = auVar278._20_4_ * fVar230;
      fVar290 = auVar12._24_4_;
      auVar61._24_4_ = auVar278._24_4_ * fVar290;
      auVar61._28_4_ = auVar278._28_4_;
      auVar324._8_4_ = 0x3f800000;
      auVar324._0_8_ = 0x3f8000003f800000;
      auVar324._12_4_ = 0x3f800000;
      auVar324._16_4_ = 0x3f800000;
      auVar324._20_4_ = 0x3f800000;
      auVar324._24_4_ = 0x3f800000;
      auVar324._28_4_ = 0x3f800000;
      auVar151 = vsubps_avx(auVar324,auVar61);
      fVar272 = fVar272 + fVar272 * auVar151._0_4_;
      fVar285 = fVar285 + fVar285 * auVar151._4_4_;
      fVar286 = fVar286 + fVar286 * auVar151._8_4_;
      fVar287 = fVar287 + fVar287 * auVar151._12_4_;
      fVar288 = fVar288 + fVar288 * auVar151._16_4_;
      fVar230 = fVar230 + fVar230 * auVar151._20_4_;
      fVar290 = fVar290 + fVar290 * auVar151._24_4_;
      auVar300._0_8_ = CONCAT44(fVar167,fVar165) ^ 0x8000000080000000;
      auVar300._8_4_ = -local_ac0._8_4_;
      auVar300._12_4_ = -local_ac0._12_4_;
      auVar300._16_4_ = -local_ac0._16_4_;
      auVar300._20_4_ = -local_ac0._20_4_;
      auVar300._24_4_ = -local_ac0._24_4_;
      auVar300._28_4_ = -local_ac0._28_4_;
      auVar152 = vsubps_avx(auVar300,auVar150);
      fVar165 = auVar152._0_4_ * fVar272;
      fVar167 = auVar152._4_4_ * fVar285;
      auVar62._4_4_ = fVar167;
      auVar62._0_4_ = fVar165;
      fVar311 = auVar152._8_4_ * fVar286;
      auVar62._8_4_ = fVar311;
      fVar313 = auVar152._12_4_ * fVar287;
      auVar62._12_4_ = fVar313;
      fVar315 = auVar152._16_4_ * fVar288;
      auVar62._16_4_ = fVar315;
      fVar317 = auVar152._20_4_ * fVar230;
      auVar62._20_4_ = fVar317;
      fVar319 = auVar152._24_4_ * fVar290;
      auVar62._24_4_ = fVar319;
      auVar62._28_4_ = auVar152._28_4_;
      auVar150 = vsubps_avx(auVar150,local_ac0);
      fVar272 = auVar150._0_4_ * fVar272;
      fVar285 = auVar150._4_4_ * fVar285;
      auVar63._4_4_ = fVar285;
      auVar63._0_4_ = fVar272;
      fVar286 = auVar150._8_4_ * fVar286;
      auVar63._8_4_ = fVar286;
      fVar287 = auVar150._12_4_ * fVar287;
      auVar63._12_4_ = fVar287;
      fVar288 = auVar150._16_4_ * fVar288;
      auVar63._16_4_ = fVar288;
      fVar230 = auVar150._20_4_ * fVar230;
      auVar63._20_4_ = fVar230;
      fVar290 = auVar150._24_4_ * fVar290;
      auVar63._24_4_ = fVar290;
      auVar63._28_4_ = auVar150._28_4_;
      local_a80._4_4_ = fVar268 * (local_580._4_4_ + fVar329 * fVar167);
      local_a80._0_4_ = fVar248 * (local_580._0_4_ + fVar321 * fVar165);
      uStack_a78._0_4_ = (uint)(fVar350 * (local_580._8_4_ + fVar330 * fVar311));
      uStack_a78._4_4_ = (uint)(fVar386 * (local_580._12_4_ + fVar331 * fVar313));
      uStack_a70._0_4_ = (uint)(fVar409 * (local_580._16_4_ + fVar332 * fVar315));
      uStack_a70._4_4_ = (uint)(fVar289 * (local_580._20_4_ + fVar333 * fVar317));
      uStack_a68._0_4_ = (uint)(fVar291 * (local_580._24_4_ + fVar334 * fVar319));
      uStack_a68._4_4_ = (uint)(local_580._28_4_ + auVar12._28_4_ + auVar151._28_4_);
      auVar279._8_4_ = 0x7fffffff;
      auVar279._0_8_ = 0x7fffffff7fffffff;
      auVar279._12_4_ = 0x7fffffff;
      auVar279._16_4_ = 0x7fffffff;
      auVar279._20_4_ = 0x7fffffff;
      auVar279._24_4_ = 0x7fffffff;
      auVar279._28_4_ = 0x7fffffff;
      auVar12 = vandps_avx(local_320,auVar279);
      auVar150 = vmaxps_avx(local_4e0,auVar12);
      auVar64._4_4_ = auVar150._4_4_ * 1.9073486e-06;
      auVar64._0_4_ = auVar150._0_4_ * 1.9073486e-06;
      auVar64._8_4_ = auVar150._8_4_ * 1.9073486e-06;
      auVar64._12_4_ = auVar150._12_4_ * 1.9073486e-06;
      auVar64._16_4_ = auVar150._16_4_ * 1.9073486e-06;
      auVar64._20_4_ = auVar150._20_4_ * 1.9073486e-06;
      auVar64._24_4_ = auVar150._24_4_ * 1.9073486e-06;
      auVar64._28_4_ = auVar150._28_4_;
      auVar12 = vandps_avx(local_560,auVar279);
      auVar12 = vcmpps_avx(auVar12,auVar64,1);
      auVar325._8_4_ = 0x7f800000;
      auVar325._0_8_ = 0x7f8000007f800000;
      auVar325._12_4_ = 0x7f800000;
      auVar325._16_4_ = 0x7f800000;
      auVar325._20_4_ = 0x7f800000;
      auVar325._24_4_ = 0x7f800000;
      auVar325._28_4_ = 0x7f800000;
      _local_c80 = vblendvps_avx(auVar325,auVar62,auVar118);
      auVar377 = ZEXT3264(_local_c80);
      local_300 = fVar248 * (local_580._0_4_ + fVar321 * fVar272);
      fStack_2fc = fVar268 * (local_580._4_4_ + fVar329 * fVar285);
      fStack_2f8 = fVar350 * (local_580._8_4_ + fVar330 * fVar286);
      fStack_2f4 = fVar386 * (local_580._12_4_ + fVar331 * fVar287);
      fStack_2f0 = fVar409 * (local_580._16_4_ + fVar332 * fVar288);
      fStack_2ec = fVar289 * (local_580._20_4_ + fVar333 * fVar230);
      fStack_2e8 = fVar291 * (local_580._24_4_ + fVar334 * fVar290);
      fStack_2e4 = local_580._28_4_ + auVar150._28_4_;
      auVar280._8_4_ = 0xff800000;
      auVar280._0_8_ = 0xff800000ff800000;
      auVar280._12_4_ = 0xff800000;
      auVar280._16_4_ = 0xff800000;
      auVar280._20_4_ = 0xff800000;
      auVar280._24_4_ = 0xff800000;
      auVar280._28_4_ = 0xff800000;
      auVar421 = vblendvps_avx(auVar280,auVar63,auVar118);
      auVar150 = auVar118 & auVar12;
      if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar150 >> 0x7f,0) != '\0') ||
            (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar150 >> 0xbf,0) != '\0') ||
          (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar150[0x1f] < '\0') {
        auVar117 = vandps_avx(auVar12,auVar118);
        auVar212 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
        auVar12 = vcmpps_avx(auVar161,ZEXT832(0) << 0x20,2);
        auVar423._8_4_ = 0xff800000;
        auVar423._0_8_ = 0xff800000ff800000;
        auVar423._12_4_ = 0xff800000;
        auVar423._16_4_ = 0xff800000;
        auVar423._20_4_ = 0xff800000;
        auVar423._24_4_ = 0xff800000;
        auVar423._28_4_ = 0xff800000;
        auVar307._8_4_ = 0x7f800000;
        auVar307._0_8_ = 0x7f8000007f800000;
        auVar307._12_4_ = 0x7f800000;
        auVar307._16_4_ = 0x7f800000;
        auVar307._20_4_ = 0x7f800000;
        auVar307._24_4_ = 0x7f800000;
        auVar307._28_4_ = 0x7f800000;
        auVar161 = vblendvps_avx(auVar307,auVar423,auVar12);
        auVar175 = vpmovsxwd_avx(auVar212);
        auVar212 = vpunpckhwd_avx(auVar212,auVar212);
        auVar263._16_16_ = auVar212;
        auVar263._0_16_ = auVar175;
        _local_c80 = vblendvps_avx(_local_c80,auVar161,auVar263);
        auVar377 = ZEXT3264(_local_c80);
        auVar308._8_4_ = 0x7f800000;
        auVar308._0_8_ = 0x7f8000007f800000;
        auVar308._12_4_ = 0x7f800000;
        auVar308._16_4_ = 0x7f800000;
        auVar308._20_4_ = 0x7f800000;
        auVar308._24_4_ = 0x7f800000;
        auVar308._28_4_ = 0x7f800000;
        auVar161 = vblendvps_avx(auVar423,auVar308,auVar12);
        auVar421 = vblendvps_avx(auVar421,auVar161,auVar263);
        auVar161 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar163._0_4_ = auVar117._0_4_ ^ auVar161._0_4_;
        auVar163._4_4_ = auVar117._4_4_ ^ auVar161._4_4_;
        auVar163._8_4_ = auVar117._8_4_ ^ auVar161._8_4_;
        auVar163._12_4_ = auVar117._12_4_ ^ auVar161._12_4_;
        auVar163._16_4_ = auVar117._16_4_ ^ auVar161._16_4_;
        auVar163._20_4_ = auVar117._20_4_ ^ auVar161._20_4_;
        auVar163._24_4_ = auVar117._24_4_ ^ auVar161._24_4_;
        auVar163._28_4_ = auVar117._28_4_ ^ auVar161._28_4_;
        auVar117 = vorps_avx(auVar12,auVar163);
        auVar117 = vandps_avx(auVar118,auVar117);
      }
    }
    auVar327 = ZEXT3264(CONCAT428(fStack_864 + fStack_884 + fStack_824,
                                  CONCAT424(fVar334,CONCAT420(fVar333,CONCAT416(fVar332,CONCAT412(
                                                  fVar331,CONCAT48(fVar330,CONCAT44(fVar329,fVar321)
                                                                  )))))));
    auVar363 = ZEXT3264(local_580);
    auVar161 = local_4c0 & auVar117;
    if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar161 >> 0x7f,0) == '\0') &&
          (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar161 >> 0xbf,0) == '\0') &&
        (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar161[0x1f])
    {
      auVar371 = ZEXT3264(_local_a00);
    }
    else {
      auVar175 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x100));
      local_7e0._0_16_ = auVar175;
      auVar212 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_920._0_4_));
      auVar212 = vshufps_avx(auVar212,auVar212,0);
      auVar262._16_16_ = auVar212;
      auVar262._0_16_ = auVar212;
      auVar118 = vminps_avx(auVar262,auVar421);
      fVar230 = auVar340._28_4_ + auVar30._28_4_;
      auVar186._0_4_ =
           (float)local_880._0_4_ * fVar292 +
           (float)local_8a0._0_4_ * fVar374 + (float)local_840._0_4_ * fVar392;
      auVar186._4_4_ =
           (float)local_880._4_4_ * fVar309 +
           (float)local_8a0._4_4_ * fVar379 + (float)local_840._4_4_ * fVar399;
      auVar186._8_4_ = fStack_878 * fVar310 + fStack_898 * fVar381 + fStack_838 * fVar403;
      auVar186._12_4_ = fStack_874 * fVar312 + fStack_894 * fVar383 + fStack_834 * fVar407;
      auVar186._16_4_ = fStack_870 * fVar314 + fStack_890 * fVar385 + fStack_830 * fVar410;
      auVar186._20_4_ = fStack_86c * fVar316 + fStack_88c * fVar387 + fStack_82c * fVar413;
      auVar186._24_4_ = fStack_868 * fVar318 + fStack_888 * fVar389 + fStack_828 * fVar416;
      auVar186._28_4_ = fVar230 + fStack_224 + fVar230;
      auVar161 = vrcpps_avx(auVar186);
      fVar165 = auVar161._0_4_;
      fVar167 = auVar161._4_4_;
      auVar65._4_4_ = auVar186._4_4_ * fVar167;
      auVar65._0_4_ = auVar186._0_4_ * fVar165;
      fVar272 = auVar161._8_4_;
      auVar65._8_4_ = auVar186._8_4_ * fVar272;
      fVar285 = auVar161._12_4_;
      auVar65._12_4_ = auVar186._12_4_ * fVar285;
      fVar286 = auVar161._16_4_;
      auVar65._16_4_ = auVar186._16_4_ * fVar286;
      fVar287 = auVar161._20_4_;
      auVar65._20_4_ = auVar186._20_4_ * fVar287;
      fVar288 = auVar161._24_4_;
      auVar65._24_4_ = auVar186._24_4_ * fVar288;
      auVar65._28_4_ = fVar320;
      auVar359._8_4_ = 0x3f800000;
      auVar359._0_8_ = 0x3f8000003f800000;
      auVar359._12_4_ = 0x3f800000;
      auVar359._16_4_ = 0x3f800000;
      auVar359._20_4_ = 0x3f800000;
      auVar359._24_4_ = 0x3f800000;
      auVar359._28_4_ = 0x3f800000;
      auVar340 = vsubps_avx(auVar359,auVar65);
      auVar301._8_4_ = 0x7fffffff;
      auVar301._0_8_ = 0x7fffffff7fffffff;
      auVar301._12_4_ = 0x7fffffff;
      auVar301._16_4_ = 0x7fffffff;
      auVar301._20_4_ = 0x7fffffff;
      auVar301._24_4_ = 0x7fffffff;
      auVar301._28_4_ = 0x7fffffff;
      auVar161 = vandps_avx(auVar186,auVar301);
      auVar339._8_4_ = 0x219392ef;
      auVar339._0_8_ = 0x219392ef219392ef;
      auVar339._12_4_ = 0x219392ef;
      auVar339._16_4_ = 0x219392ef;
      auVar339._20_4_ = 0x219392ef;
      auVar339._24_4_ = 0x219392ef;
      auVar339._28_4_ = 0x219392ef;
      auVar12 = vcmpps_avx(auVar161,auVar339,1);
      auVar66._4_4_ =
           (fVar167 + fVar167 * auVar340._4_4_) *
           -(fVar309 * fVar267 + fVar379 * fVar266 + fVar399 * fVar265);
      auVar66._0_4_ =
           (fVar165 + fVar165 * auVar340._0_4_) *
           -(fVar292 * fVar247 + fVar374 * fVar246 + fVar392 * fVar231);
      auVar66._8_4_ =
           (fVar272 + fVar272 * auVar340._8_4_) *
           -(fVar310 * fVar347 + fVar381 * fVar345 + fVar403 * fVar343);
      auVar66._12_4_ =
           (fVar285 + fVar285 * auVar340._12_4_) *
           -(fVar312 * fVar384 + fVar383 * fVar382 + fVar407 * fVar380);
      auVar66._16_4_ =
           (fVar286 + fVar286 * auVar340._16_4_) *
           -(fVar314 * fVar406 + fVar385 * fVar402 + fVar410 * fVar401);
      auVar66._20_4_ =
           (fVar287 + fVar287 * auVar340._20_4_) *
           -(fVar316 * fVar20 + fVar387 * fVar19 + fVar413 * fVar18);
      auVar66._24_4_ =
           (fVar288 + fVar288 * auVar340._24_4_) *
           -(fVar318 * fVar28 + fVar389 * fVar27 + fVar416 * fVar26);
      auVar66._28_4_ = -(auVar31._28_4_ + fVar230);
      auVar87 = ZEXT812(0);
      auVar161 = vcmpps_avx(auVar186,ZEXT1232(auVar87) << 0x20,1);
      auVar161 = vorps_avx(auVar12,auVar161);
      auVar326._8_4_ = 0xff800000;
      auVar326._0_8_ = 0xff800000ff800000;
      auVar326._12_4_ = 0xff800000;
      auVar326._16_4_ = 0xff800000;
      auVar326._20_4_ = 0xff800000;
      auVar326._24_4_ = 0xff800000;
      auVar326._28_4_ = 0xff800000;
      auVar327 = ZEXT3264(auVar326);
      auVar161 = vblendvps_avx(auVar66,auVar326,auVar161);
      auVar340 = vcmpps_avx(auVar186,ZEXT1232(auVar87) << 0x20,6);
      auVar12 = vorps_avx(auVar12,auVar340);
      auVar370._8_4_ = 0x7f800000;
      auVar370._0_8_ = 0x7f8000007f800000;
      auVar370._12_4_ = 0x7f800000;
      auVar370._16_4_ = 0x7f800000;
      auVar370._20_4_ = 0x7f800000;
      auVar370._24_4_ = 0x7f800000;
      auVar370._28_4_ = 0x7f800000;
      auVar12 = vblendvps_avx(auVar66,auVar370,auVar12);
      auVar340 = vmaxps_avx(local_2c0,_local_c80);
      auVar340 = vmaxps_avx(auVar340,auVar161);
      auVar12 = vminps_avx(auVar118,auVar12);
      auVar150 = ZEXT1232(auVar87) << 0x20;
      auVar161 = vsubps_avx(auVar150,auVar397);
      auVar397 = vsubps_avx(auVar150,local_a60);
      auVar67._4_4_ = auVar397._4_4_ * -fVar400;
      auVar67._0_4_ = auVar397._0_4_ * -fVar393;
      auVar67._8_4_ = auVar397._8_4_ * -fVar404;
      auVar67._12_4_ = auVar397._12_4_ * -fVar408;
      auVar67._16_4_ = auVar397._16_4_ * -fVar411;
      auVar67._20_4_ = auVar397._20_4_ * -fVar414;
      auVar67._24_4_ = auVar397._24_4_ * -fVar417;
      auVar67._28_4_ = auVar397._28_4_;
      auVar377 = ZEXT3264(local_a20);
      auVar68._4_4_ = fVar252 * auVar161._4_4_;
      auVar68._0_4_ = fVar228 * auVar161._0_4_;
      auVar68._8_4_ = fVar335 * auVar161._8_4_;
      auVar68._12_4_ = fVar373 * auVar161._12_4_;
      auVar68._16_4_ = fVar418 * auVar161._16_4_;
      auVar68._20_4_ = fVar16 * auVar161._20_4_;
      auVar68._24_4_ = fVar24 * auVar161._24_4_;
      auVar68._28_4_ = auVar161._28_4_;
      auVar161 = vsubps_avx(auVar67,auVar68);
      auVar397 = vsubps_avx(auVar150,local_9e0);
      auVar69._4_4_ = fVar264 * auVar397._4_4_;
      auVar69._0_4_ = fVar229 * auVar397._0_4_;
      auVar69._8_4_ = fVar341 * auVar397._8_4_;
      auVar69._12_4_ = fVar378 * auVar397._12_4_;
      auVar69._16_4_ = fVar398 * auVar397._16_4_;
      auVar69._20_4_ = fVar17 * auVar397._20_4_;
      uVar1 = auVar397._28_4_;
      auVar69._24_4_ = fVar25 * auVar397._24_4_;
      auVar69._28_4_ = uVar1;
      auVar30 = vsubps_avx(auVar161,auVar69);
      auVar70._4_4_ = (float)local_840._4_4_ * -fVar400;
      auVar70._0_4_ = (float)local_840._0_4_ * -fVar393;
      auVar70._8_4_ = fStack_838 * -fVar404;
      auVar70._12_4_ = fStack_834 * -fVar408;
      auVar70._16_4_ = fStack_830 * -fVar411;
      auVar70._20_4_ = fStack_82c * -fVar414;
      auVar70._24_4_ = fStack_828 * -fVar417;
      auVar70._28_4_ = uVar98 ^ 0x80000000;
      auVar71._4_4_ = (float)local_8a0._4_4_ * fVar252;
      auVar71._0_4_ = (float)local_8a0._0_4_ * fVar228;
      auVar71._8_4_ = fStack_898 * fVar335;
      auVar71._12_4_ = fStack_894 * fVar373;
      auVar71._16_4_ = fStack_890 * fVar418;
      auVar71._20_4_ = fStack_88c * fVar16;
      auVar71._24_4_ = fStack_888 * fVar24;
      auVar71._28_4_ = uVar1;
      auVar161 = vsubps_avx(auVar70,auVar71);
      auVar72._4_4_ = fVar264 * (float)local_880._4_4_;
      auVar72._0_4_ = fVar229 * (float)local_880._0_4_;
      auVar72._8_4_ = fVar341 * fStack_878;
      auVar72._12_4_ = fVar378 * fStack_874;
      auVar72._16_4_ = fVar398 * fStack_870;
      auVar72._20_4_ = fVar17 * fStack_86c;
      auVar72._24_4_ = fVar25 * fStack_868;
      auVar72._28_4_ = uVar1;
      auVar360._8_4_ = 0x3f800000;
      auVar360._0_8_ = 0x3f8000003f800000;
      auVar360._12_4_ = 0x3f800000;
      auVar360._16_4_ = 0x3f800000;
      auVar360._20_4_ = 0x3f800000;
      auVar360._24_4_ = 0x3f800000;
      auVar360._28_4_ = 0x3f800000;
      auVar363 = ZEXT3264(auVar360);
      auVar31 = vsubps_avx(auVar161,auVar72);
      auVar161 = vrcpps_avx(auVar31);
      fVar228 = auVar161._0_4_;
      fVar229 = auVar161._4_4_;
      auVar73._4_4_ = auVar31._4_4_ * fVar229;
      auVar73._0_4_ = auVar31._0_4_ * fVar228;
      fVar231 = auVar161._8_4_;
      auVar73._8_4_ = auVar31._8_4_ * fVar231;
      fVar246 = auVar161._12_4_;
      auVar73._12_4_ = auVar31._12_4_ * fVar246;
      fVar247 = auVar161._16_4_;
      auVar73._16_4_ = auVar31._16_4_ * fVar247;
      fVar252 = auVar161._20_4_;
      auVar73._20_4_ = auVar31._20_4_ * fVar252;
      fVar264 = auVar161._24_4_;
      auVar73._24_4_ = auVar31._24_4_ * fVar264;
      auVar73._28_4_ = fStack_864;
      auVar118 = vsubps_avx(auVar360,auVar73);
      auVar161 = vandps_avx(auVar31,auVar301);
      auVar302._8_4_ = 0x219392ef;
      auVar302._0_8_ = 0x219392ef219392ef;
      auVar302._12_4_ = 0x219392ef;
      auVar302._16_4_ = 0x219392ef;
      auVar302._20_4_ = 0x219392ef;
      auVar302._24_4_ = 0x219392ef;
      auVar302._28_4_ = 0x219392ef;
      auVar397 = vcmpps_avx(auVar161,auVar302,1);
      auVar74._4_4_ = (fVar229 + fVar229 * auVar118._4_4_) * -auVar30._4_4_;
      auVar74._0_4_ = (fVar228 + fVar228 * auVar118._0_4_) * -auVar30._0_4_;
      auVar74._8_4_ = (fVar231 + fVar231 * auVar118._8_4_) * -auVar30._8_4_;
      auVar74._12_4_ = (fVar246 + fVar246 * auVar118._12_4_) * -auVar30._12_4_;
      auVar74._16_4_ = (fVar247 + fVar247 * auVar118._16_4_) * -auVar30._16_4_;
      auVar74._20_4_ = (fVar252 + fVar252 * auVar118._20_4_) * -auVar30._20_4_;
      auVar74._24_4_ = (fVar264 + fVar264 * auVar118._24_4_) * -auVar30._24_4_;
      auVar74._28_4_ = auVar30._28_4_ ^ 0x80000000;
      auVar161 = vcmpps_avx(auVar31,auVar150,1);
      auVar161 = vorps_avx(auVar397,auVar161);
      auVar161 = vblendvps_avx(auVar74,auVar326,auVar161);
      _local_860 = vmaxps_avx(auVar340,auVar161);
      auVar340 = ZEXT1232(auVar87) << 0x20;
      auVar161 = vcmpps_avx(auVar31,auVar340,6);
      auVar161 = vorps_avx(auVar397,auVar161);
      auVar161 = vblendvps_avx(auVar74,auVar370,auVar161);
      auVar117 = vandps_avx(auVar117,local_4c0);
      local_340 = vminps_avx(auVar12,auVar161);
      auVar161 = vcmpps_avx(_local_860,local_340,2);
      auVar397 = auVar117 & auVar161;
      if ((((((((auVar397 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar397 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar397 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar397 >> 0x7f,0) == '\0') &&
            (auVar397 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar397 >> 0xbf,0) == '\0') &&
          (auVar397 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar397[0x1f]) {
        auVar371 = ZEXT3264(_local_a00);
      }
      else {
        auVar397 = vminps_avx(auVar261,auVar122);
        auVar11 = vminps_avx(auVar11,auVar154);
        auVar397 = vminps_avx(auVar397,auVar11);
        auVar10 = vsubps_avx(auVar397,auVar10);
        auVar117 = vandps_avx(auVar161,auVar117);
        auVar161 = vminps_avx(_local_a80,auVar360);
        auVar161 = vmaxps_avx(auVar161,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar104 + fVar138 * (auVar161._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar135 + fVar164 * (auVar161._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar136 + fVar166 * (auVar161._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar137 + fVar168 * (auVar161._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar104 + fVar138 * (auVar161._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar135 + fVar164 * (auVar161._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar136 + fVar166 * (auVar161._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar137 + auVar161._28_4_ + 7.0;
        auVar93._4_4_ = fStack_2fc;
        auVar93._0_4_ = local_300;
        auVar93._8_4_ = fStack_2f8;
        auVar93._12_4_ = fStack_2f4;
        auVar93._16_4_ = fStack_2f0;
        auVar93._20_4_ = fStack_2ec;
        auVar93._24_4_ = fStack_2e8;
        auVar93._28_4_ = fStack_2e4;
        auVar161 = vminps_avx(auVar93,auVar360);
        auVar161 = vmaxps_avx(auVar161,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar104 + fVar138 * (auVar161._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar135 + fVar164 * (auVar161._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar136 + fVar166 * (auVar161._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar137 + fVar168 * (auVar161._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar104 + fVar138 * (auVar161._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar135 + fVar164 * (auVar161._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar136 + fVar166 * (auVar161._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar137 + auVar161._28_4_ + 7.0;
        auVar75._4_4_ = auVar10._4_4_ * 0.99999976;
        auVar75._0_4_ = auVar10._0_4_ * 0.99999976;
        auVar75._8_4_ = auVar10._8_4_ * 0.99999976;
        auVar75._12_4_ = auVar10._12_4_ * 0.99999976;
        auVar75._16_4_ = auVar10._16_4_ * 0.99999976;
        auVar75._20_4_ = auVar10._20_4_ * 0.99999976;
        auVar75._24_4_ = auVar10._24_4_ * 0.99999976;
        auVar75._28_4_ = 0x3f7ffffc;
        auVar161 = vmaxps_avx(auVar340,auVar75);
        auVar76._4_4_ = auVar161._4_4_ * auVar161._4_4_;
        auVar76._0_4_ = auVar161._0_4_ * auVar161._0_4_;
        auVar76._8_4_ = auVar161._8_4_ * auVar161._8_4_;
        auVar76._12_4_ = auVar161._12_4_ * auVar161._12_4_;
        auVar76._16_4_ = auVar161._16_4_ * auVar161._16_4_;
        auVar76._20_4_ = auVar161._20_4_ * auVar161._20_4_;
        auVar76._24_4_ = auVar161._24_4_ * auVar161._24_4_;
        auVar76._28_4_ = auVar161._28_4_;
        auVar10 = vsubps_avx(auVar119,auVar76);
        auVar77._4_4_ = auVar10._4_4_ * fVar170 * 4.0;
        auVar77._0_4_ = auVar10._0_4_ * fVar169 * 4.0;
        auVar77._8_4_ = auVar10._8_4_ * fVar171 * 4.0;
        auVar77._12_4_ = auVar10._12_4_ * fVar172 * 4.0;
        auVar77._16_4_ = auVar10._16_4_ * fVar349 * 4.0;
        auVar77._20_4_ = auVar10._20_4_ * fVar352 * 4.0;
        auVar77._24_4_ = auVar10._24_4_ * fVar355 * 4.0;
        auVar77._28_4_ = auVar161._28_4_;
        auVar397 = vsubps_avx(auVar59,auVar77);
        auVar161 = vcmpps_avx(auVar397,ZEXT832(0) << 0x20,5);
        if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar161 >> 0x7f,0) == '\0') &&
              (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar161 >> 0xbf,0) == '\0') &&
            (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar161[0x1f]) {
          auVar154 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_8e0 = ZEXT832(0) << 0x20;
          _local_900 = ZEXT832(0) << 0x20;
          auVar215 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar240 = ZEXT828(0) << 0x20;
          auVar281._8_4_ = 0x7f800000;
          auVar281._0_8_ = 0x7f8000007f800000;
          auVar281._12_4_ = 0x7f800000;
          auVar281._16_4_ = 0x7f800000;
          auVar281._20_4_ = 0x7f800000;
          auVar281._24_4_ = 0x7f800000;
          auVar281._28_4_ = 0x7f800000;
          auVar303._8_4_ = 0xff800000;
          auVar303._0_8_ = 0xff800000ff800000;
          auVar303._12_4_ = 0xff800000;
          auVar303._16_4_ = 0xff800000;
          auVar303._20_4_ = 0xff800000;
          auVar303._24_4_ = 0xff800000;
          auVar303._28_4_ = 0xff800000;
          _local_8c0 = _local_8e0;
        }
        else {
          auVar154 = vsqrtps_avx(auVar397);
          auVar221._0_4_ = fVar169 + fVar169;
          auVar221._4_4_ = fVar170 + fVar170;
          auVar221._8_4_ = fVar171 + fVar171;
          auVar221._12_4_ = fVar172 + fVar172;
          auVar221._16_4_ = fVar349 + fVar349;
          auVar221._20_4_ = fVar352 + fVar352;
          auVar221._24_4_ = fVar355 + fVar355;
          auVar221._28_4_ = fVar224 + fVar224;
          auVar11 = vrcpps_avx(auVar221);
          fVar224 = auVar11._0_4_;
          fVar228 = auVar11._4_4_;
          auVar78._4_4_ = auVar221._4_4_ * fVar228;
          auVar78._0_4_ = auVar221._0_4_ * fVar224;
          fVar229 = auVar11._8_4_;
          auVar78._8_4_ = auVar221._8_4_ * fVar229;
          fVar231 = auVar11._12_4_;
          auVar78._12_4_ = auVar221._12_4_ * fVar231;
          fVar246 = auVar11._16_4_;
          auVar78._16_4_ = auVar221._16_4_ * fVar246;
          fVar247 = auVar11._20_4_;
          auVar78._20_4_ = auVar221._20_4_ * fVar247;
          fVar252 = auVar11._24_4_;
          auVar78._24_4_ = auVar221._24_4_ * fVar252;
          auVar78._28_4_ = auVar221._28_4_;
          auVar12 = vsubps_avx(auVar360,auVar78);
          fVar224 = fVar224 + fVar224 * auVar12._0_4_;
          fVar228 = fVar228 + fVar228 * auVar12._4_4_;
          fVar229 = fVar229 + fVar229 * auVar12._8_4_;
          fVar231 = fVar231 + fVar231 * auVar12._12_4_;
          fVar246 = fVar246 + fVar246 * auVar12._16_4_;
          fVar247 = fVar247 + fVar247 * auVar12._20_4_;
          fVar252 = fVar252 + fVar252 * auVar12._24_4_;
          fVar264 = auVar11._28_4_ + auVar12._28_4_;
          auVar242._0_8_ = local_ac0._0_8_ ^ 0x8000000080000000;
          auVar242._8_4_ = -local_ac0._8_4_;
          auVar242._12_4_ = -local_ac0._12_4_;
          auVar242._16_4_ = -local_ac0._16_4_;
          auVar242._20_4_ = -local_ac0._20_4_;
          auVar242._24_4_ = -local_ac0._24_4_;
          auVar242._28_4_ = -local_ac0._28_4_;
          auVar11 = vsubps_avx(auVar242,auVar154);
          fVar347 = auVar11._0_4_ * fVar224;
          fVar373 = auVar11._4_4_ * fVar228;
          auVar79._4_4_ = fVar373;
          auVar79._0_4_ = fVar347;
          fVar378 = auVar11._8_4_ * fVar229;
          auVar79._8_4_ = fVar378;
          fVar380 = auVar11._12_4_ * fVar231;
          auVar79._12_4_ = fVar380;
          fVar382 = auVar11._16_4_ * fVar246;
          auVar79._16_4_ = fVar382;
          fVar384 = auVar11._20_4_ * fVar247;
          auVar79._20_4_ = fVar384;
          fVar418 = auVar11._24_4_ * fVar252;
          auVar79._24_4_ = fVar418;
          auVar79._28_4_ = fVar405;
          auVar154 = vsubps_avx(auVar154,local_ac0);
          fVar224 = auVar154._0_4_ * fVar224;
          fVar228 = auVar154._4_4_ * fVar228;
          auVar80._4_4_ = fVar228;
          auVar80._0_4_ = fVar224;
          fVar229 = auVar154._8_4_ * fVar229;
          auVar80._8_4_ = fVar229;
          fVar231 = auVar154._12_4_ * fVar231;
          auVar80._12_4_ = fVar231;
          fVar246 = auVar154._16_4_ * fVar246;
          auVar80._16_4_ = fVar246;
          fVar247 = auVar154._20_4_ * fVar247;
          auVar80._20_4_ = fVar247;
          fVar252 = auVar154._24_4_ * fVar252;
          auVar80._24_4_ = fVar252;
          auVar80._28_4_ = local_a20._28_4_;
          auVar377 = ZEXT3264(auVar80);
          fVar265 = (fVar347 * fVar321 + local_580._0_4_) * fVar248;
          fVar266 = (fVar373 * fVar329 + local_580._4_4_) * fVar268;
          fVar267 = (fVar378 * fVar330 + local_580._8_4_) * fVar350;
          fVar335 = (fVar380 * fVar331 + local_580._12_4_) * fVar386;
          fVar341 = (fVar382 * fVar332 + local_580._16_4_) * fVar409;
          fVar343 = (fVar384 * fVar333 + local_580._20_4_) * fVar289;
          fVar345 = (fVar418 * fVar334 + local_580._24_4_) * fVar291;
          auStack_7b0._12_4_ = auVar13._28_4_;
          auVar155._0_4_ = local_980 + fVar227 * fVar265;
          auVar155._4_4_ = fStack_97c + fVar251 * fVar266;
          auVar155._8_4_ = fStack_978 + fVar271 * fVar267;
          auVar155._12_4_ = fStack_974 + fVar372 * fVar335;
          auVar155._16_4_ = fStack_970 + fVar391 * fVar341;
          auVar155._20_4_ = fStack_96c + fVar15 * fVar343;
          auVar155._24_4_ = fStack_968 + fVar23 * fVar345;
          auVar155._28_4_ = fStack_964 + auVar154._28_4_ + local_580._28_4_;
          auVar81._4_4_ = (float)local_880._4_4_ * fVar373;
          auVar81._0_4_ = (float)local_880._0_4_ * fVar347;
          auVar81._8_4_ = fStack_878 * fVar378;
          auVar81._12_4_ = fStack_874 * fVar380;
          auVar81._16_4_ = fStack_870 * fVar382;
          auVar81._20_4_ = fStack_86c * fVar384;
          auVar81._24_4_ = fStack_868 * fVar418;
          auVar81._28_4_ = fVar264;
          auVar154 = vsubps_avx(auVar81,auVar155);
          auVar222._0_4_ = fVar336 + fVar225 * fVar265;
          auVar222._4_4_ = fVar342 + fVar249 * fVar266;
          auVar222._8_4_ = fVar344 + fVar270 * fVar267;
          auVar222._12_4_ = fVar346 + fVar353 * fVar335;
          auVar222._16_4_ = fVar348 + fVar388 * fVar341;
          auVar222._20_4_ = fVar351 + fVar412 * fVar343;
          auVar222._24_4_ = fVar354 + fVar21 * fVar345;
          auVar222._28_4_ = fVar356 + fVar264;
          auVar282._0_4_ = (float)local_8a0._0_4_ * fVar347;
          auVar282._4_4_ = (float)local_8a0._4_4_ * fVar373;
          auVar282._8_4_ = fStack_898 * fVar378;
          auVar282._12_4_ = fStack_894 * fVar380;
          auVar282._16_4_ = fStack_890 * fVar382;
          auVar282._20_4_ = fStack_88c * fVar384;
          auVar282._24_4_ = fStack_888 * fVar418;
          auVar282._28_4_ = 0;
          local_a60 = vsubps_avx(auVar282,auVar222);
          auVar243._0_4_ = fVar173 + fVar226 * fVar265;
          auVar243._4_4_ = fVar195 + fVar250 * fVar266;
          auVar243._8_4_ = fVar196 + fVar269 * fVar267;
          auVar243._12_4_ = fVar197 + fVar364 * fVar335;
          auVar243._16_4_ = fVar198 + fVar390 * fVar341;
          auVar243._20_4_ = fVar199 + fVar415 * fVar343;
          auVar243._24_4_ = fVar200 + fVar22 * fVar345;
          auVar243._28_4_ = fVar201 + auVar11._28_4_;
          auVar82._4_4_ = (float)local_840._4_4_ * fVar373;
          auVar82._0_4_ = (float)local_840._0_4_ * fVar347;
          auVar82._8_4_ = fStack_838 * fVar378;
          auVar82._12_4_ = fStack_834 * fVar380;
          auVar82._16_4_ = fStack_830 * fVar382;
          auVar82._20_4_ = fStack_82c * fVar384;
          auVar82._24_4_ = fStack_828 * fVar418;
          auVar82._28_4_ = 0;
          auVar11 = vsubps_avx(auVar82,auVar243);
          auVar240 = auVar11._0_28_;
          fVar248 = (fVar224 * fVar321 + local_580._0_4_) * fVar248;
          fVar268 = (fVar228 * fVar329 + local_580._4_4_) * fVar268;
          fVar350 = (fVar229 * fVar330 + local_580._8_4_) * fVar350;
          fVar386 = (fVar231 * fVar331 + local_580._12_4_) * fVar386;
          fVar409 = (fVar246 * fVar332 + local_580._16_4_) * fVar409;
          fVar289 = (fVar247 * fVar333 + local_580._20_4_) * fVar289;
          fVar291 = (fVar252 * fVar334 + local_580._24_4_) * fVar291;
          auVar304._0_4_ = local_980 + fVar227 * fVar248;
          auVar304._4_4_ = fStack_97c + fVar251 * fVar268;
          auVar304._8_4_ = fStack_978 + fVar271 * fVar350;
          auVar304._12_4_ = fStack_974 + fVar372 * fVar386;
          auVar304._16_4_ = fStack_970 + fVar391 * fVar409;
          auVar304._20_4_ = fStack_96c + fVar15 * fVar289;
          auVar304._24_4_ = fStack_968 + fVar23 * fVar291;
          auVar304._28_4_ = fStack_964 + (float)auStack_7b0._12_4_;
          auVar83._4_4_ = (float)local_880._4_4_ * fVar228;
          auVar83._0_4_ = (float)local_880._0_4_ * fVar224;
          auVar83._8_4_ = fStack_878 * fVar229;
          auVar83._12_4_ = fStack_874 * fVar231;
          auVar83._16_4_ = fStack_870 * fVar246;
          auVar83._20_4_ = fStack_86c * fVar247;
          auVar83._24_4_ = fStack_868 * fVar252;
          auVar83._28_4_ = fStack_864;
          _local_8c0 = vsubps_avx(auVar83,auVar304);
          auVar305._0_4_ = fVar336 + fVar225 * fVar248;
          auVar305._4_4_ = fVar342 + fVar249 * fVar268;
          auVar305._8_4_ = fVar344 + fVar270 * fVar350;
          auVar305._12_4_ = fVar346 + fVar353 * fVar386;
          auVar305._16_4_ = fVar348 + fVar388 * fVar409;
          auVar305._20_4_ = fVar351 + fVar412 * fVar289;
          auVar305._24_4_ = fVar354 + fVar21 * fVar291;
          auVar305._28_4_ = fVar356 + local_8c0._28_4_;
          auVar84._4_4_ = (float)local_8a0._4_4_ * fVar228;
          auVar84._0_4_ = (float)local_8a0._0_4_ * fVar224;
          auVar84._8_4_ = fStack_898 * fVar229;
          auVar84._12_4_ = fStack_894 * fVar231;
          auVar84._16_4_ = fStack_890 * fVar246;
          auVar84._20_4_ = fStack_88c * fVar247;
          auVar84._24_4_ = fStack_888 * fVar252;
          auVar84._28_4_ = fStack_864;
          _local_8e0 = vsubps_avx(auVar84,auVar305);
          auVar283._0_4_ = fVar173 + fVar226 * fVar248;
          auVar283._4_4_ = fVar195 + fVar250 * fVar268;
          auVar283._8_4_ = fVar196 + fVar269 * fVar350;
          auVar283._12_4_ = fVar197 + fVar364 * fVar386;
          auVar283._16_4_ = fVar198 + fVar390 * fVar409;
          auVar283._20_4_ = fVar199 + fVar415 * fVar289;
          auVar283._24_4_ = fVar200 + fVar22 * fVar291;
          auVar283._28_4_ = fVar201 + local_580._28_4_ + 0.0;
          auVar85._4_4_ = (float)local_840._4_4_ * fVar228;
          auVar85._0_4_ = (float)local_840._0_4_ * fVar224;
          auVar85._8_4_ = fStack_838 * fVar229;
          auVar85._12_4_ = fStack_834 * fVar231;
          auVar85._16_4_ = fStack_830 * fVar246;
          auVar85._20_4_ = fStack_82c * fVar247;
          auVar85._24_4_ = fStack_828 * fVar252;
          auVar85._28_4_ = local_8e0._28_4_;
          _local_900 = vsubps_avx(auVar85,auVar283);
          auVar11 = vcmpps_avx(auVar397,auVar340,5);
          auVar284._8_4_ = 0x7f800000;
          auVar284._0_8_ = 0x7f8000007f800000;
          auVar284._12_4_ = 0x7f800000;
          auVar284._16_4_ = 0x7f800000;
          auVar284._20_4_ = 0x7f800000;
          auVar284._24_4_ = 0x7f800000;
          auVar284._28_4_ = 0x7f800000;
          auVar281 = vblendvps_avx(auVar284,auVar79,auVar11);
          auVar361._8_4_ = 0x7fffffff;
          auVar361._0_8_ = 0x7fffffff7fffffff;
          auVar361._12_4_ = 0x7fffffff;
          auVar361._16_4_ = 0x7fffffff;
          auVar361._20_4_ = 0x7fffffff;
          auVar361._24_4_ = 0x7fffffff;
          auVar361._28_4_ = 0x7fffffff;
          auVar397 = vandps_avx(auVar361,local_320);
          auVar397 = vmaxps_avx(local_4e0,auVar397);
          auVar86._4_4_ = auVar397._4_4_ * 1.9073486e-06;
          auVar86._0_4_ = auVar397._0_4_ * 1.9073486e-06;
          auVar86._8_4_ = auVar397._8_4_ * 1.9073486e-06;
          auVar86._12_4_ = auVar397._12_4_ * 1.9073486e-06;
          auVar86._16_4_ = auVar397._16_4_ * 1.9073486e-06;
          auVar86._20_4_ = auVar397._20_4_ * 1.9073486e-06;
          auVar86._24_4_ = auVar397._24_4_ * 1.9073486e-06;
          auVar86._28_4_ = auVar397._28_4_;
          auVar397 = vandps_avx(auVar361,local_560);
          auVar397 = vcmpps_avx(auVar397,auVar86,1);
          auVar306._8_4_ = 0xff800000;
          auVar306._0_8_ = 0xff800000ff800000;
          auVar306._12_4_ = 0xff800000;
          auVar306._16_4_ = 0xff800000;
          auVar306._20_4_ = 0xff800000;
          auVar306._24_4_ = 0xff800000;
          auVar306._28_4_ = 0xff800000;
          auVar303 = vblendvps_avx(auVar306,auVar80,auVar11);
          auVar12 = auVar11 & auVar397;
          if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0x7f,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0xbf,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar12[0x1f] < '\0') {
            auVar161 = vandps_avx(auVar397,auVar11);
            auVar212 = vpackssdw_avx(auVar161._0_16_,auVar161._16_16_);
            auVar397 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar12 = vcmpps_avx(auVar10,auVar397,2);
            auVar422._8_4_ = 0xff800000;
            auVar422._0_8_ = 0xff800000ff800000;
            auVar422._12_4_ = 0xff800000;
            auVar422._16_4_ = 0xff800000;
            auVar422._20_4_ = 0xff800000;
            auVar422._24_4_ = 0xff800000;
            auVar422._28_4_ = 0xff800000;
            auVar424._8_4_ = 0x7f800000;
            auVar424._0_8_ = 0x7f8000007f800000;
            auVar424._12_4_ = 0x7f800000;
            auVar424._16_4_ = 0x7f800000;
            auVar424._20_4_ = 0x7f800000;
            auVar424._24_4_ = 0x7f800000;
            auVar424._28_4_ = 0x7f800000;
            auVar10 = vblendvps_avx(auVar424,auVar422,auVar12);
            auVar108 = vpmovsxwd_avx(auVar212);
            auVar377 = ZEXT1664(auVar108);
            auVar212 = vpunpckhwd_avx(auVar212,auVar212);
            auVar362._16_16_ = auVar212;
            auVar362._0_16_ = auVar108;
            auVar281 = vblendvps_avx(auVar281,auVar10,auVar362);
            auVar10 = vblendvps_avx(auVar422,auVar424,auVar12);
            auVar303 = vblendvps_avx(auVar303,auVar10,auVar362);
            auVar397 = vcmpps_avx(auVar397,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar133._0_4_ = auVar397._0_4_ ^ auVar161._0_4_;
            auVar133._4_4_ = auVar397._4_4_ ^ auVar161._4_4_;
            auVar133._8_4_ = auVar397._8_4_ ^ auVar161._8_4_;
            auVar133._12_4_ = auVar397._12_4_ ^ auVar161._12_4_;
            auVar133._16_4_ = auVar397._16_4_ ^ auVar161._16_4_;
            auVar133._20_4_ = auVar397._20_4_ ^ auVar161._20_4_;
            auVar133._24_4_ = auVar397._24_4_ ^ auVar161._24_4_;
            auVar133._28_4_ = auVar397._28_4_ ^ auVar161._28_4_;
            auVar161 = vorps_avx(auVar12,auVar133);
            auVar161 = vandps_avx(auVar11,auVar161);
          }
          auVar363 = ZEXT3264(auVar397);
          auVar215 = local_a60._0_28_;
        }
        _local_3a0 = _local_860;
        local_380 = vminps_avx(local_340,auVar281);
        local_360 = vmaxps_avx(_local_860,auVar303);
        auVar10 = vcmpps_avx(_local_860,local_380,2);
        local_720 = vandps_avx(auVar10,auVar117);
        auVar10 = vcmpps_avx(local_360,local_340,2);
        local_760 = vandps_avx(auVar10,auVar117);
        auVar117 = vorps_avx(local_760,local_720);
        auVar371 = ZEXT3264(_local_a00);
        auVar327 = ZEXT1664(auVar175);
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0x7f,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar117 >> 0xbf,0) != '\0') ||
            (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar117[0x1f] < '\0') {
          _local_a80 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_780._0_4_ = auVar161._0_4_ ^ local_a80._0_4_;
          local_780._4_4_ = auVar161._4_4_ ^ local_a80._4_4_;
          local_780._8_4_ = auVar161._8_4_ ^ local_a80._8_4_;
          local_780._12_4_ = auVar161._12_4_ ^ local_a80._12_4_;
          local_780._16_4_ = auVar161._16_4_ ^ local_a80._16_4_;
          local_780._20_4_ = auVar161._20_4_ ^ local_a80._20_4_;
          local_780._24_4_ = auVar161._24_4_ ^ local_a80._24_4_;
          local_780._28_4_ = (uint)auVar161._28_4_ ^ (uint)local_a80._28_4_;
          auVar123._0_4_ =
               auVar154._0_4_ * (float)local_880._0_4_ +
               auVar215._0_4_ * (float)local_8a0._0_4_ + (float)local_840._0_4_ * auVar240._0_4_;
          auVar123._4_4_ =
               auVar154._4_4_ * (float)local_880._4_4_ +
               auVar215._4_4_ * (float)local_8a0._4_4_ + (float)local_840._4_4_ * auVar240._4_4_;
          auVar123._8_4_ =
               auVar154._8_4_ * fStack_878 +
               auVar215._8_4_ * fStack_898 + fStack_838 * auVar240._8_4_;
          auVar123._12_4_ =
               auVar154._12_4_ * fStack_874 +
               auVar215._12_4_ * fStack_894 + fStack_834 * auVar240._12_4_;
          auVar123._16_4_ =
               auVar154._16_4_ * fStack_870 +
               auVar215._16_4_ * fStack_890 + fStack_830 * auVar240._16_4_;
          auVar123._20_4_ =
               auVar154._20_4_ * fStack_86c +
               auVar215._20_4_ * fStack_88c + fStack_82c * auVar240._20_4_;
          auVar123._24_4_ =
               auVar154._24_4_ * fStack_868 +
               auVar215._24_4_ * fStack_888 + fStack_828 * auVar240._24_4_;
          auVar123._28_4_ = auVar161._28_4_ + auVar154._28_4_ + local_a80._28_4_;
          auVar156._8_4_ = 0x7fffffff;
          auVar156._0_8_ = 0x7fffffff7fffffff;
          auVar156._12_4_ = 0x7fffffff;
          auVar156._16_4_ = 0x7fffffff;
          auVar156._20_4_ = 0x7fffffff;
          auVar156._24_4_ = 0x7fffffff;
          auVar156._28_4_ = 0x7fffffff;
          auVar117 = vandps_avx(auVar123,auVar156);
          auVar157._8_4_ = 0x3e99999a;
          auVar157._0_8_ = 0x3e99999a3e99999a;
          auVar157._12_4_ = 0x3e99999a;
          auVar157._16_4_ = 0x3e99999a;
          auVar157._20_4_ = 0x3e99999a;
          auVar157._24_4_ = 0x3e99999a;
          auVar157._28_4_ = 0x3e99999a;
          auVar117 = vcmpps_avx(auVar117,auVar157,1);
          auVar117 = vorps_avx(auVar117,local_780);
          auVar158._8_4_ = 3;
          auVar158._0_8_ = 0x300000003;
          auVar158._12_4_ = 3;
          auVar158._16_4_ = 3;
          auVar158._20_4_ = 3;
          auVar158._24_4_ = 3;
          auVar158._28_4_ = 3;
          auVar187._8_4_ = 2;
          auVar187._0_8_ = 0x200000002;
          auVar187._12_4_ = 2;
          auVar187._16_4_ = 2;
          auVar187._20_4_ = 2;
          auVar187._24_4_ = 2;
          auVar187._28_4_ = 2;
          auVar117 = vblendvps_avx(auVar187,auVar158,auVar117);
          local_7a0 = ZEXT432(local_ce4);
          local_7c0 = vpshufd_avx(ZEXT416(local_ce4),0);
          auVar212 = vpcmpgtd_avx(auVar117._16_16_,local_7c0);
          auStack_7b0 = auVar13._16_16_;
          auVar108 = vpcmpgtd_avx(auVar117._0_16_,local_7c0);
          auVar159._16_16_ = auVar212;
          auVar159._0_16_ = auVar108;
          local_740 = vblendps_avx(ZEXT1632(auVar108),auVar159,0xf0);
          local_6e0 = vandnps_avx(local_740,local_720);
          auVar327 = ZEXT3264(local_6e0);
          auVar117 = local_720 & ~local_740;
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar117 >> 0x7f,0) == '\0') &&
                (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0xbf,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar117[0x1f]) {
            auVar212 = vshufps_avx(auVar175,auVar175,0);
            auVar124._16_16_ = auVar212;
            auVar124._0_16_ = auVar212;
            auVar240 = local_880._0_28_;
            auVar117 = local_360;
          }
          else {
            local_9a0._4_4_ = (float)local_860._4_4_ + (float)local_940._4_4_;
            local_9a0._0_4_ = (float)local_860._0_4_ + (float)local_940._0_4_;
            fStack_998 = fStack_858 + fStack_938;
            fStack_994 = fStack_854 + fStack_934;
            fStack_990 = fStack_850 + fStack_930;
            fStack_98c = fStack_84c + fStack_92c;
            fStack_988 = fStack_848 + fStack_928;
            fStack_984 = fStack_844 + fStack_924;
            local_7e0 = local_360;
            do {
              auVar125._8_4_ = 0x7f800000;
              auVar125._0_8_ = 0x7f8000007f800000;
              auVar125._12_4_ = 0x7f800000;
              auVar125._16_4_ = 0x7f800000;
              auVar125._20_4_ = 0x7f800000;
              auVar125._24_4_ = 0x7f800000;
              auVar125._28_4_ = 0x7f800000;
              auVar117 = auVar327._0_32_;
              auVar161 = vblendvps_avx(auVar125,_local_860,auVar117);
              auVar10 = vshufps_avx(auVar161,auVar161,0xb1);
              auVar10 = vminps_avx(auVar161,auVar10);
              auVar397 = vshufpd_avx(auVar10,auVar10,5);
              auVar10 = vminps_avx(auVar10,auVar397);
              auVar397 = vperm2f128_avx(auVar10,auVar10,1);
              auVar10 = vminps_avx(auVar10,auVar397);
              auVar161 = vcmpps_avx(auVar161,auVar10,0);
              auVar10 = auVar117 & auVar161;
              if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar10 >> 0x7f,0) != '\0') ||
                    (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0xbf,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar10[0x1f] < '\0') {
                auVar117 = vandps_avx(auVar161,auVar117);
              }
              uVar95 = vmovmskps_avx(auVar117);
              uVar98 = 0;
              if (uVar95 != 0) {
                for (; (uVar95 >> uVar98 & 1) == 0; uVar98 = uVar98 + 1) {
                }
              }
              uVar100 = (ulong)uVar98;
              *(undefined4 *)(local_6e0 + uVar100 * 4) = 0;
              fVar224 = local_1a0[uVar100];
              uVar98 = *(uint *)(local_3a0 + uVar100 * 4);
              fVar225 = auVar139._0_4_;
              if ((float)local_9c0._0_4_ < 0.0) {
                fVar225 = sqrtf((float)local_9c0._0_4_);
              }
              auVar175 = vminps_avx(_local_b00,_local_b20);
              auVar212 = vmaxps_avx(_local_b00,_local_b20);
              auVar108 = vminps_avx(_local_b10,_local_b30);
              auVar113 = vminps_avx(auVar175,auVar108);
              auVar175 = vmaxps_avx(_local_b10,_local_b30);
              auVar108 = vmaxps_avx(auVar212,auVar175);
              auVar204._8_4_ = 0x7fffffff;
              auVar204._0_8_ = 0x7fffffff7fffffff;
              auVar204._12_4_ = 0x7fffffff;
              auVar212 = vandps_avx(auVar113,auVar204);
              auVar175 = vandps_avx(auVar108,auVar204);
              auVar212 = vmaxps_avx(auVar212,auVar175);
              auVar175 = vmovshdup_avx(auVar212);
              auVar175 = vmaxss_avx(auVar175,auVar212);
              auVar212 = vshufpd_avx(auVar212,auVar212,1);
              auVar212 = vmaxss_avx(auVar212,auVar175);
              local_980 = auVar212._0_4_ * 1.9073486e-06;
              local_a20._0_4_ = fVar225 * 1.9073486e-06;
              local_820._0_16_ = vshufps_avx(auVar108,auVar108,0xff);
              auVar212 = vinsertps_avx(ZEXT416(uVar98),ZEXT416((uint)fVar224),0x10);
              auVar363 = ZEXT1664(auVar212);
              lVar99 = 5;
              do {
                auVar357 = auVar363._0_16_;
                auVar212 = vshufps_avx(auVar357,auVar357,0);
                auVar107._0_4_ = auVar212._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar107._4_4_ = auVar212._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar107._8_4_ = auVar212._8_4_ * fStack_9a8 + 0.0;
                auVar107._12_4_ = auVar212._12_4_ * fStack_9a4 + 0.0;
                auVar212 = vmovshdup_avx(auVar357);
                fVar229 = auVar212._0_4_;
                fVar227 = 1.0 - fVar229;
                fVar225 = fVar229 * fVar229;
                fVar226 = fVar229 * 3.0;
                fVar224 = fVar226 + -5.0;
                auVar212 = ZEXT416((uint)(fVar229 * fVar229 * -fVar227 * 0.5));
                auVar212 = vshufps_avx(auVar212,auVar212,0);
                auVar175 = ZEXT416((uint)((fVar227 * fVar227 * (fVar227 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar108 = ZEXT416((uint)((fVar225 * fVar224 + 2.0) * 0.5));
                auVar108 = vshufps_avx(auVar108,auVar108,0);
                auVar113 = ZEXT416((uint)(fVar227 * fVar227 * -fVar229 * 0.5));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar176._0_4_ =
                     auVar113._0_4_ * (float)local_b00._0_4_ +
                     auVar108._0_4_ * (float)local_b20._0_4_ +
                     auVar175._0_4_ * (float)local_b10._0_4_ +
                     auVar212._0_4_ * (float)local_b30._0_4_;
                auVar176._4_4_ =
                     auVar113._4_4_ * (float)local_b00._4_4_ +
                     auVar108._4_4_ * (float)local_b20._4_4_ +
                     auVar175._4_4_ * (float)local_b10._4_4_ +
                     auVar212._4_4_ * (float)local_b30._4_4_;
                auVar176._8_4_ =
                     auVar113._8_4_ * fStack_af8 +
                     auVar108._8_4_ * fStack_b18 +
                     auVar175._8_4_ * fStack_b08 + auVar212._8_4_ * fStack_b28;
                auVar176._12_4_ =
                     auVar113._12_4_ * fStack_af4 +
                     auVar108._12_4_ * fStack_b14 +
                     auVar175._12_4_ * fStack_b04 + auVar212._12_4_ * fStack_b24;
                local_a60._0_16_ = auVar176;
                auVar175 = vsubps_avx(auVar107,auVar176);
                auVar212 = vdpps_avx(auVar175,auVar175,0x7f);
                fVar228 = auVar212._0_4_;
                if (fVar228 < 0.0) {
                  local_9e0._0_4_ = fVar225;
                  local_a40._0_4_ = fVar226;
                  local_ac0._0_4_ = fVar224;
                  local_800._0_4_ = fVar227 * -2.0;
                  auVar327._0_4_ = sqrtf(fVar228);
                  auVar327._4_60_ = extraout_var;
                  auVar108 = auVar327._0_16_;
                  fVar231 = (float)local_800._0_4_;
                  fVar225 = (float)local_a40._0_4_;
                  fVar224 = (float)local_ac0._0_4_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar212,auVar212);
                  fVar231 = fVar227 * -2.0;
                  local_9e0._0_4_ = fVar225;
                  fVar225 = fVar226;
                }
                auVar377 = ZEXT1664(auVar108);
                auVar113 = ZEXT416((uint)(((float)local_9e0._0_4_ + fVar229 * fVar231) * 0.5));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar109 = ZEXT416((uint)(((fVar227 + fVar227) * (fVar225 + 2.0) +
                                          fVar227 * fVar227 * -3.0) * 0.5));
                auVar109 = vshufps_avx(auVar109,auVar109,0);
                auVar145 = ZEXT416((uint)((fVar224 * (fVar229 + fVar229) + fVar229 * fVar225) * 0.5)
                                  );
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                auVar140 = ZEXT416((uint)((fVar229 * (fVar227 + fVar227) - fVar227 * fVar227) * 0.5)
                                  );
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                auVar366._0_4_ =
                     (float)local_b00._0_4_ * auVar140._0_4_ +
                     (float)local_b20._0_4_ * auVar145._0_4_ +
                     (float)local_b30._0_4_ * auVar113._0_4_ +
                     (float)local_b10._0_4_ * auVar109._0_4_;
                auVar366._4_4_ =
                     (float)local_b00._4_4_ * auVar140._4_4_ +
                     (float)local_b20._4_4_ * auVar145._4_4_ +
                     (float)local_b30._4_4_ * auVar113._4_4_ +
                     (float)local_b10._4_4_ * auVar109._4_4_;
                auVar366._8_4_ =
                     fStack_af8 * auVar140._8_4_ +
                     fStack_b18 * auVar145._8_4_ +
                     fStack_b28 * auVar113._8_4_ + fStack_b08 * auVar109._8_4_;
                auVar366._12_4_ =
                     fStack_af4 * auVar140._12_4_ +
                     fStack_b14 * auVar145._12_4_ +
                     fStack_b24 * auVar113._12_4_ + fStack_b04 * auVar109._12_4_;
                auVar140 = vpermilps_avx(ZEXT416((uint)(fVar226 + -1.0)),0);
                auVar3 = vpermilps_avx(ZEXT416((uint)(fVar229 * -9.0 + 4.0)),0);
                auVar113 = ZEXT416((uint)(fVar229 * 9.0 + -5.0));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar109 = ZEXT416((uint)(fVar229 * -3.0 + 2.0));
                auVar145 = vshufps_avx(auVar109,auVar109,0);
                auVar109 = vdpps_avx(auVar366,auVar366,0x7f);
                auVar141._0_4_ =
                     (float)local_b00._0_4_ * auVar145._0_4_ +
                     (float)local_b20._0_4_ * auVar113._0_4_ +
                     (float)local_b10._0_4_ * auVar3._0_4_ + (float)local_b30._0_4_ * auVar140._0_4_
                ;
                auVar141._4_4_ =
                     (float)local_b00._4_4_ * auVar145._4_4_ +
                     (float)local_b20._4_4_ * auVar113._4_4_ +
                     (float)local_b10._4_4_ * auVar3._4_4_ + (float)local_b30._4_4_ * auVar140._4_4_
                ;
                auVar141._8_4_ =
                     fStack_af8 * auVar145._8_4_ +
                     fStack_b18 * auVar113._8_4_ +
                     fStack_b08 * auVar3._8_4_ + fStack_b28 * auVar140._8_4_;
                auVar141._12_4_ =
                     fStack_af4 * auVar145._12_4_ +
                     fStack_b14 * auVar113._12_4_ +
                     fStack_b04 * auVar3._12_4_ + fStack_b24 * auVar140._12_4_;
                auVar113 = vblendps_avx(auVar109,_DAT_01f7aa10,0xe);
                auVar145 = vrsqrtss_avx(auVar113,auVar113);
                fVar225 = auVar145._0_4_;
                fVar224 = auVar109._0_4_;
                auVar145 = vdpps_avx(auVar366,auVar141,0x7f);
                auVar140 = vshufps_avx(auVar109,auVar109,0);
                auVar142._0_4_ = auVar141._0_4_ * auVar140._0_4_;
                auVar142._4_4_ = auVar141._4_4_ * auVar140._4_4_;
                auVar142._8_4_ = auVar141._8_4_ * auVar140._8_4_;
                auVar142._12_4_ = auVar141._12_4_ * auVar140._12_4_;
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                auVar232._0_4_ = auVar366._0_4_ * auVar145._0_4_;
                auVar232._4_4_ = auVar366._4_4_ * auVar145._4_4_;
                auVar232._8_4_ = auVar366._8_4_ * auVar145._8_4_;
                auVar232._12_4_ = auVar366._12_4_ * auVar145._12_4_;
                auVar3 = vsubps_avx(auVar142,auVar232);
                auVar145 = vrcpss_avx(auVar113,auVar113);
                auVar113 = vmaxss_avx(ZEXT416((uint)local_980),
                                      ZEXT416((uint)(auVar363._0_4_ * (float)local_a20._0_4_)));
                auVar145 = ZEXT416((uint)(auVar145._0_4_ * (2.0 - fVar224 * auVar145._0_4_)));
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                uVar100 = CONCAT44(auVar366._4_4_,auVar366._0_4_);
                auVar293._0_8_ = uVar100 ^ 0x8000000080000000;
                auVar293._8_4_ = -auVar366._8_4_;
                auVar293._12_4_ = -auVar366._12_4_;
                auVar140 = ZEXT416((uint)(fVar225 * 1.5 +
                                         fVar224 * -0.5 * fVar225 * fVar225 * fVar225));
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                auVar205._0_4_ = auVar140._0_4_ * auVar3._0_4_ * auVar145._0_4_;
                auVar205._4_4_ = auVar140._4_4_ * auVar3._4_4_ * auVar145._4_4_;
                auVar205._8_4_ = auVar140._8_4_ * auVar3._8_4_ * auVar145._8_4_;
                auVar205._12_4_ = auVar140._12_4_ * auVar3._12_4_ * auVar145._12_4_;
                local_9e0._0_4_ = auVar366._0_4_ * auVar140._0_4_;
                local_9e0._4_4_ = auVar366._4_4_ * auVar140._4_4_;
                local_9e0._8_4_ = auVar366._8_4_ * auVar140._8_4_;
                local_9e0._12_4_ = auVar366._12_4_ * auVar140._12_4_;
                if (fVar224 < 0.0) {
                  fVar224 = sqrtf(fVar224);
                  auVar377 = ZEXT464(auVar108._0_4_);
                }
                else {
                  auVar108 = vsqrtss_avx(auVar109,auVar109);
                  fVar224 = auVar108._0_4_;
                }
                auVar108 = vdpps_avx(auVar175,local_9e0._0_16_,0x7f);
                fVar224 = (local_980 / fVar224) * (auVar377._0_4_ + 1.0) +
                          auVar113._0_4_ + auVar377._0_4_ * local_980;
                auVar109 = vdpps_avx(auVar293,local_9e0._0_16_,0x7f);
                auVar145 = vdpps_avx(auVar175,auVar205,0x7f);
                auVar140 = vdpps_avx(_local_9b0,local_9e0._0_16_,0x7f);
                auVar3 = vdpps_avx(auVar175,auVar293,0x7f);
                fVar225 = auVar109._0_4_ + auVar145._0_4_;
                fVar226 = auVar108._0_4_;
                auVar110._0_4_ = fVar226 * fVar226;
                auVar110._4_4_ = auVar108._4_4_ * auVar108._4_4_;
                auVar110._8_4_ = auVar108._8_4_ * auVar108._8_4_;
                auVar110._12_4_ = auVar108._12_4_ * auVar108._12_4_;
                auVar105 = vsubps_avx(auVar212,auVar110);
                local_9e0._0_16_ = ZEXT416((uint)fVar225);
                auVar109 = vdpps_avx(auVar175,_local_9b0,0x7f);
                fVar227 = auVar3._0_4_ - fVar226 * fVar225;
                auVar145 = vrsqrtss_avx(auVar105,auVar105);
                fVar229 = auVar105._0_4_;
                fVar225 = auVar145._0_4_;
                fVar225 = fVar225 * 1.5 + fVar229 * -0.5 * fVar225 * fVar225 * fVar225;
                if (fVar229 < 0.0) {
                  local_a40._0_4_ = fVar227;
                  local_ac0._0_4_ = fVar225;
                  auVar377 = ZEXT1664(auVar377._0_16_);
                  fVar229 = sqrtf(fVar229);
                  fVar225 = (float)local_ac0._0_4_;
                  fVar227 = (float)local_a40._0_4_;
                }
                else {
                  auVar145 = vsqrtss_avx(auVar105,auVar105);
                  fVar229 = auVar145._0_4_;
                }
                auVar3 = vpermilps_avx(local_a60._0_16_,0xff);
                auVar105 = vshufps_avx(auVar366,auVar366,0xff);
                fVar227 = fVar227 * fVar225 - auVar105._0_4_;
                fVar225 = (auVar109._0_4_ - fVar226 * auVar140._0_4_) * fVar225;
                auVar233._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
                auVar233._8_4_ = auVar140._8_4_ ^ 0x80000000;
                auVar233._12_4_ = auVar140._12_4_ ^ 0x80000000;
                auVar256._0_4_ = -fVar227;
                auVar256._4_4_ = 0x80000000;
                auVar256._8_4_ = 0x80000000;
                auVar256._12_4_ = 0x80000000;
                auVar109 = vinsertps_avx(auVar256,ZEXT416((uint)fVar225),0x1c);
                auVar140 = vmovsldup_avx(ZEXT416((uint)(local_9e0._0_4_ * fVar225 -
                                                       auVar140._0_4_ * fVar227)));
                auVar109 = vdivps_avx(auVar109,auVar140);
                auVar145 = vinsertps_avx(local_9e0._0_16_,auVar233,0x10);
                auVar145 = vdivps_avx(auVar145,auVar140);
                auVar140 = vmovsldup_avx(auVar108);
                auVar111 = ZEXT416((uint)(fVar229 - auVar3._0_4_));
                auVar3 = vmovsldup_avx(auVar111);
                auVar177._0_4_ = auVar140._0_4_ * auVar109._0_4_ + auVar3._0_4_ * auVar145._0_4_;
                auVar177._4_4_ = auVar140._4_4_ * auVar109._4_4_ + auVar3._4_4_ * auVar145._4_4_;
                auVar177._8_4_ = auVar140._8_4_ * auVar109._8_4_ + auVar3._8_4_ * auVar145._8_4_;
                auVar177._12_4_ =
                     auVar140._12_4_ * auVar109._12_4_ + auVar3._12_4_ * auVar145._12_4_;
                auVar357 = vsubps_avx(auVar357,auVar177);
                auVar363 = ZEXT1664(auVar357);
                auVar178._8_4_ = 0x7fffffff;
                auVar178._0_8_ = 0x7fffffff7fffffff;
                auVar178._12_4_ = 0x7fffffff;
                auVar108 = vandps_avx(auVar108,auVar178);
                if (auVar108._0_4_ < fVar224) {
                  auVar206._8_4_ = 0x7fffffff;
                  auVar206._0_8_ = 0x7fffffff7fffffff;
                  auVar206._12_4_ = 0x7fffffff;
                  auVar108 = vandps_avx(auVar111,auVar206);
                  if (auVar108._0_4_ <
                      (float)local_820._0_4_ * 1.9073486e-06 + auVar113._0_4_ + fVar224) {
                    fVar224 = auVar357._0_4_ + (float)local_920._0_4_;
                    if ((fVar224 < fVar202) ||
                       (fVar225 = *(float *)(ray + k * 4 + 0x100), fVar225 < fVar224)) break;
                    auVar108 = vmovshdup_avx(auVar357);
                    fVar226 = auVar108._0_4_;
                    if ((fVar226 < 0.0) || (1.0 < fVar226)) break;
                    auVar212 = vrsqrtss_avx(auVar212,auVar212);
                    fVar227 = auVar212._0_4_;
                    pGVar5 = (context->scene->geometries).items[uVar94].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar212 = ZEXT416((uint)(fVar227 * 1.5 +
                                             fVar228 * -0.5 * fVar227 * fVar227 * fVar227));
                    auVar212 = vshufps_avx(auVar212,auVar212,0);
                    local_c80._0_4_ = auVar175._0_4_;
                    local_c80._4_4_ = auVar175._4_4_;
                    fStack_c78 = auVar175._8_4_;
                    fStack_c74 = auVar175._12_4_;
                    auVar207._0_4_ = auVar212._0_4_ * (float)local_c80._0_4_;
                    auVar207._4_4_ = auVar212._4_4_ * (float)local_c80._4_4_;
                    auVar207._8_4_ = auVar212._8_4_ * fStack_c78;
                    auVar207._12_4_ = auVar212._12_4_ * fStack_c74;
                    auVar143._0_4_ = auVar366._0_4_ + auVar105._0_4_ * auVar207._0_4_;
                    auVar143._4_4_ = auVar366._4_4_ + auVar105._4_4_ * auVar207._4_4_;
                    auVar143._8_4_ = auVar366._8_4_ + auVar105._8_4_ * auVar207._8_4_;
                    auVar143._12_4_ = auVar366._12_4_ + auVar105._12_4_ * auVar207._12_4_;
                    auVar212 = vshufps_avx(auVar207,auVar207,0xc9);
                    auVar175 = vshufps_avx(auVar366,auVar366,0xc9);
                    auVar208._0_4_ = auVar175._0_4_ * auVar207._0_4_;
                    auVar208._4_4_ = auVar175._4_4_ * auVar207._4_4_;
                    auVar208._8_4_ = auVar175._8_4_ * auVar207._8_4_;
                    auVar208._12_4_ = auVar175._12_4_ * auVar207._12_4_;
                    auVar234._0_4_ = auVar366._0_4_ * auVar212._0_4_;
                    auVar234._4_4_ = auVar366._4_4_ * auVar212._4_4_;
                    auVar234._8_4_ = auVar366._8_4_ * auVar212._8_4_;
                    auVar234._12_4_ = auVar366._12_4_ * auVar212._12_4_;
                    auVar108 = vsubps_avx(auVar234,auVar208);
                    auVar212 = vshufps_avx(auVar108,auVar108,0xc9);
                    auVar175 = vshufps_avx(auVar143,auVar143,0xc9);
                    auVar235._0_4_ = auVar175._0_4_ * auVar212._0_4_;
                    auVar235._4_4_ = auVar175._4_4_ * auVar212._4_4_;
                    auVar235._8_4_ = auVar175._8_4_ * auVar212._8_4_;
                    auVar235._12_4_ = auVar175._12_4_ * auVar212._12_4_;
                    auVar212 = vshufps_avx(auVar108,auVar108,0xd2);
                    auVar144._0_4_ = auVar143._0_4_ * auVar212._0_4_;
                    auVar144._4_4_ = auVar143._4_4_ * auVar212._4_4_;
                    auVar144._8_4_ = auVar143._8_4_ * auVar212._8_4_;
                    auVar144._12_4_ = auVar143._12_4_ * auVar212._12_4_;
                    auVar212 = vsubps_avx(auVar235,auVar144);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar224;
                      uVar1 = vextractps_avx(auVar212,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                      uVar1 = vextractps_avx(auVar212,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar212._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar226;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_960;
                      *(uint *)(ray + k * 4 + 0x240) = uVar94;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar8 = context->user;
                    auStack_630 = vshufps_avx(auVar357,auVar357,0x55);
                    auStack_690 = vshufps_avx(auVar212,auVar212,0x55);
                    auStack_670 = vshufps_avx(auVar212,auVar212,0xaa);
                    auStack_650 = vshufps_avx(auVar212,auVar212,0);
                    local_6a0 = (RTCHitN  [16])auStack_690;
                    local_680 = auStack_670;
                    local_660 = auStack_650;
                    local_640 = auStack_630;
                    local_620 = ZEXT832(0) << 0x20;
                    local_600 = local_520._0_8_;
                    uStack_5f8 = local_520._8_8_;
                    uStack_5f0 = local_520._16_8_;
                    uStack_5e8 = local_520._24_8_;
                    local_5e0 = local_500._0_8_;
                    uStack_5d8 = local_500._8_8_;
                    uStack_5d0 = local_500._16_8_;
                    uStack_5c8 = local_500._24_8_;
                    *(undefined1 (*) [8])(local_a88 + 8) = local_a80;
                    *(undefined8 *)(local_a88 + 10) = uStack_a78;
                    *(undefined8 *)(local_a88 + 0xc) = uStack_a70;
                    *(undefined8 *)(local_a88 + 0xe) = uStack_a68;
                    *(undefined1 (*) [8])local_a88 = local_a80;
                    *(undefined8 *)(local_a88 + 2) = uStack_a78;
                    *(undefined8 *)(local_a88 + 4) = uStack_a70;
                    *(undefined8 *)(local_a88 + 6) = uStack_a68;
                    local_5c0 = pRVar8->instID[0];
                    uStack_5bc = local_5c0;
                    uStack_5b8 = local_5c0;
                    uStack_5b4 = local_5c0;
                    uStack_5b0 = local_5c0;
                    uStack_5ac = local_5c0;
                    uStack_5a8 = local_5c0;
                    uStack_5a4 = local_5c0;
                    local_5a0 = pRVar8->instPrimID[0];
                    uStack_59c = local_5a0;
                    uStack_598 = local_5a0;
                    uStack_594 = local_5a0;
                    uStack_590 = local_5a0;
                    uStack_58c = local_5a0;
                    uStack_588 = local_5a0;
                    uStack_584 = local_5a0;
                    *(float *)(ray + k * 4 + 0x100) = fVar224;
                    local_b60 = *local_a90;
                    local_b50 = *local_a98;
                    local_af0.valid = (int *)local_b60;
                    local_af0.geometryUserPtr = pGVar5->userPtr;
                    local_af0.context = context->user;
                    local_af0.hit = local_6a0;
                    local_af0.N = 8;
                    local_af0.ray = (RTCRayN *)ray;
                    if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar363 = ZEXT1664(auVar357);
                      auVar377 = ZEXT1664(auVar377._0_16_);
                      (*pGVar5->intersectionFilterN)(&local_af0);
                    }
                    auVar212 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                    auVar175 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                    auVar188._16_16_ = auVar175;
                    auVar188._0_16_ = auVar212;
                    auVar117 = _local_a80 & ~auVar188;
                    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar117 >> 0x7f,0) != '\0') ||
                          (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar117 >> 0xbf,0) != '\0') ||
                        (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar117[0x1f] < '\0') {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar363 = ZEXT1664(auVar363._0_16_);
                        auVar377 = ZEXT1664(auVar377._0_16_);
                        (*p_Var6)(&local_af0);
                      }
                      auVar212 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                      auVar175 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                      auVar126._16_16_ = auVar175;
                      auVar126._0_16_ = auVar212;
                      auVar117 = _local_a80 & ~auVar126;
                      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar117 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar117 >> 0x7f,0) != '\0') ||
                            (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar117 >> 0xbf,0) != '\0') ||
                          (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar117[0x1f] < '\0') {
                        auVar127._0_4_ = auVar212._0_4_ ^ local_a80._0_4_;
                        auVar127._4_4_ = auVar212._4_4_ ^ local_a80._4_4_;
                        auVar127._8_4_ = auVar212._8_4_ ^ (uint)uStack_a78;
                        auVar127._12_4_ = auVar212._12_4_ ^ uStack_a78._4_4_;
                        auVar127._16_4_ = auVar175._0_4_ ^ (uint)uStack_a70;
                        auVar127._20_4_ = auVar175._4_4_ ^ uStack_a70._4_4_;
                        auVar127._24_4_ = auVar175._8_4_ ^ (uint)uStack_a68;
                        auVar127._28_4_ = auVar175._12_4_ ^ uStack_a68._4_4_;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])local_af0.hit);
                        *(undefined1 (*) [32])(local_af0.ray + 0x180) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0x20));
                        *(undefined1 (*) [32])(local_af0.ray + 0x1a0) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0x40));
                        *(undefined1 (*) [32])(local_af0.ray + 0x1c0) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0x60));
                        *(undefined1 (*) [32])(local_af0.ray + 0x1e0) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0x80));
                        *(undefined1 (*) [32])(local_af0.ray + 0x200) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_af0.ray + 0x220) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_af0.ray + 0x240) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_af0.ray + 0x260) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0x100));
                        *(undefined1 (*) [32])(local_af0.ray + 0x280) = auVar117;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar225;
                    break;
                  }
                }
                lVar99 = lVar99 + -1;
              } while (lVar99 != 0);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar124._4_4_ = uVar1;
              auVar124._0_4_ = uVar1;
              auVar124._8_4_ = uVar1;
              auVar124._12_4_ = uVar1;
              auVar124._16_4_ = uVar1;
              auVar124._20_4_ = uVar1;
              auVar124._24_4_ = uVar1;
              auVar124._28_4_ = uVar1;
              auVar161 = vcmpps_avx(_local_9a0,auVar124,2);
              auVar117 = vandps_avx(auVar161,local_6e0);
              auVar327 = ZEXT3264(auVar117);
              auVar161 = local_6e0 & auVar161;
              auVar240 = local_880._0_28_;
              local_6e0 = auVar117;
            } while ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar161 >> 0x7f,0) != '\0') ||
                       (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar161 >> 0xbf,0) != '\0') ||
                     (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar161[0x1f] < '\0');
            auVar327 = ZEXT3264(local_360);
            auVar371 = ZEXT3264(_local_a00);
            auVar117 = local_7e0;
          }
          auVar160._0_4_ =
               auVar240._0_4_ * (float)local_8c0._0_4_ +
               (float)local_8a0._0_4_ * (float)local_8e0._0_4_ +
               (float)local_840._0_4_ * (float)local_900._0_4_;
          auVar160._4_4_ =
               auVar240._4_4_ * (float)local_8c0._4_4_ +
               (float)local_8a0._4_4_ * (float)local_8e0._4_4_ +
               (float)local_840._4_4_ * (float)local_900._4_4_;
          auVar160._8_4_ =
               auVar240._8_4_ * fStack_8b8 + fStack_898 * fStack_8d8 + fStack_838 * fStack_8f8;
          auVar160._12_4_ =
               auVar240._12_4_ * fStack_8b4 + fStack_894 * fStack_8d4 + fStack_834 * fStack_8f4;
          auVar160._16_4_ =
               auVar240._16_4_ * fStack_8b0 + fStack_890 * fStack_8d0 + fStack_830 * fStack_8f0;
          auVar160._20_4_ =
               auVar240._20_4_ * fStack_8ac + fStack_88c * fStack_8cc + fStack_82c * fStack_8ec;
          auVar160._24_4_ =
               auVar240._24_4_ * fStack_8a8 + fStack_888 * fStack_8c8 + fStack_828 * fStack_8e8;
          auVar160._28_4_ = fStack_884 + fStack_884 + auVar327._28_4_;
          auVar189._8_4_ = 0x7fffffff;
          auVar189._0_8_ = 0x7fffffff7fffffff;
          auVar189._12_4_ = 0x7fffffff;
          auVar189._16_4_ = 0x7fffffff;
          auVar189._20_4_ = 0x7fffffff;
          auVar189._24_4_ = 0x7fffffff;
          auVar189._28_4_ = 0x7fffffff;
          auVar161 = vandps_avx(auVar160,auVar189);
          auVar190._8_4_ = 0x3e99999a;
          auVar190._0_8_ = 0x3e99999a3e99999a;
          auVar190._12_4_ = 0x3e99999a;
          auVar190._16_4_ = 0x3e99999a;
          auVar190._20_4_ = 0x3e99999a;
          auVar190._24_4_ = 0x3e99999a;
          auVar190._28_4_ = 0x3e99999a;
          auVar161 = vcmpps_avx(auVar161,auVar190,1);
          auVar161 = vorps_avx(auVar161,local_780);
          auVar191._0_4_ = (float)local_940._0_4_ + auVar117._0_4_;
          auVar191._4_4_ = (float)local_940._4_4_ + auVar117._4_4_;
          auVar191._8_4_ = fStack_938 + auVar117._8_4_;
          auVar191._12_4_ = fStack_934 + auVar117._12_4_;
          auVar191._16_4_ = fStack_930 + auVar117._16_4_;
          auVar191._20_4_ = fStack_92c + auVar117._20_4_;
          auVar191._24_4_ = fStack_928 + auVar117._24_4_;
          auVar191._28_4_ = fStack_924 + auVar117._28_4_;
          auVar117 = vcmpps_avx(auVar191,auVar124,2);
          _local_900 = vandps_avx(auVar117,local_760);
          auVar192._8_4_ = 3;
          auVar192._0_8_ = 0x300000003;
          auVar192._12_4_ = 3;
          auVar192._16_4_ = 3;
          auVar192._20_4_ = 3;
          auVar192._24_4_ = 3;
          auVar192._28_4_ = 3;
          auVar223._8_4_ = 2;
          auVar223._0_8_ = 0x200000002;
          auVar223._12_4_ = 2;
          auVar223._16_4_ = 2;
          auVar223._20_4_ = 2;
          auVar223._24_4_ = 2;
          auVar223._28_4_ = 2;
          auVar117 = vblendvps_avx(auVar223,auVar192,auVar161);
          auVar212 = vpcmpgtd_avx(auVar117._16_16_,local_7c0);
          auVar175 = vpshufd_avx(local_7a0._0_16_,0);
          auVar175 = vpcmpgtd_avx(auVar117._0_16_,auVar175);
          auVar193._16_16_ = auVar212;
          auVar193._0_16_ = auVar124._0_16_;
          _local_8e0 = vblendps_avx(ZEXT1632(auVar175),auVar193,0xf0);
          auVar117 = vandnps_avx(_local_8e0,_local_900);
          auVar161 = _local_900 & ~_local_8e0;
          local_700 = auVar117;
          if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar161 >> 0x7f,0) != '\0') ||
                (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar161 >> 0xbf,0) != '\0') ||
              (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar161[0x1f] < '\0') {
            local_8c0._4_4_ = (float)local_940._4_4_ + local_360._4_4_;
            local_8c0._0_4_ = (float)local_940._0_4_ + local_360._0_4_;
            fStack_8b8 = fStack_938 + local_360._8_4_;
            fStack_8b4 = fStack_934 + local_360._12_4_;
            fStack_8b0 = fStack_930 + local_360._16_4_;
            fStack_8ac = fStack_92c + local_360._20_4_;
            fStack_8a8 = fStack_928 + local_360._24_4_;
            fStack_8a4 = fStack_924 + local_360._28_4_;
            _local_9a0 = local_360;
            do {
              auVar128._8_4_ = 0x7f800000;
              auVar128._0_8_ = 0x7f8000007f800000;
              auVar128._12_4_ = 0x7f800000;
              auVar128._16_4_ = 0x7f800000;
              auVar128._20_4_ = 0x7f800000;
              auVar128._24_4_ = 0x7f800000;
              auVar128._28_4_ = 0x7f800000;
              auVar161 = vblendvps_avx(auVar128,_local_9a0,auVar117);
              auVar10 = vshufps_avx(auVar161,auVar161,0xb1);
              auVar10 = vminps_avx(auVar161,auVar10);
              auVar397 = vshufpd_avx(auVar10,auVar10,5);
              auVar10 = vminps_avx(auVar10,auVar397);
              auVar397 = vperm2f128_avx(auVar10,auVar10,1);
              auVar10 = vminps_avx(auVar10,auVar397);
              auVar10 = vcmpps_avx(auVar161,auVar10,0);
              auVar397 = auVar117 & auVar10;
              auVar161 = auVar117;
              if ((((((((auVar397 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar397 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar397 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar397 >> 0x7f,0) != '\0') ||
                    (auVar397 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar397 >> 0xbf,0) != '\0') ||
                  (auVar397 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar397[0x1f] < '\0') {
                auVar161 = vandps_avx(auVar10,auVar117);
              }
              uVar95 = vmovmskps_avx(auVar161);
              uVar98 = 0;
              if (uVar95 != 0) {
                for (; (uVar95 >> uVar98 & 1) == 0; uVar98 = uVar98 + 1) {
                }
              }
              uVar100 = (ulong)uVar98;
              local_700 = auVar117;
              *(undefined4 *)(local_700 + uVar100 * 4) = 0;
              fVar224 = local_1c0[uVar100];
              uVar98 = *(uint *)(local_340 + uVar100 * 4);
              fVar225 = auVar29._0_4_;
              if ((float)local_9c0._0_4_ < 0.0) {
                fVar225 = sqrtf((float)local_9c0._0_4_);
              }
              auVar175 = vminps_avx(_local_b00,_local_b20);
              auVar212 = vmaxps_avx(_local_b00,_local_b20);
              auVar108 = vminps_avx(_local_b10,_local_b30);
              auVar113 = vminps_avx(auVar175,auVar108);
              auVar175 = vmaxps_avx(_local_b10,_local_b30);
              auVar108 = vmaxps_avx(auVar212,auVar175);
              auVar209._8_4_ = 0x7fffffff;
              auVar209._0_8_ = 0x7fffffff7fffffff;
              auVar209._12_4_ = 0x7fffffff;
              auVar212 = vandps_avx(auVar113,auVar209);
              auVar175 = vandps_avx(auVar108,auVar209);
              auVar212 = vmaxps_avx(auVar212,auVar175);
              auVar175 = vmovshdup_avx(auVar212);
              auVar175 = vmaxss_avx(auVar175,auVar212);
              auVar212 = vshufpd_avx(auVar212,auVar212,1);
              auVar212 = vmaxss_avx(auVar212,auVar175);
              local_980 = auVar212._0_4_ * 1.9073486e-06;
              local_9e0._0_4_ = fVar225 * 1.9073486e-06;
              local_820._0_16_ = vshufps_avx(auVar108,auVar108,0xff);
              auVar212 = vinsertps_avx(ZEXT416(uVar98),ZEXT416((uint)fVar224),0x10);
              auVar363 = ZEXT1664(auVar212);
              lVar99 = 5;
              do {
                auVar357 = auVar363._0_16_;
                auVar212 = vshufps_avx(auVar357,auVar357,0);
                auVar112._0_4_ = auVar212._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar112._4_4_ = auVar212._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar112._8_4_ = auVar212._8_4_ * fStack_9a8 + 0.0;
                auVar112._12_4_ = auVar212._12_4_ * fStack_9a4 + 0.0;
                auVar212 = vmovshdup_avx(auVar357);
                fVar229 = auVar212._0_4_;
                fVar227 = 1.0 - fVar229;
                fVar225 = fVar229 * fVar229;
                fVar226 = fVar229 * 3.0;
                fVar224 = fVar226 + -5.0;
                auVar212 = ZEXT416((uint)(fVar229 * fVar229 * -fVar227 * 0.5));
                auVar212 = vshufps_avx(auVar212,auVar212,0);
                auVar175 = ZEXT416((uint)((fVar227 * fVar227 * (fVar227 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar108 = ZEXT416((uint)((fVar225 * fVar224 + 2.0) * 0.5));
                auVar108 = vshufps_avx(auVar108,auVar108,0);
                auVar113 = ZEXT416((uint)(fVar227 * fVar227 * -fVar229 * 0.5));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar179._0_4_ =
                     auVar113._0_4_ * (float)local_b00._0_4_ +
                     auVar108._0_4_ * (float)local_b20._0_4_ +
                     auVar175._0_4_ * (float)local_b10._0_4_ +
                     auVar212._0_4_ * (float)local_b30._0_4_;
                auVar179._4_4_ =
                     auVar113._4_4_ * (float)local_b00._4_4_ +
                     auVar108._4_4_ * (float)local_b20._4_4_ +
                     auVar175._4_4_ * (float)local_b10._4_4_ +
                     auVar212._4_4_ * (float)local_b30._4_4_;
                auVar179._8_4_ =
                     auVar113._8_4_ * fStack_af8 +
                     auVar108._8_4_ * fStack_b18 +
                     auVar175._8_4_ * fStack_b08 + auVar212._8_4_ * fStack_b28;
                auVar179._12_4_ =
                     auVar113._12_4_ * fStack_af4 +
                     auVar108._12_4_ * fStack_b14 +
                     auVar175._12_4_ * fStack_b04 + auVar212._12_4_ * fStack_b24;
                local_a60._0_16_ = auVar179;
                auVar175 = vsubps_avx(auVar112,auVar179);
                auVar212 = vdpps_avx(auVar175,auVar175,0x7f);
                fVar228 = auVar212._0_4_;
                if (fVar228 < 0.0) {
                  local_a20._0_4_ = fVar225;
                  local_a40._0_4_ = fVar226;
                  local_ac0._0_4_ = fVar224;
                  local_800._0_4_ = fVar227 * -2.0;
                  fVar231 = sqrtf(fVar228);
                  fVar246 = (float)local_800._0_4_;
                  fVar225 = (float)local_a20._0_4_;
                  fVar247 = (float)local_a40._0_4_;
                  fVar224 = (float)local_ac0._0_4_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar212,auVar212);
                  fVar231 = auVar108._0_4_;
                  fVar246 = fVar227 * -2.0;
                  fVar247 = fVar226;
                }
                auVar108 = ZEXT416((uint)((fVar225 + fVar229 * fVar246) * 0.5));
                auVar108 = vshufps_avx(auVar108,auVar108,0);
                auVar113 = ZEXT416((uint)(((fVar227 + fVar227) * (fVar247 + 2.0) +
                                          fVar227 * fVar227 * -3.0) * 0.5));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar109 = ZEXT416((uint)((fVar224 * (fVar229 + fVar229) + fVar229 * fVar247) * 0.5)
                                  );
                auVar109 = vshufps_avx(auVar109,auVar109,0);
                auVar145 = ZEXT416((uint)((fVar229 * (fVar227 + fVar227) - fVar227 * fVar227) * 0.5)
                                  );
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                auVar367._0_4_ =
                     (float)local_b00._0_4_ * auVar145._0_4_ +
                     (float)local_b20._0_4_ * auVar109._0_4_ +
                     (float)local_b30._0_4_ * auVar108._0_4_ +
                     (float)local_b10._0_4_ * auVar113._0_4_;
                auVar367._4_4_ =
                     (float)local_b00._4_4_ * auVar145._4_4_ +
                     (float)local_b20._4_4_ * auVar109._4_4_ +
                     (float)local_b30._4_4_ * auVar108._4_4_ +
                     (float)local_b10._4_4_ * auVar113._4_4_;
                auVar367._8_4_ =
                     fStack_af8 * auVar145._8_4_ +
                     fStack_b18 * auVar109._8_4_ +
                     fStack_b28 * auVar108._8_4_ + fStack_b08 * auVar113._8_4_;
                auVar367._12_4_ =
                     fStack_af4 * auVar145._12_4_ +
                     fStack_b14 * auVar109._12_4_ +
                     fStack_b24 * auVar108._12_4_ + fStack_b04 * auVar113._12_4_;
                auVar145 = vpermilps_avx(ZEXT416((uint)(fVar226 + -1.0)),0);
                auVar140 = vpermilps_avx(ZEXT416((uint)(fVar229 * -9.0 + 4.0)),0);
                auVar108 = ZEXT416((uint)(fVar229 * 9.0 + -5.0));
                auVar108 = vshufps_avx(auVar108,auVar108,0);
                auVar113 = ZEXT416((uint)(fVar229 * -3.0 + 2.0));
                auVar109 = vshufps_avx(auVar113,auVar113,0);
                auVar113 = vdpps_avx(auVar367,auVar367,0x7f);
                auVar146._0_4_ =
                     (float)local_b00._0_4_ * auVar109._0_4_ +
                     (float)local_b20._0_4_ * auVar108._0_4_ +
                     (float)local_b10._0_4_ * auVar140._0_4_ +
                     (float)local_b30._0_4_ * auVar145._0_4_;
                auVar146._4_4_ =
                     (float)local_b00._4_4_ * auVar109._4_4_ +
                     (float)local_b20._4_4_ * auVar108._4_4_ +
                     (float)local_b10._4_4_ * auVar140._4_4_ +
                     (float)local_b30._4_4_ * auVar145._4_4_;
                auVar146._8_4_ =
                     fStack_af8 * auVar109._8_4_ +
                     fStack_b18 * auVar108._8_4_ +
                     fStack_b08 * auVar140._8_4_ + fStack_b28 * auVar145._8_4_;
                auVar146._12_4_ =
                     fStack_af4 * auVar109._12_4_ +
                     fStack_b14 * auVar108._12_4_ +
                     fStack_b04 * auVar140._12_4_ + fStack_b24 * auVar145._12_4_;
                auVar108 = vblendps_avx(auVar113,_DAT_01f7aa10,0xe);
                auVar109 = vrsqrtss_avx(auVar108,auVar108);
                fVar225 = auVar109._0_4_;
                fVar224 = auVar113._0_4_;
                auVar109 = vdpps_avx(auVar367,auVar146,0x7f);
                auVar145 = vshufps_avx(auVar113,auVar113,0);
                auVar147._0_4_ = auVar146._0_4_ * auVar145._0_4_;
                auVar147._4_4_ = auVar146._4_4_ * auVar145._4_4_;
                auVar147._8_4_ = auVar146._8_4_ * auVar145._8_4_;
                auVar147._12_4_ = auVar146._12_4_ * auVar145._12_4_;
                auVar109 = vshufps_avx(auVar109,auVar109,0);
                auVar236._0_4_ = auVar367._0_4_ * auVar109._0_4_;
                auVar236._4_4_ = auVar367._4_4_ * auVar109._4_4_;
                auVar236._8_4_ = auVar367._8_4_ * auVar109._8_4_;
                auVar236._12_4_ = auVar367._12_4_ * auVar109._12_4_;
                auVar140 = vsubps_avx(auVar147,auVar236);
                auVar109 = vrcpss_avx(auVar108,auVar108);
                auVar108 = vmaxss_avx(ZEXT416((uint)local_980),
                                      ZEXT416((uint)(auVar363._0_4_ * (float)local_9e0._0_4_)));
                auVar109 = ZEXT416((uint)(auVar109._0_4_ * (2.0 - fVar224 * auVar109._0_4_)));
                auVar109 = vshufps_avx(auVar109,auVar109,0);
                uVar100 = CONCAT44(auVar367._4_4_,auVar367._0_4_);
                auVar257._0_8_ = uVar100 ^ 0x8000000080000000;
                auVar257._8_4_ = -auVar367._8_4_;
                auVar257._12_4_ = -auVar367._12_4_;
                auVar145 = ZEXT416((uint)(fVar225 * 1.5 +
                                         fVar224 * -0.5 * fVar225 * fVar225 * fVar225));
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                auVar210._0_4_ = auVar145._0_4_ * auVar140._0_4_ * auVar109._0_4_;
                auVar210._4_4_ = auVar145._4_4_ * auVar140._4_4_ * auVar109._4_4_;
                auVar210._8_4_ = auVar145._8_4_ * auVar140._8_4_ * auVar109._8_4_;
                auVar210._12_4_ = auVar145._12_4_ * auVar140._12_4_ * auVar109._12_4_;
                auVar274._0_4_ = auVar367._0_4_ * auVar145._0_4_;
                auVar274._4_4_ = auVar367._4_4_ * auVar145._4_4_;
                auVar274._8_4_ = auVar367._8_4_ * auVar145._8_4_;
                auVar274._12_4_ = auVar367._12_4_ * auVar145._12_4_;
                if (fVar224 < 0.0) {
                  local_a20._0_16_ = auVar274;
                  fVar224 = sqrtf(fVar224);
                  auVar274 = local_a20._0_16_;
                }
                else {
                  auVar113 = vsqrtss_avx(auVar113,auVar113);
                  fVar224 = auVar113._0_4_;
                }
                auVar113 = vdpps_avx(auVar175,auVar274,0x7f);
                fVar224 = (local_980 / fVar224) * (fVar231 + 1.0) +
                          auVar108._0_4_ + fVar231 * local_980;
                auVar109 = vdpps_avx(auVar257,auVar274,0x7f);
                auVar145 = vdpps_avx(auVar175,auVar210,0x7f);
                auVar140 = vdpps_avx(_local_9b0,auVar274,0x7f);
                auVar3 = vdpps_avx(auVar175,auVar257,0x7f);
                fVar225 = auVar109._0_4_ + auVar145._0_4_;
                fVar227 = auVar113._0_4_;
                auVar114._0_4_ = fVar227 * fVar227;
                auVar114._4_4_ = auVar113._4_4_ * auVar113._4_4_;
                auVar114._8_4_ = auVar113._8_4_ * auVar113._8_4_;
                auVar114._12_4_ = auVar113._12_4_ * auVar113._12_4_;
                auVar105 = vsubps_avx(auVar212,auVar114);
                auVar111 = ZEXT416((uint)fVar225);
                auVar109 = vdpps_avx(auVar175,_local_9b0,0x7f);
                fVar229 = auVar3._0_4_ - fVar227 * fVar225;
                auVar145 = vrsqrtss_avx(auVar105,auVar105);
                fVar231 = auVar105._0_4_;
                fVar226 = auVar145._0_4_;
                fVar226 = fVar226 * 1.5 + fVar231 * -0.5 * fVar226 * fVar226 * fVar226;
                if (fVar231 < 0.0) {
                  local_a20._0_16_ = auVar113;
                  local_a40._0_4_ = fVar229;
                  local_ac0._0_4_ = fVar226;
                  fVar231 = sqrtf(fVar231);
                  fVar226 = (float)local_ac0._0_4_;
                  fVar229 = (float)local_a40._0_4_;
                  auVar113 = local_a20._0_16_;
                }
                else {
                  auVar145 = vsqrtss_avx(auVar105,auVar105);
                  fVar231 = auVar145._0_4_;
                }
                auVar3 = vpermilps_avx(local_a60._0_16_,0xff);
                auVar105 = vshufps_avx(auVar367,auVar367,0xff);
                fVar229 = fVar229 * fVar226 - auVar105._0_4_;
                fVar226 = (auVar109._0_4_ - fVar227 * auVar140._0_4_) * fVar226;
                auVar237._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
                auVar237._8_4_ = auVar140._8_4_ ^ 0x80000000;
                auVar237._12_4_ = auVar140._12_4_ ^ 0x80000000;
                auVar258._0_4_ = -fVar229;
                auVar258._4_4_ = 0x80000000;
                auVar258._8_4_ = 0x80000000;
                auVar258._12_4_ = 0x80000000;
                auVar377 = ZEXT1664(auVar111);
                auVar109 = vinsertps_avx(auVar258,ZEXT416((uint)fVar226),0x1c);
                auVar140 = vmovsldup_avx(ZEXT416((uint)(fVar225 * fVar226 - auVar140._0_4_ * fVar229
                                                       )));
                auVar109 = vdivps_avx(auVar109,auVar140);
                auVar145 = vinsertps_avx(auVar111,auVar237,0x10);
                auVar145 = vdivps_avx(auVar145,auVar140);
                auVar140 = vmovsldup_avx(auVar113);
                auVar115 = ZEXT416((uint)(fVar231 - auVar3._0_4_));
                auVar3 = vmovsldup_avx(auVar115);
                auVar180._0_4_ = auVar140._0_4_ * auVar109._0_4_ + auVar3._0_4_ * auVar145._0_4_;
                auVar180._4_4_ = auVar140._4_4_ * auVar109._4_4_ + auVar3._4_4_ * auVar145._4_4_;
                auVar180._8_4_ = auVar140._8_4_ * auVar109._8_4_ + auVar3._8_4_ * auVar145._8_4_;
                auVar180._12_4_ =
                     auVar140._12_4_ * auVar109._12_4_ + auVar3._12_4_ * auVar145._12_4_;
                auVar357 = vsubps_avx(auVar357,auVar180);
                auVar363 = ZEXT1664(auVar357);
                auVar181._8_4_ = 0x7fffffff;
                auVar181._0_8_ = 0x7fffffff7fffffff;
                auVar181._12_4_ = 0x7fffffff;
                auVar113 = vandps_avx(auVar113,auVar181);
                if (auVar113._0_4_ < fVar224) {
                  auVar211._8_4_ = 0x7fffffff;
                  auVar211._0_8_ = 0x7fffffff7fffffff;
                  auVar211._12_4_ = 0x7fffffff;
                  auVar113 = vandps_avx(auVar115,auVar211);
                  if (auVar113._0_4_ <
                      (float)local_820._0_4_ * 1.9073486e-06 + auVar108._0_4_ + fVar224) {
                    fVar224 = auVar357._0_4_ + (float)local_920._0_4_;
                    if ((fVar224 < fVar202) ||
                       (fVar225 = *(float *)(ray + k * 4 + 0x100), fVar225 < fVar224)) break;
                    auVar108 = vmovshdup_avx(auVar357);
                    fVar226 = auVar108._0_4_;
                    if ((fVar226 < 0.0) || (1.0 < fVar226)) break;
                    auVar212 = vrsqrtss_avx(auVar212,auVar212);
                    fVar227 = auVar212._0_4_;
                    pGVar5 = (context->scene->geometries).items[uVar94].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar212 = ZEXT416((uint)(fVar227 * 1.5 +
                                             fVar228 * -0.5 * fVar227 * fVar227 * fVar227));
                    auVar212 = vshufps_avx(auVar212,auVar212,0);
                    local_c80._0_4_ = auVar175._0_4_;
                    local_c80._4_4_ = auVar175._4_4_;
                    fStack_c78 = auVar175._8_4_;
                    fStack_c74 = auVar175._12_4_;
                    auVar213._0_4_ = auVar212._0_4_ * (float)local_c80._0_4_;
                    auVar213._4_4_ = auVar212._4_4_ * (float)local_c80._4_4_;
                    auVar213._8_4_ = auVar212._8_4_ * fStack_c78;
                    auVar213._12_4_ = auVar212._12_4_ * fStack_c74;
                    auVar148._0_4_ = auVar367._0_4_ + auVar105._0_4_ * auVar213._0_4_;
                    auVar148._4_4_ = auVar367._4_4_ + auVar105._4_4_ * auVar213._4_4_;
                    auVar148._8_4_ = auVar367._8_4_ + auVar105._8_4_ * auVar213._8_4_;
                    auVar148._12_4_ = auVar367._12_4_ + auVar105._12_4_ * auVar213._12_4_;
                    auVar212 = vshufps_avx(auVar213,auVar213,0xc9);
                    auVar175 = vshufps_avx(auVar367,auVar367,0xc9);
                    auVar214._0_4_ = auVar175._0_4_ * auVar213._0_4_;
                    auVar214._4_4_ = auVar175._4_4_ * auVar213._4_4_;
                    auVar214._8_4_ = auVar175._8_4_ * auVar213._8_4_;
                    auVar214._12_4_ = auVar175._12_4_ * auVar213._12_4_;
                    auVar238._0_4_ = auVar367._0_4_ * auVar212._0_4_;
                    auVar238._4_4_ = auVar367._4_4_ * auVar212._4_4_;
                    auVar238._8_4_ = auVar367._8_4_ * auVar212._8_4_;
                    auVar238._12_4_ = auVar367._12_4_ * auVar212._12_4_;
                    auVar108 = vsubps_avx(auVar238,auVar214);
                    auVar212 = vshufps_avx(auVar108,auVar108,0xc9);
                    auVar175 = vshufps_avx(auVar148,auVar148,0xc9);
                    auVar239._0_4_ = auVar175._0_4_ * auVar212._0_4_;
                    auVar239._4_4_ = auVar175._4_4_ * auVar212._4_4_;
                    auVar239._8_4_ = auVar175._8_4_ * auVar212._8_4_;
                    auVar239._12_4_ = auVar175._12_4_ * auVar212._12_4_;
                    auVar212 = vshufps_avx(auVar108,auVar108,0xd2);
                    auVar149._0_4_ = auVar148._0_4_ * auVar212._0_4_;
                    auVar149._4_4_ = auVar148._4_4_ * auVar212._4_4_;
                    auVar149._8_4_ = auVar148._8_4_ * auVar212._8_4_;
                    auVar149._12_4_ = auVar148._12_4_ * auVar212._12_4_;
                    auVar212 = vsubps_avx(auVar239,auVar149);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar224;
                      uVar1 = vextractps_avx(auVar212,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                      uVar1 = vextractps_avx(auVar212,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar212._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar226;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_960;
                      *(uint *)(ray + k * 4 + 0x240) = uVar94;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar8 = context->user;
                    auStack_630 = vshufps_avx(auVar357,auVar357,0x55);
                    auStack_690 = vshufps_avx(auVar212,auVar212,0x55);
                    auStack_670 = vshufps_avx(auVar212,auVar212,0xaa);
                    auStack_650 = vshufps_avx(auVar212,auVar212,0);
                    local_6a0 = (RTCHitN  [16])auStack_690;
                    local_680 = auStack_670;
                    local_660 = auStack_650;
                    local_640 = auStack_630;
                    local_620 = ZEXT832(0) << 0x20;
                    local_600 = local_520._0_8_;
                    uStack_5f8 = local_520._8_8_;
                    uStack_5f0 = local_520._16_8_;
                    uStack_5e8 = local_520._24_8_;
                    local_5e0 = local_500._0_8_;
                    uStack_5d8 = local_500._8_8_;
                    uStack_5d0 = local_500._16_8_;
                    uStack_5c8 = local_500._24_8_;
                    *(undefined1 (*) [8])(local_a88 + 8) = local_a80;
                    *(undefined8 *)(local_a88 + 10) = uStack_a78;
                    *(undefined8 *)(local_a88 + 0xc) = uStack_a70;
                    *(undefined8 *)(local_a88 + 0xe) = uStack_a68;
                    *(undefined1 (*) [8])local_a88 = local_a80;
                    *(undefined8 *)(local_a88 + 2) = uStack_a78;
                    *(undefined8 *)(local_a88 + 4) = uStack_a70;
                    *(undefined8 *)(local_a88 + 6) = uStack_a68;
                    local_5c0 = pRVar8->instID[0];
                    uStack_5bc = local_5c0;
                    uStack_5b8 = local_5c0;
                    uStack_5b4 = local_5c0;
                    uStack_5b0 = local_5c0;
                    uStack_5ac = local_5c0;
                    uStack_5a8 = local_5c0;
                    uStack_5a4 = local_5c0;
                    local_5a0 = pRVar8->instPrimID[0];
                    uStack_59c = local_5a0;
                    uStack_598 = local_5a0;
                    uStack_594 = local_5a0;
                    uStack_590 = local_5a0;
                    uStack_58c = local_5a0;
                    uStack_588 = local_5a0;
                    uStack_584 = local_5a0;
                    *(float *)(ray + k * 4 + 0x100) = fVar224;
                    local_b60 = *local_a90;
                    local_b50 = *local_a98;
                    local_af0.valid = (int *)local_b60;
                    local_af0.geometryUserPtr = pGVar5->userPtr;
                    local_af0.context = context->user;
                    local_af0.hit = local_6a0;
                    local_af0.N = 8;
                    local_af0.ray = (RTCRayN *)ray;
                    if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar363 = ZEXT1664(auVar357);
                      auVar377 = ZEXT1664(auVar111);
                      (*pGVar5->intersectionFilterN)(&local_af0);
                    }
                    auVar212 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                    auVar175 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                    auVar194._16_16_ = auVar175;
                    auVar194._0_16_ = auVar212;
                    auVar117 = _local_a80 & ~auVar194;
                    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar117 >> 0x7f,0) != '\0') ||
                          (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar117 >> 0xbf,0) != '\0') ||
                        (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar117[0x1f] < '\0') {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar363 = ZEXT1664(auVar363._0_16_);
                        auVar377 = ZEXT1664(auVar377._0_16_);
                        (*p_Var6)(&local_af0);
                      }
                      auVar212 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                      auVar175 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                      auVar129._16_16_ = auVar175;
                      auVar129._0_16_ = auVar212;
                      auVar117 = _local_a80 & ~auVar129;
                      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar117 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar117 >> 0x7f,0) != '\0') ||
                            (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar117 >> 0xbf,0) != '\0') ||
                          (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar117[0x1f] < '\0') {
                        auVar130._0_4_ = auVar212._0_4_ ^ local_a80._0_4_;
                        auVar130._4_4_ = auVar212._4_4_ ^ local_a80._4_4_;
                        auVar130._8_4_ = auVar212._8_4_ ^ (uint)uStack_a78;
                        auVar130._12_4_ = auVar212._12_4_ ^ uStack_a78._4_4_;
                        auVar130._16_4_ = auVar175._0_4_ ^ (uint)uStack_a70;
                        auVar130._20_4_ = auVar175._4_4_ ^ uStack_a70._4_4_;
                        auVar130._24_4_ = auVar175._8_4_ ^ (uint)uStack_a68;
                        auVar130._28_4_ = auVar175._12_4_ ^ uStack_a68._4_4_;
                        auVar117 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])local_af0.hit);
                        *(undefined1 (*) [32])(local_af0.ray + 0x180) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0x20));
                        *(undefined1 (*) [32])(local_af0.ray + 0x1a0) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0x40));
                        *(undefined1 (*) [32])(local_af0.ray + 0x1c0) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0x60));
                        *(undefined1 (*) [32])(local_af0.ray + 0x1e0) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0x80));
                        *(undefined1 (*) [32])(local_af0.ray + 0x200) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_af0.ray + 0x220) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_af0.ray + 0x240) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_af0.ray + 0x260) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                            (local_af0.hit + 0x100));
                        *(undefined1 (*) [32])(local_af0.ray + 0x280) = auVar117;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar225;
                    break;
                  }
                }
                lVar99 = lVar99 + -1;
              } while (lVar99 != 0);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar124._4_4_ = uVar1;
              auVar124._0_4_ = uVar1;
              auVar124._8_4_ = uVar1;
              auVar124._12_4_ = uVar1;
              auVar124._16_4_ = uVar1;
              auVar124._20_4_ = uVar1;
              auVar124._24_4_ = uVar1;
              auVar124._28_4_ = uVar1;
              auVar161 = vcmpps_avx(_local_8c0,auVar124,2);
              auVar117 = vandps_avx(auVar161,local_700);
              local_700 = local_700 & auVar161;
            } while ((((((((local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_700 >> 0x7f,0) != '\0') ||
                       (local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_700 >> 0xbf,0) != '\0') ||
                     (local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_700[0x1f] < '\0');
            auVar371 = ZEXT3264(_local_a00);
            local_700 = auVar117;
          }
          auVar327 = ZEXT3264(local_360);
          auVar117 = vandps_avx(local_740,local_720);
          auVar161 = vandps_avx(_local_900,_local_8e0);
          auVar244._0_4_ = (float)local_940._0_4_ + local_3a0._0_4_;
          auVar244._4_4_ = (float)local_940._4_4_ + local_3a0._4_4_;
          auVar244._8_4_ = fStack_938 + local_3a0._8_4_;
          auVar244._12_4_ = fStack_934 + local_3a0._12_4_;
          auVar244._16_4_ = fStack_930 + local_3a0._16_4_;
          auVar244._20_4_ = fStack_92c + local_3a0._20_4_;
          auVar244._24_4_ = fStack_928 + local_3a0._24_4_;
          auVar244._28_4_ = fStack_924 + local_3a0._28_4_;
          auVar10 = vcmpps_avx(auVar244,auVar124,2);
          auVar117 = vandps_avx(auVar10,auVar117);
          auVar245._0_4_ = local_360._0_4_ + (float)local_940._0_4_;
          auVar245._4_4_ = local_360._4_4_ + (float)local_940._4_4_;
          auVar245._8_4_ = local_360._8_4_ + fStack_938;
          auVar245._12_4_ = local_360._12_4_ + fStack_934;
          auVar245._16_4_ = local_360._16_4_ + fStack_930;
          auVar245._20_4_ = local_360._20_4_ + fStack_92c;
          auVar245._24_4_ = local_360._24_4_ + fStack_928;
          auVar245._28_4_ = local_360._28_4_ + fStack_924;
          auVar10 = vcmpps_avx(auVar245,auVar124,2);
          auVar161 = vandps_avx(auVar10,auVar161);
          auVar161 = vorps_avx(auVar117,auVar161);
          if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar161 >> 0x7f,0) != '\0') ||
                (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar161 >> 0xbf,0) != '\0') ||
              (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar161[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar103 * 0x60) = auVar161;
            auVar117 = vblendvps_avx(local_360,_local_3a0,auVar117);
            *(undefined1 (*) [32])(auStack_160 + uVar103 * 0x60) = auVar117;
            uVar2 = vmovlps_avx(local_6b0);
            (&uStack_140)[uVar103 * 0xc] = uVar2;
            aiStack_138[uVar103 * 0x18] = local_ce4 + 1;
            iVar102 = iVar102 + 1;
          }
        }
      }
    }
    if (iVar102 == 0) break;
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar131._4_4_ = uVar1;
    auVar131._0_4_ = uVar1;
    auVar131._8_4_ = uVar1;
    auVar131._12_4_ = uVar1;
    auVar131._16_4_ = uVar1;
    auVar131._20_4_ = uVar1;
    auVar131._24_4_ = uVar1;
    auVar131._28_4_ = uVar1;
    uVar98 = -iVar102;
    pauVar96 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar102 - 1) * 0x60);
    while( true ) {
      auVar117 = pauVar96[1];
      auVar162._0_4_ = (float)local_940._0_4_ + auVar117._0_4_;
      auVar162._4_4_ = (float)local_940._4_4_ + auVar117._4_4_;
      auVar162._8_4_ = fStack_938 + auVar117._8_4_;
      auVar162._12_4_ = fStack_934 + auVar117._12_4_;
      auVar162._16_4_ = fStack_930 + auVar117._16_4_;
      auVar162._20_4_ = fStack_92c + auVar117._20_4_;
      auVar162._24_4_ = fStack_928 + auVar117._24_4_;
      auVar162._28_4_ = fStack_924 + auVar117._28_4_;
      auVar10 = vcmpps_avx(auVar162,auVar131,2);
      auVar161 = vandps_avx(auVar10,*pauVar96);
      _local_6a0 = auVar161;
      auVar10 = *pauVar96 & auVar10;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') break;
      pauVar96 = pauVar96 + -3;
      uVar98 = uVar98 + 1;
      if (uVar98 == 0) goto LAB_0107cf84;
    }
    auVar132._8_4_ = 0x7f800000;
    auVar132._0_8_ = 0x7f8000007f800000;
    auVar132._12_4_ = 0x7f800000;
    auVar132._16_4_ = 0x7f800000;
    auVar132._20_4_ = 0x7f800000;
    auVar132._24_4_ = 0x7f800000;
    auVar132._28_4_ = 0x7f800000;
    auVar117 = vblendvps_avx(auVar132,auVar117,auVar161);
    auVar10 = vshufps_avx(auVar117,auVar117,0xb1);
    auVar10 = vminps_avx(auVar117,auVar10);
    auVar397 = vshufpd_avx(auVar10,auVar10,5);
    auVar10 = vminps_avx(auVar10,auVar397);
    auVar397 = vperm2f128_avx(auVar10,auVar10,1);
    auVar10 = vminps_avx(auVar10,auVar397);
    auVar117 = vcmpps_avx(auVar117,auVar10,0);
    auVar10 = auVar161 & auVar117;
    if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0x7f,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar10 >> 0xbf,0) != '\0') ||
        (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar10[0x1f] < '\0')
    {
      auVar161 = vandps_avx(auVar117,auVar161);
    }
    auVar116._8_8_ = 0;
    auVar116._0_8_ = *(ulong *)pauVar96[2];
    local_ce4 = *(uint *)(pauVar96[2] + 8);
    uVar97 = vmovmskps_avx(auVar161);
    uVar95 = 0;
    if (uVar97 != 0) {
      for (; (uVar97 >> uVar95 & 1) == 0; uVar95 = uVar95 + 1) {
      }
    }
    *(undefined4 *)(local_6a0 + (ulong)uVar95 * 4) = 0;
    *pauVar96 = _local_6a0;
    uVar97 = ~uVar98;
    if ((((((((_local_6a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_6a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_6a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_6a0 >> 0x7f,0) != '\0') ||
          (_local_6a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_6a0 >> 0xbf,0) != '\0') ||
        (_local_6a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_6a0[0x1f] < '\0') {
      uVar97 = -uVar98;
    }
    uVar103 = (ulong)uVar97;
    auVar212 = vshufps_avx(auVar116,auVar116,0);
    auVar175 = vshufps_avx(auVar116,auVar116,0x55);
    auVar175 = vsubps_avx(auVar175,auVar212);
    local_3a0._4_4_ = auVar212._4_4_ + auVar175._4_4_ * 0.14285715;
    local_3a0._0_4_ = auVar212._0_4_ + auVar175._0_4_ * 0.0;
    fStack_398 = auVar212._8_4_ + auVar175._8_4_ * 0.2857143;
    fStack_394 = auVar212._12_4_ + auVar175._12_4_ * 0.42857146;
    fStack_390 = auVar212._0_4_ + auVar175._0_4_ * 0.5714286;
    fStack_38c = auVar212._4_4_ + auVar175._4_4_ * 0.71428573;
    fStack_388 = auVar212._8_4_ + auVar175._8_4_ * 0.8571429;
    fStack_384 = auVar212._12_4_ + auVar175._12_4_;
    local_6b0._8_8_ = 0;
    local_6b0._0_8_ = *(ulong *)(local_3a0 + (ulong)uVar95 * 4);
  } while( true );
LAB_0107cf84:
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar134._4_4_ = uVar1;
  auVar134._0_4_ = uVar1;
  auVar134._8_4_ = uVar1;
  auVar134._12_4_ = uVar1;
  auVar134._16_4_ = uVar1;
  auVar134._20_4_ = uVar1;
  auVar134._24_4_ = uVar1;
  auVar134._28_4_ = uVar1;
  auVar117 = vcmpps_avx(local_2e0,auVar134,2);
  uVar94 = vmovmskps_avx(auVar117);
  uVar94 = (uint)uVar101 & uVar94;
  if (uVar94 == 0) {
    return;
  }
  goto LAB_01079f9e;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }